

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<4,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  uint uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  RTCRayQueryContext *pRVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [60];
  undefined1 auVar50 [60];
  undefined1 auVar51 [12];
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  byte bVar70;
  byte bVar71;
  byte bVar72;
  ulong uVar73;
  byte bVar74;
  byte bVar75;
  byte bVar76;
  ulong uVar77;
  uint uVar78;
  long lVar79;
  bool bVar80;
  ulong uVar81;
  uint uVar82;
  uint uVar146;
  uint uVar147;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  uint uVar149;
  uint uVar150;
  uint uVar151;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  uint uVar148;
  uint uVar152;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar145 [64];
  float fVar153;
  vint4 bi_2;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar175 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar176 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar177 [64];
  float fVar178;
  float fVar179;
  vint4 bi_1;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  vint4 bi;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  undefined4 uVar219;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  vint4 ai_2;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [64];
  vint4 ai;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  float fVar240;
  float fVar249;
  float fVar250;
  vint4 ai_1;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar251;
  float fVar253;
  undefined1 auVar247 [16];
  float fVar252;
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar248 [32];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [16];
  float fVar261;
  undefined1 auVar262 [64];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [64];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  undefined1 local_bc0 [16];
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [16];
  undefined1 (*local_ac8) [32];
  Primitive *local_ac0;
  ulong local_ab8;
  ulong local_ab0;
  ulong local_aa8;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [64];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  float afStack_160 [2];
  uint auStack_158 [74];
  undefined1 auVar141 [64];
  undefined1 auVar144 [64];
  undefined1 extraout_var_02 [60];
  
  PVar1 = prim[1];
  uVar73 = (ulong)(byte)PVar1;
  fVar153 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar85 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar85 = vsubps_avx(auVar85,*(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  auVar220._0_4_ = fVar153 * auVar85._0_4_;
  auVar220._4_4_ = fVar153 * auVar85._4_4_;
  auVar220._8_4_ = fVar153 * auVar85._8_4_;
  auVar220._12_4_ = fVar153 * auVar85._12_4_;
  auVar154._0_4_ = fVar153 * auVar83._0_4_;
  auVar154._4_4_ = fVar153 * auVar83._4_4_;
  auVar154._8_4_ = fVar153 * auVar83._8_4_;
  auVar154._12_4_ = fVar153 * auVar83._12_4_;
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 5 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 6)));
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xb + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar1 * 0xc + uVar73 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  uVar81 = (ulong)(uint)((int)(uVar73 * 9) * 2);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 + uVar73 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  uVar77 = (ulong)(uint)((int)(uVar73 * 5) << 2);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar266._4_4_ = auVar154._0_4_;
  auVar266._0_4_ = auVar154._0_4_;
  auVar266._8_4_ = auVar154._0_4_;
  auVar266._12_4_ = auVar154._0_4_;
  auVar92 = vshufps_avx(auVar154,auVar154,0x55);
  auVar84 = vshufps_avx(auVar154,auVar154,0xaa);
  fVar153 = auVar84._0_4_;
  auVar200._0_4_ = fVar153 * auVar88._0_4_;
  fVar240 = auVar84._4_4_;
  auVar200._4_4_ = fVar240 * auVar88._4_4_;
  fVar249 = auVar84._8_4_;
  auVar200._8_4_ = fVar249 * auVar88._8_4_;
  fVar250 = auVar84._12_4_;
  auVar200._12_4_ = fVar250 * auVar88._12_4_;
  auVar180._0_4_ = auVar90._0_4_ * fVar153;
  auVar180._4_4_ = auVar90._4_4_ * fVar240;
  auVar180._8_4_ = auVar90._8_4_ * fVar249;
  auVar180._12_4_ = auVar90._12_4_ * fVar250;
  auVar155._0_4_ = auVar91._0_4_ * fVar153;
  auVar155._4_4_ = auVar91._4_4_ * fVar240;
  auVar155._8_4_ = auVar91._8_4_ * fVar249;
  auVar155._12_4_ = auVar91._12_4_ * fVar250;
  auVar84 = vfmadd231ps_fma(auVar200,auVar92,auVar83);
  auVar94 = vfmadd231ps_fma(auVar180,auVar92,auVar86);
  auVar92 = vfmadd231ps_fma(auVar155,auVar87,auVar92);
  auVar93 = vfmadd231ps_fma(auVar84,auVar266,auVar85);
  auVar94 = vfmadd231ps_fma(auVar94,auVar266,auVar89);
  auVar154 = vfmadd231ps_fma(auVar92,auVar21,auVar266);
  auVar267._4_4_ = auVar220._0_4_;
  auVar267._0_4_ = auVar220._0_4_;
  auVar267._8_4_ = auVar220._0_4_;
  auVar267._12_4_ = auVar220._0_4_;
  auVar92 = vshufps_avx(auVar220,auVar220,0x55);
  auVar84 = vshufps_avx(auVar220,auVar220,0xaa);
  fVar153 = auVar84._0_4_;
  auVar268._0_4_ = fVar153 * auVar88._0_4_;
  fVar240 = auVar84._4_4_;
  auVar268._4_4_ = fVar240 * auVar88._4_4_;
  fVar249 = auVar84._8_4_;
  auVar268._8_4_ = fVar249 * auVar88._8_4_;
  fVar250 = auVar84._12_4_;
  auVar268._12_4_ = fVar250 * auVar88._12_4_;
  auVar226._0_4_ = auVar90._0_4_ * fVar153;
  auVar226._4_4_ = auVar90._4_4_ * fVar240;
  auVar226._8_4_ = auVar90._8_4_ * fVar249;
  auVar226._12_4_ = auVar90._12_4_ * fVar250;
  auVar221._0_4_ = auVar91._0_4_ * fVar153;
  auVar221._4_4_ = auVar91._4_4_ * fVar240;
  auVar221._8_4_ = auVar91._8_4_ * fVar249;
  auVar221._12_4_ = auVar91._12_4_ * fVar250;
  auVar83 = vfmadd231ps_fma(auVar268,auVar92,auVar83);
  auVar88 = vfmadd231ps_fma(auVar226,auVar92,auVar86);
  auVar86 = vfmadd231ps_fma(auVar221,auVar92,auVar87);
  auVar90 = vfmadd231ps_fma(auVar83,auVar267,auVar85);
  auVar87 = vfmadd231ps_fma(auVar88,auVar267,auVar89);
  auVar257._8_4_ = 0x7fffffff;
  auVar257._0_8_ = 0x7fffffff7fffffff;
  auVar257._12_4_ = 0x7fffffff;
  auVar91 = vfmadd231ps_fma(auVar86,auVar267,auVar21);
  auVar85 = vandps_avx(auVar93,auVar257);
  auVar241._8_4_ = 0x219392ef;
  auVar241._0_8_ = 0x219392ef219392ef;
  auVar241._12_4_ = 0x219392ef;
  uVar81 = vcmpps_avx512vl(auVar85,auVar241,1);
  bVar6 = (bool)((byte)uVar81 & 1);
  auVar84._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar93._0_4_;
  bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar93._4_4_;
  bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar93._8_4_;
  bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar93._12_4_;
  auVar85 = vandps_avx(auVar94,auVar257);
  uVar81 = vcmpps_avx512vl(auVar85,auVar241,1);
  bVar6 = (bool)((byte)uVar81 & 1);
  auVar93._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar94._0_4_;
  bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar94._4_4_;
  bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar94._8_4_;
  bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar94._12_4_;
  auVar85 = vandps_avx(auVar154,auVar257);
  uVar81 = vcmpps_avx512vl(auVar85,auVar241,1);
  bVar6 = (bool)((byte)uVar81 & 1);
  auVar94._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar154._0_4_;
  bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar154._4_4_;
  bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar154._8_4_;
  bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * auVar154._12_4_;
  auVar83 = vrcp14ps_avx512vl(auVar84);
  auVar242._8_4_ = 0x3f800000;
  auVar242._0_8_ = &DAT_3f8000003f800000;
  auVar242._12_4_ = 0x3f800000;
  auVar85 = vfnmadd213ps_fma(auVar84,auVar83,auVar242);
  auVar89 = vfmadd132ps_fma(auVar85,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar93);
  auVar85 = vfnmadd213ps_fma(auVar93,auVar83,auVar242);
  auVar86 = vfmadd132ps_fma(auVar85,auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar94);
  auVar85 = vfnmadd213ps_fma(auVar94,auVar83,auVar242);
  auVar21 = vfmadd132ps_fma(auVar85,auVar83,auVar83);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar73 * 7 + 6);
  auVar85 = vpmovsxwd_avx(auVar85);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar90);
  auVar235._0_4_ = auVar89._0_4_ * auVar85._0_4_;
  auVar235._4_4_ = auVar89._4_4_ * auVar85._4_4_;
  auVar235._8_4_ = auVar89._8_4_ * auVar85._8_4_;
  auVar235._12_4_ = auVar89._12_4_ * auVar85._12_4_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar73 * 9 + 6);
  auVar85 = vpmovsxwd_avx(auVar83);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar90);
  auVar84 = vpbroadcastd_avx512vl();
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar83 = vpmovsxwd_avx(auVar88);
  auVar201._0_4_ = auVar89._0_4_ * auVar85._0_4_;
  auVar201._4_4_ = auVar89._4_4_ * auVar85._4_4_;
  auVar201._8_4_ = auVar89._8_4_ * auVar85._8_4_;
  auVar201._12_4_ = auVar89._12_4_ * auVar85._12_4_;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + uVar73 * -2 + 6);
  auVar85 = vpmovsxwd_avx(auVar89);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar87);
  auVar243._0_4_ = auVar86._0_4_ * auVar85._0_4_;
  auVar243._4_4_ = auVar86._4_4_ * auVar85._4_4_;
  auVar243._8_4_ = auVar86._8_4_ * auVar85._8_4_;
  auVar243._12_4_ = auVar86._12_4_ * auVar85._12_4_;
  auVar85 = vcvtdq2ps_avx(auVar83);
  auVar85 = vsubps_avx(auVar85,auVar87);
  auVar181._0_4_ = auVar86._0_4_ * auVar85._0_4_;
  auVar181._4_4_ = auVar86._4_4_ * auVar85._4_4_;
  auVar181._8_4_ = auVar86._8_4_ * auVar85._8_4_;
  auVar181._12_4_ = auVar86._12_4_ * auVar85._12_4_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar77 + uVar73 + 6);
  auVar85 = vpmovsxwd_avx(auVar86);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar91);
  auVar227._0_4_ = auVar21._0_4_ * auVar85._0_4_;
  auVar227._4_4_ = auVar21._4_4_ * auVar85._4_4_;
  auVar227._8_4_ = auVar21._8_4_ * auVar85._8_4_;
  auVar227._12_4_ = auVar21._12_4_ * auVar85._12_4_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar73 * 0x17 + 6);
  auVar85 = vpmovsxwd_avx(auVar90);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar91);
  auVar156._0_4_ = auVar21._0_4_ * auVar85._0_4_;
  auVar156._4_4_ = auVar21._4_4_ * auVar85._4_4_;
  auVar156._8_4_ = auVar21._8_4_ * auVar85._8_4_;
  auVar156._12_4_ = auVar21._12_4_ * auVar85._12_4_;
  auVar85 = vpminsd_avx(auVar235,auVar201);
  auVar83 = vpminsd_avx(auVar243,auVar181);
  auVar85 = vmaxps_avx(auVar85,auVar83);
  auVar83 = vpminsd_avx(auVar227,auVar156);
  uVar219 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar21._4_4_ = uVar219;
  auVar21._0_4_ = uVar219;
  auVar21._8_4_ = uVar219;
  auVar21._12_4_ = uVar219;
  auVar83 = vmaxps_avx512vl(auVar83,auVar21);
  auVar85 = vmaxps_avx(auVar85,auVar83);
  auVar87._8_4_ = 0x3f7ffffa;
  auVar87._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar87._12_4_ = 0x3f7ffffa;
  local_7f0 = vmulps_avx512vl(auVar85,auVar87);
  auVar85 = vpmaxsd_avx(auVar235,auVar201);
  auVar83 = vpmaxsd_avx(auVar243,auVar181);
  auVar85 = vminps_avx(auVar85,auVar83);
  auVar83 = vpmaxsd_avx(auVar227,auVar156);
  uVar219 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar91._4_4_ = uVar219;
  auVar91._0_4_ = uVar219;
  auVar91._8_4_ = uVar219;
  auVar91._12_4_ = uVar219;
  auVar83 = vminps_avx512vl(auVar83,auVar91);
  auVar85 = vminps_avx(auVar85,auVar83);
  auVar92._8_4_ = 0x3f800003;
  auVar92._0_8_ = 0x3f8000033f800003;
  auVar92._12_4_ = 0x3f800003;
  auVar85 = vmulps_avx512vl(auVar85,auVar92);
  uVar22 = vcmpps_avx512vl(local_7f0,auVar85,2);
  local_aa8 = vpcmpgtd_avx512vl(auVar84,_DAT_01ff0cf0);
  local_aa8 = ((byte)uVar22 & 0xf) & local_aa8;
  if ((char)local_aa8 == '\0') {
    return;
  }
  local_ac8 = (undefined1 (*) [32])local_240;
  auVar176 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar176);
  auVar176 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  auVar262 = ZEXT3264(_DAT_02020f20);
  auVar265 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  local_ac0 = prim;
LAB_01b8f822:
  lVar79 = 0;
  for (uVar81 = local_aa8; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
    lVar79 = lVar79 + 1;
  }
  uVar78 = *(uint *)(prim + 2);
  uVar2 = *(uint *)(prim + lVar79 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar78].ptr;
  uVar81 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar2);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar79 = *(long *)&pGVar3[1].time_range.upper;
  auVar85 = *(undefined1 (*) [16])(lVar79 + (long)p_Var4 * uVar81);
  auVar83 = *(undefined1 (*) [16])(lVar79 + (uVar81 + 1) * (long)p_Var4);
  auVar88 = *(undefined1 (*) [16])(lVar79 + (uVar81 + 2) * (long)p_Var4);
  local_aa8 = local_aa8 - 1 & local_aa8;
  auVar89 = *(undefined1 (*) [16])(lVar79 + (uVar81 + 3) * (long)p_Var4);
  if (local_aa8 != 0) {
    uVar77 = local_aa8 - 1 & local_aa8;
    for (uVar81 = local_aa8; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
    }
    if (uVar77 != 0) {
      for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar90 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar95 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  auVar138._0_32_ = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar86 = vunpcklps_avx512vl(auVar95._0_16_,auVar138._0_16_);
  auVar145._0_32_ = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar269 = ZEXT3264(auVar145._0_32_);
  auVar91 = auVar145._0_16_;
  local_a20 = vinsertps_avx512f(auVar86,auVar91,0x28);
  auVar236._0_4_ = auVar85._0_4_ + auVar83._0_4_ + auVar88._0_4_ + auVar89._0_4_;
  auVar236._4_4_ = auVar85._4_4_ + auVar83._4_4_ + auVar88._4_4_ + auVar89._4_4_;
  auVar236._8_4_ = auVar85._8_4_ + auVar83._8_4_ + auVar88._8_4_ + auVar89._8_4_;
  auVar236._12_4_ = auVar85._12_4_ + auVar83._12_4_ + auVar88._12_4_ + auVar89._12_4_;
  auVar26._8_4_ = 0x3e800000;
  auVar26._0_8_ = 0x3e8000003e800000;
  auVar26._12_4_ = 0x3e800000;
  auVar86 = vmulps_avx512vl(auVar236,auVar26);
  auVar86 = vsubps_avx(auVar86,auVar90);
  auVar86 = vdpps_avx(auVar86,local_a20,0x7f);
  fVar153 = *(float *)(ray + k * 4 + 0xc0);
  local_a30 = vdpps_avx(local_a20,local_a20,0x7f);
  auVar244._4_12_ = ZEXT812(0) << 0x20;
  auVar244._0_4_ = local_a30._0_4_;
  auVar87 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar244);
  auVar21 = vfnmadd213ss_fma(auVar87,local_a30,ZEXT416(0x40000000));
  local_740 = auVar86._0_4_ * auVar87._0_4_ * auVar21._0_4_;
  auVar245._4_4_ = local_740;
  auVar245._0_4_ = local_740;
  auVar245._8_4_ = local_740;
  auVar245._12_4_ = local_740;
  fStack_8f0 = local_740;
  _local_900 = auVar245;
  fStack_8ec = local_740;
  fStack_8e8 = local_740;
  fStack_8e4 = local_740;
  auVar86 = vfmadd231ps_fma(auVar90,local_a20,auVar245);
  auVar86 = vblendps_avx(auVar86,ZEXT816(0) << 0x40,8);
  auVar85 = vsubps_avx(auVar85,auVar86);
  auVar88 = vsubps_avx(auVar88,auVar86);
  auVar83 = vsubps_avx(auVar83,auVar86);
  auVar89 = vsubps_avx(auVar89,auVar86);
  auVar225 = ZEXT1664(auVar89);
  local_520 = auVar85._0_4_;
  uStack_51c = local_520;
  uStack_518 = local_520;
  uStack_514 = local_520;
  uStack_510 = local_520;
  uStack_50c = local_520;
  uStack_508 = local_520;
  uStack_504 = local_520;
  auVar107._8_4_ = 1;
  auVar107._0_8_ = 0x100000001;
  auVar107._12_4_ = 1;
  auVar107._16_4_ = 1;
  auVar107._20_4_ = 1;
  auVar107._24_4_ = 1;
  auVar107._28_4_ = 1;
  local_940 = ZEXT1632(auVar85);
  local_540 = vpermps_avx2(auVar107,local_940);
  auVar96._8_4_ = 2;
  auVar96._0_8_ = 0x200000002;
  auVar96._12_4_ = 2;
  auVar96._16_4_ = 2;
  auVar96._20_4_ = 2;
  auVar96._24_4_ = 2;
  auVar96._28_4_ = 2;
  local_560 = vpermps_avx2(auVar96,local_940);
  auVar97._8_4_ = 3;
  auVar97._0_8_ = 0x300000003;
  auVar97._12_4_ = 3;
  auVar97._16_4_ = 3;
  auVar97._20_4_ = 3;
  auVar97._24_4_ = 3;
  auVar97._28_4_ = 3;
  local_580 = vpermps_avx2(auVar97,local_940);
  local_5a0 = auVar83._0_4_;
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  local_980 = ZEXT1632(auVar83);
  local_5c0 = vpermps_avx2(auVar107,local_980);
  local_5e0 = vpermps_avx2(auVar96,local_980);
  local_600 = vpermps_avx2(auVar97,local_980);
  local_620 = auVar88._0_4_;
  uStack_61c = local_620;
  uStack_618 = local_620;
  uStack_614 = local_620;
  uStack_610 = local_620;
  uStack_60c = local_620;
  uStack_608 = local_620;
  uStack_604 = local_620;
  local_960 = ZEXT1632(auVar88);
  local_640 = vpermps_avx2(auVar107,local_960);
  local_660 = vpermps_avx2(auVar96,local_960);
  local_680 = vpermps_avx2(auVar97,local_960);
  uVar219 = auVar89._0_4_;
  local_6a0._4_4_ = uVar219;
  local_6a0._0_4_ = uVar219;
  fStack_698 = (float)uVar219;
  fStack_694 = (float)uVar219;
  fStack_690 = (float)uVar219;
  fStack_68c = (float)uVar219;
  fStack_688 = (float)uVar219;
  register0x0000131c = uVar219;
  auVar234 = ZEXT3264(_local_6a0);
  _local_9a0 = ZEXT1632(auVar89);
  _local_6c0 = vpermps_avx2(auVar107,_local_9a0);
  _local_6e0 = vpermps_avx2(auVar96,_local_9a0);
  _local_700 = vpermps_avx2(auVar97,_local_9a0);
  auVar85 = vmulss_avx512f(auVar91,auVar91);
  auVar145._32_32_ = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar138._0_32_,auVar138._0_32_);
  auVar145._32_32_ = vfmadd231ps_avx512vl(auVar145._32_32_,auVar95,auVar95);
  local_720._0_4_ = auVar145._32_4_;
  local_720._4_4_ = local_720._0_4_;
  local_720._8_4_ = local_720._0_4_;
  local_720._12_4_ = local_720._0_4_;
  local_720._16_4_ = local_720._0_4_;
  local_720._20_4_ = local_720._0_4_;
  local_720._24_4_ = local_720._0_4_;
  local_720._28_4_ = local_720._0_4_;
  local_7c0 = vandps_avx(auVar176._0_32_,local_720);
  local_a00 = ZEXT416((uint)local_740);
  local_740 = fVar153 - local_740;
  fStack_73c = local_740;
  fStack_738 = local_740;
  fStack_734 = local_740;
  fStack_730 = local_740;
  fStack_72c = local_740;
  fStack_728 = local_740;
  fStack_724 = local_740;
  auVar176 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar176);
  local_ab8 = 1;
  local_ab0 = 0;
  auVar176 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar176);
  auVar85 = vsqrtss_avx(local_a30,local_a30);
  auVar83 = vsqrtss_avx(local_a30,local_a30);
  auVar218 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar145._32_32_ = auVar176._32_32_;
  local_aa0 = auVar145._0_32_;
  do {
    local_ae0 = auVar218._0_16_;
    auVar88 = vmovshdup_avx(local_ae0);
    fVar240 = auVar218._0_4_;
    fVar179 = auVar88._0_4_ - fVar240;
    fVar261 = fVar179 * 0.04761905;
    auVar239._4_4_ = fVar240;
    auVar239._0_4_ = fVar240;
    auVar239._8_4_ = fVar240;
    auVar239._12_4_ = fVar240;
    auVar239._16_4_ = fVar240;
    auVar239._20_4_ = fVar240;
    auVar239._24_4_ = fVar240;
    auVar239._28_4_ = fVar240;
    local_a60._4_4_ = fVar179;
    local_a60._0_4_ = fVar179;
    local_a60._8_4_ = fVar179;
    local_a60._12_4_ = fVar179;
    local_a60._16_4_ = fVar179;
    local_a60._20_4_ = fVar179;
    local_a60._24_4_ = fVar179;
    local_a60._28_4_ = fVar179;
    auVar88 = vfmadd231ps_fma(auVar239,local_a60,auVar262._0_32_);
    auVar123 = auVar265._0_32_;
    auVar107 = vsubps_avx(auVar123,ZEXT1632(auVar88));
    auVar112._4_4_ = fStack_59c;
    auVar112._0_4_ = local_5a0;
    auVar112._8_4_ = fStack_598;
    auVar112._12_4_ = fStack_594;
    auVar112._16_4_ = fStack_590;
    auVar112._20_4_ = fStack_58c;
    auVar112._24_4_ = fStack_588;
    auVar112._28_4_ = fStack_584;
    fVar240 = auVar88._0_4_;
    auVar118._0_4_ = local_5a0 * fVar240;
    fVar249 = auVar88._4_4_;
    auVar118._4_4_ = fStack_59c * fVar249;
    fVar250 = auVar88._8_4_;
    auVar118._8_4_ = fStack_598 * fVar250;
    fVar252 = auVar88._12_4_;
    auVar118._12_4_ = fStack_594 * fVar252;
    auVar118._16_4_ = fStack_590 * 0.0;
    auVar118._20_4_ = fStack_58c * 0.0;
    auVar118._24_4_ = fStack_588 * 0.0;
    auVar118._28_4_ = 0;
    auVar176._0_4_ = local_5c0._0_4_ * fVar240;
    auVar176._4_4_ = local_5c0._4_4_ * fVar249;
    auVar176._8_4_ = local_5c0._8_4_ * fVar250;
    auVar176._12_4_ = local_5c0._12_4_ * fVar252;
    auVar176._16_4_ = local_5c0._16_4_ * 0.0;
    auVar176._20_4_ = local_5c0._20_4_ * 0.0;
    auVar176._28_36_ = auVar218._28_36_;
    auVar176._24_4_ = local_5c0._24_4_ * 0.0;
    auVar262._0_4_ = local_5e0._0_4_ * fVar240;
    auVar262._4_4_ = local_5e0._4_4_ * fVar249;
    auVar262._8_4_ = local_5e0._8_4_ * fVar250;
    auVar262._12_4_ = local_5e0._12_4_ * fVar252;
    auVar262._16_4_ = local_5e0._16_4_ * 0.0;
    auVar262._20_4_ = local_5e0._20_4_ * 0.0;
    auVar262._28_36_ = auVar225._28_36_;
    auVar262._24_4_ = local_5e0._24_4_ * 0.0;
    auVar265._0_4_ = local_600._0_4_ * fVar240;
    auVar265._4_4_ = local_600._4_4_ * fVar249;
    auVar265._8_4_ = local_600._8_4_ * fVar250;
    auVar265._12_4_ = local_600._12_4_ * fVar252;
    auVar265._16_4_ = local_600._16_4_ * 0.0;
    auVar265._20_4_ = local_600._20_4_ * 0.0;
    auVar265._28_36_ = auVar234._28_36_;
    auVar265._24_4_ = local_600._24_4_ * 0.0;
    auVar113._4_4_ = uStack_51c;
    auVar113._0_4_ = local_520;
    auVar113._8_4_ = uStack_518;
    auVar113._12_4_ = uStack_514;
    auVar113._16_4_ = uStack_510;
    auVar113._20_4_ = uStack_50c;
    auVar113._24_4_ = uStack_508;
    auVar113._28_4_ = uStack_504;
    auVar89 = vfmadd231ps_fma(auVar118,auVar107,auVar113);
    auVar86 = vfmadd231ps_fma(auVar176._0_32_,auVar107,local_540);
    auVar90 = vfmadd231ps_fma(auVar262._0_32_,auVar107,local_560);
    auVar21 = vfmadd231ps_fma(auVar265._0_32_,auVar107,local_580);
    auVar111._4_4_ = uStack_61c;
    auVar111._0_4_ = local_620;
    auVar111._8_4_ = uStack_618;
    auVar111._12_4_ = uStack_614;
    auVar111._16_4_ = uStack_610;
    auVar111._20_4_ = uStack_60c;
    auVar111._24_4_ = uStack_608;
    auVar111._28_4_ = uStack_604;
    auVar96 = vmulps_avx512vl(auVar111,ZEXT1632(auVar88));
    auVar103 = ZEXT1632(auVar88);
    auVar97 = vmulps_avx512vl(local_640,auVar103);
    auVar98 = vmulps_avx512vl(local_660,auVar103);
    auVar99 = vmulps_avx512vl(local_680,auVar103);
    auVar87 = vfmadd231ps_fma(auVar96,auVar107,auVar112);
    auVar91 = vfmadd231ps_fma(auVar97,auVar107,local_5c0);
    auVar92 = vfmadd231ps_fma(auVar98,auVar107,local_5e0);
    auVar84 = vfmadd231ps_fma(auVar99,auVar107,local_600);
    auVar98._4_4_ = fVar249 * (float)local_6a0._4_4_;
    auVar98._0_4_ = fVar240 * (float)local_6a0._0_4_;
    auVar98._8_4_ = fVar250 * fStack_698;
    auVar98._12_4_ = fVar252 * fStack_694;
    auVar98._16_4_ = fStack_690 * 0.0;
    auVar98._20_4_ = fStack_68c * 0.0;
    auVar98._24_4_ = fStack_688 * 0.0;
    auVar98._28_4_ = fStack_584;
    auVar104._4_4_ = fVar249 * (float)local_6c0._4_4_;
    auVar104._0_4_ = fVar240 * (float)local_6c0._0_4_;
    auVar104._8_4_ = fVar250 * fStack_6b8;
    auVar104._12_4_ = fVar252 * fStack_6b4;
    auVar104._16_4_ = fStack_6b0 * 0.0;
    auVar104._20_4_ = fStack_6ac * 0.0;
    auVar104._24_4_ = fStack_6a8 * 0.0;
    auVar104._28_4_ = local_5c0._28_4_;
    auVar105._4_4_ = fVar249 * (float)local_6e0._4_4_;
    auVar105._0_4_ = fVar240 * (float)local_6e0._0_4_;
    auVar105._8_4_ = fVar250 * fStack_6d8;
    auVar105._12_4_ = fVar252 * fStack_6d4;
    auVar105._16_4_ = fStack_6d0 * 0.0;
    auVar105._20_4_ = fStack_6cc * 0.0;
    auVar105._24_4_ = fStack_6c8 * 0.0;
    auVar105._28_4_ = local_5e0._28_4_;
    auVar106._4_4_ = fVar249 * (float)local_700._4_4_;
    auVar106._0_4_ = fVar240 * (float)local_700._0_4_;
    auVar106._8_4_ = fVar250 * fStack_6f8;
    auVar106._12_4_ = fVar252 * fStack_6f4;
    auVar106._16_4_ = fStack_6f0 * 0.0;
    auVar106._20_4_ = fStack_6ec * 0.0;
    auVar106._24_4_ = fStack_6e8 * 0.0;
    auVar106._28_4_ = local_600._28_4_;
    auVar96 = vfmadd231ps_avx512vl(auVar98,auVar107,auVar111);
    auVar97 = vfmadd231ps_avx512vl(auVar104,auVar107,local_640);
    auVar98 = vfmadd231ps_avx512vl(auVar105,auVar107,local_660);
    auVar99 = vfmadd231ps_avx512vl(auVar106,auVar107,local_680);
    auVar100 = vmulps_avx512vl(auVar103,ZEXT1632(auVar87));
    auVar101 = vmulps_avx512vl(auVar103,ZEXT1632(auVar91));
    auVar102 = vmulps_avx512vl(auVar103,ZEXT1632(auVar92));
    auVar103 = vmulps_avx512vl(auVar103,ZEXT1632(auVar84));
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar107,ZEXT1632(auVar89));
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,ZEXT1632(auVar86));
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar107,ZEXT1632(auVar90));
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar107,ZEXT1632(auVar21));
    auVar119._0_4_ = auVar96._0_4_ * fVar240;
    auVar119._4_4_ = auVar96._4_4_ * fVar249;
    auVar119._8_4_ = auVar96._8_4_ * fVar250;
    auVar119._12_4_ = auVar96._12_4_ * fVar252;
    auVar119._16_4_ = auVar96._16_4_ * 0.0;
    auVar119._20_4_ = auVar96._20_4_ * 0.0;
    auVar119._24_4_ = auVar96._24_4_ * 0.0;
    auVar119._28_4_ = 0;
    auVar108._4_4_ = auVar97._4_4_ * fVar249;
    auVar108._0_4_ = auVar97._0_4_ * fVar240;
    auVar108._8_4_ = auVar97._8_4_ * fVar250;
    auVar108._12_4_ = auVar97._12_4_ * fVar252;
    auVar108._16_4_ = auVar97._16_4_ * 0.0;
    auVar108._20_4_ = auVar97._20_4_ * 0.0;
    auVar108._24_4_ = auVar97._24_4_ * 0.0;
    auVar108._28_4_ = auVar96._28_4_;
    auVar109._4_4_ = auVar98._4_4_ * fVar249;
    auVar109._0_4_ = auVar98._0_4_ * fVar240;
    auVar109._8_4_ = auVar98._8_4_ * fVar250;
    auVar109._12_4_ = auVar98._12_4_ * fVar252;
    auVar109._16_4_ = auVar98._16_4_ * 0.0;
    auVar109._20_4_ = auVar98._20_4_ * 0.0;
    auVar109._24_4_ = auVar98._24_4_ * 0.0;
    auVar109._28_4_ = auVar97._28_4_;
    auVar110._4_4_ = auVar99._4_4_ * fVar249;
    auVar110._0_4_ = auVar99._0_4_ * fVar240;
    auVar110._8_4_ = auVar99._8_4_ * fVar250;
    auVar110._12_4_ = auVar99._12_4_ * fVar252;
    auVar110._16_4_ = auVar99._16_4_ * 0.0;
    auVar110._20_4_ = auVar99._20_4_ * 0.0;
    auVar110._24_4_ = auVar99._24_4_ * 0.0;
    auVar110._28_4_ = auVar98._28_4_;
    auVar89 = vfmadd231ps_fma(auVar119,auVar107,ZEXT1632(auVar87));
    auVar86 = vfmadd231ps_fma(auVar108,auVar107,ZEXT1632(auVar91));
    auVar90 = vfmadd231ps_fma(auVar109,auVar107,ZEXT1632(auVar92));
    auVar21 = vfmadd231ps_fma(auVar110,auVar107,ZEXT1632(auVar84));
    auVar96 = vmulps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar90));
    auVar104 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar252 * auVar89._12_4_,
                                             CONCAT48(fVar250 * auVar89._8_4_,
                                                      CONCAT44(fVar249 * auVar89._4_4_,
                                                               fVar240 * auVar89._0_4_)))),auVar107,
                          auVar100);
    auVar234 = ZEXT3264(auVar104);
    auVar105 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar86._12_4_ * fVar252,
                                             CONCAT48(auVar86._8_4_ * fVar250,
                                                      CONCAT44(auVar86._4_4_ * fVar249,
                                                               auVar86._0_4_ * fVar240)))),auVar107,
                          auVar101);
    auVar225 = ZEXT3264(auVar105);
    auVar106 = vfmadd231ps_avx512vl(auVar96,auVar107,auVar102);
    auVar97 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar21._12_4_ * fVar252,
                                            CONCAT48(auVar21._8_4_ * fVar250,
                                                     CONCAT44(auVar21._4_4_ * fVar249,
                                                              auVar21._0_4_ * fVar240)))),auVar103,
                         auVar107);
    auVar107 = vsubps_avx512vl(ZEXT1632(auVar89),auVar100);
    auVar96 = vsubps_avx512vl(ZEXT1632(auVar86),auVar101);
    auVar98 = vsubps_avx512vl(ZEXT1632(auVar90),auVar102);
    auVar99 = vsubps_avx512vl(ZEXT1632(auVar21),auVar103);
    auVar124._0_4_ = fVar261 * auVar107._0_4_ * 3.0;
    auVar124._4_4_ = fVar261 * auVar107._4_4_ * 3.0;
    auVar124._8_4_ = fVar261 * auVar107._8_4_ * 3.0;
    auVar124._12_4_ = fVar261 * auVar107._12_4_ * 3.0;
    auVar124._16_4_ = fVar261 * auVar107._16_4_ * 3.0;
    auVar124._20_4_ = fVar261 * auVar107._20_4_ * 3.0;
    auVar124._24_4_ = fVar261 * auVar107._24_4_ * 3.0;
    auVar124._28_4_ = 0;
    auVar125._0_4_ = fVar261 * auVar96._0_4_ * 3.0;
    auVar125._4_4_ = fVar261 * auVar96._4_4_ * 3.0;
    auVar125._8_4_ = fVar261 * auVar96._8_4_ * 3.0;
    auVar125._12_4_ = fVar261 * auVar96._12_4_ * 3.0;
    auVar125._16_4_ = fVar261 * auVar96._16_4_ * 3.0;
    auVar125._20_4_ = fVar261 * auVar96._20_4_ * 3.0;
    auVar125._24_4_ = fVar261 * auVar96._24_4_ * 3.0;
    auVar125._28_4_ = 0;
    auVar126._0_4_ = auVar98._0_4_ * 3.0 * fVar261;
    auVar126._4_4_ = auVar98._4_4_ * 3.0 * fVar261;
    auVar126._8_4_ = auVar98._8_4_ * 3.0 * fVar261;
    auVar126._12_4_ = auVar98._12_4_ * 3.0 * fVar261;
    auVar126._16_4_ = auVar98._16_4_ * 3.0 * fVar261;
    auVar126._20_4_ = auVar98._20_4_ * 3.0 * fVar261;
    auVar126._24_4_ = auVar98._24_4_ * 3.0 * fVar261;
    auVar126._28_4_ = 0;
    fVar240 = auVar99._0_4_ * 3.0 * fVar261;
    fVar249 = auVar99._4_4_ * 3.0 * fVar261;
    auVar114._4_4_ = fVar249;
    auVar114._0_4_ = fVar240;
    fVar250 = auVar99._8_4_ * 3.0 * fVar261;
    auVar114._8_4_ = fVar250;
    fVar252 = auVar99._12_4_ * 3.0 * fVar261;
    auVar114._12_4_ = fVar252;
    fVar254 = auVar99._16_4_ * 3.0 * fVar261;
    auVar114._16_4_ = fVar254;
    fVar255 = auVar99._20_4_ * 3.0 * fVar261;
    auVar114._20_4_ = fVar255;
    fVar256 = auVar99._24_4_ * 3.0 * fVar261;
    auVar114._24_4_ = fVar256;
    auVar114._28_4_ = fVar261;
    auVar88 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar108 = vpermt2ps_avx512vl(auVar104,_DAT_0205fd20,ZEXT1632(auVar88));
    auVar109 = vpermt2ps_avx512vl(auVar105,_DAT_0205fd20,ZEXT1632(auVar88));
    auVar98 = ZEXT1632(auVar88);
    auVar110 = vpermt2ps_avx512vl(auVar106,_DAT_0205fd20,auVar98);
    auVar120._0_4_ = auVar97._0_4_ + fVar240;
    auVar120._4_4_ = auVar97._4_4_ + fVar249;
    auVar120._8_4_ = auVar97._8_4_ + fVar250;
    auVar120._12_4_ = auVar97._12_4_ + fVar252;
    auVar120._16_4_ = auVar97._16_4_ + fVar254;
    auVar120._20_4_ = auVar97._20_4_ + fVar255;
    auVar120._24_4_ = auVar97._24_4_ + fVar256;
    auVar120._28_4_ = auVar97._28_4_ + fVar261;
    auVar107 = vmaxps_avx(auVar97,auVar120);
    auVar96 = vminps_avx(auVar97,auVar120);
    auVar99 = vpermt2ps_avx512vl(auVar97,_DAT_0205fd20,auVar98);
    auVar111 = vpermt2ps_avx512vl(auVar124,_DAT_0205fd20,auVar98);
    auVar112 = vpermt2ps_avx512vl(auVar125,_DAT_0205fd20,auVar98);
    auVar121 = ZEXT1632(auVar88);
    auVar113 = vpermt2ps_avx512vl(auVar126,_DAT_0205fd20,auVar121);
    auVar97 = vpermt2ps_avx512vl(auVar114,_DAT_0205fd20,auVar121);
    auVar100 = vsubps_avx512vl(auVar99,auVar97);
    auVar97 = vsubps_avx(auVar108,auVar104);
    auVar98 = vsubps_avx(auVar109,auVar105);
    auVar114 = vsubps_avx512vl(auVar110,auVar106);
    auVar101 = vmulps_avx512vl(auVar98,auVar126);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar125,auVar114);
    auVar102 = vmulps_avx512vl(auVar114,auVar124);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar126,auVar97);
    auVar103 = vmulps_avx512vl(auVar97,auVar125);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar124,auVar98);
    auVar103 = vmulps_avx512vl(auVar103,auVar103);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar102,auVar102);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar101);
    auVar102 = vmulps_avx512vl(auVar114,auVar114);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar98,auVar98);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar97,auVar97);
    auVar103 = vrcp14ps_avx512vl(auVar102);
    auVar115 = vfnmadd213ps_avx512vl(auVar103,auVar102,auVar123);
    auVar103 = vfmadd132ps_avx512vl(auVar115,auVar103,auVar103);
    auVar101 = vmulps_avx512vl(auVar101,auVar103);
    auVar115 = vmulps_avx512vl(auVar98,auVar113);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar112,auVar114);
    auVar116 = vmulps_avx512vl(auVar114,auVar111);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar113,auVar97);
    auVar117 = vmulps_avx512vl(auVar97,auVar112);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar111,auVar98);
    auVar117 = vmulps_avx512vl(auVar117,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar117,auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar103 = vmulps_avx512vl(auVar115,auVar103);
    auVar101 = vmaxps_avx512vl(auVar101,auVar103);
    auVar101 = vsqrtps_avx512vl(auVar101);
    auVar103 = vmaxps_avx512vl(auVar100,auVar99);
    auVar107 = vmaxps_avx512vl(auVar107,auVar103);
    auVar103 = vaddps_avx512vl(auVar101,auVar107);
    auVar107 = vminps_avx512vl(auVar100,auVar99);
    auVar107 = vminps_avx(auVar96,auVar107);
    auVar107 = vsubps_avx512vl(auVar107,auVar101);
    auVar99._8_4_ = 0x3f800002;
    auVar99._0_8_ = 0x3f8000023f800002;
    auVar99._12_4_ = 0x3f800002;
    auVar99._16_4_ = 0x3f800002;
    auVar99._20_4_ = 0x3f800002;
    auVar99._24_4_ = 0x3f800002;
    auVar99._28_4_ = 0x3f800002;
    auVar96 = vmulps_avx512vl(auVar103,auVar99);
    auVar100._8_4_ = 0x3f7ffffc;
    auVar100._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar100._12_4_ = 0x3f7ffffc;
    auVar100._16_4_ = 0x3f7ffffc;
    auVar100._20_4_ = 0x3f7ffffc;
    auVar100._24_4_ = 0x3f7ffffc;
    auVar100._28_4_ = 0x3f7ffffc;
    local_a80 = vmulps_avx512vl(auVar107,auVar100);
    auVar115._4_4_ = auVar96._4_4_ * auVar96._4_4_;
    auVar115._0_4_ = auVar96._0_4_ * auVar96._0_4_;
    auVar115._8_4_ = auVar96._8_4_ * auVar96._8_4_;
    auVar115._12_4_ = auVar96._12_4_ * auVar96._12_4_;
    auVar115._16_4_ = auVar96._16_4_ * auVar96._16_4_;
    auVar115._20_4_ = auVar96._20_4_ * auVar96._20_4_;
    auVar115._24_4_ = auVar96._24_4_ * auVar96._24_4_;
    auVar115._28_4_ = local_a80._28_4_;
    auVar107 = vrsqrt14ps_avx512vl(auVar102);
    auVar101._8_4_ = 0xbf000000;
    auVar101._0_8_ = 0xbf000000bf000000;
    auVar101._12_4_ = 0xbf000000;
    auVar101._16_4_ = 0xbf000000;
    auVar101._20_4_ = 0xbf000000;
    auVar101._24_4_ = 0xbf000000;
    auVar101._28_4_ = 0xbf000000;
    auVar96 = vmulps_avx512vl(auVar102,auVar101);
    auVar116._4_4_ = auVar107._4_4_ * auVar96._4_4_;
    auVar116._0_4_ = auVar107._0_4_ * auVar96._0_4_;
    auVar116._8_4_ = auVar107._8_4_ * auVar96._8_4_;
    auVar116._12_4_ = auVar107._12_4_ * auVar96._12_4_;
    auVar116._16_4_ = auVar107._16_4_ * auVar96._16_4_;
    auVar116._20_4_ = auVar107._20_4_ * auVar96._20_4_;
    auVar116._24_4_ = auVar107._24_4_ * auVar96._24_4_;
    auVar116._28_4_ = auVar96._28_4_;
    auVar96 = vmulps_avx512vl(auVar107,auVar107);
    auVar96 = vmulps_avx512vl(auVar96,auVar116);
    auVar102._8_4_ = 0x3fc00000;
    auVar102._0_8_ = 0x3fc000003fc00000;
    auVar102._12_4_ = 0x3fc00000;
    auVar102._16_4_ = 0x3fc00000;
    auVar102._20_4_ = 0x3fc00000;
    auVar102._24_4_ = 0x3fc00000;
    auVar102._28_4_ = 0x3fc00000;
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar107,auVar102);
    auVar117._4_4_ = auVar96._4_4_ * auVar97._4_4_;
    auVar117._0_4_ = auVar96._0_4_ * auVar97._0_4_;
    auVar117._8_4_ = auVar96._8_4_ * auVar97._8_4_;
    auVar117._12_4_ = auVar96._12_4_ * auVar97._12_4_;
    auVar117._16_4_ = auVar96._16_4_ * auVar97._16_4_;
    auVar117._20_4_ = auVar96._20_4_ * auVar97._20_4_;
    auVar117._24_4_ = auVar96._24_4_ * auVar97._24_4_;
    auVar117._28_4_ = auVar107._28_4_;
    auVar107 = vmulps_avx512vl(auVar98,auVar96);
    auVar99 = vmulps_avx512vl(auVar114,auVar96);
    auVar100 = vsubps_avx512vl(auVar121,auVar104);
    auVar101 = vsubps_avx512vl(auVar121,auVar105);
    auVar102 = vsubps_avx512vl(auVar121,auVar106);
    auVar103 = vmulps_avx512vl(auVar269._0_32_,auVar102);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar138._0_32_,auVar101);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar95,auVar100);
    auVar116 = vmulps_avx512vl(auVar102,auVar102);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar101,auVar101);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar100,auVar100);
    auVar118 = vmulps_avx512vl(auVar269._0_32_,auVar99);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar107,auVar138._0_32_);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar95);
    auVar99 = vmulps_avx512vl(auVar102,auVar99);
    auVar107 = vfmadd231ps_avx512vl(auVar99,auVar101,auVar107);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar100,auVar117);
    local_8e0 = vmulps_avx512vl(auVar118,auVar118);
    auVar99 = vsubps_avx512vl(local_720,local_8e0);
    auVar117 = vmulps_avx512vl(auVar118,auVar107);
    auVar103 = vsubps_avx512vl(auVar103,auVar117);
    auVar117 = vaddps_avx512vl(auVar103,auVar103);
    auVar103 = vmulps_avx512vl(auVar107,auVar107);
    auVar116 = vsubps_avx512vl(auVar116,auVar103);
    auVar115 = vsubps_avx512vl(auVar116,auVar115);
    auVar119 = vmulps_avx512vl(auVar117,auVar117);
    auVar103._8_4_ = 0x40800000;
    auVar103._0_8_ = 0x4080000040800000;
    auVar103._12_4_ = 0x40800000;
    auVar103._16_4_ = 0x40800000;
    auVar103._20_4_ = 0x40800000;
    auVar103._24_4_ = 0x40800000;
    auVar103._28_4_ = 0x40800000;
    auVar103 = vmulps_avx512vl(auVar99,auVar103);
    auVar120 = vmulps_avx512vl(auVar103,auVar115);
    auVar120 = vsubps_avx512vl(auVar119,auVar120);
    uVar81 = vcmpps_avx512vl(auVar120,auVar121,5);
    bVar74 = (byte)uVar81;
    if (bVar74 == 0) {
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      in_ZMM31 = ZEXT3264(auVar115);
    }
    else {
      auVar120 = vsqrtps_avx512vl(auVar120);
      auVar121 = vaddps_avx512vl(auVar99,auVar99);
      auVar122 = vrcp14ps_avx512vl(auVar121);
      auVar123 = vfnmadd213ps_avx512vl(auVar121,auVar122,auVar123);
      auVar123 = vfmadd132ps_avx512vl(auVar123,auVar122,auVar122);
      auVar121._8_4_ = 0x80000000;
      auVar121._0_8_ = 0x8000000080000000;
      auVar121._12_4_ = 0x80000000;
      auVar121._16_4_ = 0x80000000;
      auVar121._20_4_ = 0x80000000;
      auVar121._24_4_ = 0x80000000;
      auVar121._28_4_ = 0x80000000;
      auVar121 = vxorps_avx512vl(auVar117,auVar121);
      auVar121 = vsubps_avx512vl(auVar121,auVar120);
      auVar121 = vmulps_avx512vl(auVar121,auVar123);
      auVar120 = vsubps_avx512vl(auVar120,auVar117);
      auVar120 = vmulps_avx512vl(auVar120,auVar123);
      auVar123 = vfmadd213ps_avx512vl(auVar118,auVar121,auVar107);
      local_820 = vmulps_avx512vl(auVar96,auVar123);
      auVar123 = vfmadd213ps_avx512vl(auVar118,auVar120,auVar107);
      local_840 = vmulps_avx512vl(auVar96,auVar123);
      auVar165._8_4_ = 0x7f800000;
      auVar165._0_8_ = 0x7f8000007f800000;
      auVar165._12_4_ = 0x7f800000;
      auVar165._16_4_ = 0x7f800000;
      auVar165._20_4_ = 0x7f800000;
      auVar165._24_4_ = 0x7f800000;
      auVar165._28_4_ = 0x7f800000;
      auVar121 = vblendmps_avx512vl(auVar165,auVar121);
      auVar123._0_4_ =
           (uint)(bVar74 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar74 & 1) * local_840._0_4_;
      bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar6 * auVar121._4_4_ | (uint)!bVar6 * local_840._4_4_;
      bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar6 * auVar121._8_4_ | (uint)!bVar6 * local_840._8_4_;
      bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar6 * auVar121._12_4_ | (uint)!bVar6 * local_840._12_4_;
      bVar6 = (bool)((byte)(uVar81 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar6 * auVar121._16_4_ | (uint)!bVar6 * local_840._16_4_;
      bVar6 = (bool)((byte)(uVar81 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar6 * auVar121._20_4_ | (uint)!bVar6 * local_840._20_4_;
      bVar6 = (bool)((byte)(uVar81 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar6 * auVar121._24_4_ | (uint)!bVar6 * local_840._24_4_;
      bVar6 = SUB81(uVar81 >> 7,0);
      auVar123._28_4_ = (uint)bVar6 * auVar121._28_4_ | (uint)!bVar6 * local_840._28_4_;
      auVar166._8_4_ = 0xff800000;
      auVar166._0_8_ = 0xff800000ff800000;
      auVar166._12_4_ = 0xff800000;
      auVar166._16_4_ = 0xff800000;
      auVar166._20_4_ = 0xff800000;
      auVar166._24_4_ = 0xff800000;
      auVar166._28_4_ = 0xff800000;
      auVar121 = vblendmps_avx512vl(auVar166,auVar120);
      auVar127._0_4_ =
           (uint)(bVar74 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar120._0_4_;
      bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
      auVar127._4_4_ = (uint)bVar6 * auVar121._4_4_ | (uint)!bVar6 * auVar120._4_4_;
      bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
      auVar127._8_4_ = (uint)bVar6 * auVar121._8_4_ | (uint)!bVar6 * auVar120._8_4_;
      bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
      auVar127._12_4_ = (uint)bVar6 * auVar121._12_4_ | (uint)!bVar6 * auVar120._12_4_;
      bVar6 = (bool)((byte)(uVar81 >> 4) & 1);
      auVar127._16_4_ = (uint)bVar6 * auVar121._16_4_ | (uint)!bVar6 * auVar120._16_4_;
      bVar6 = (bool)((byte)(uVar81 >> 5) & 1);
      auVar127._20_4_ = (uint)bVar6 * auVar121._20_4_ | (uint)!bVar6 * auVar120._20_4_;
      bVar6 = (bool)((byte)(uVar81 >> 6) & 1);
      auVar127._24_4_ = (uint)bVar6 * auVar121._24_4_ | (uint)!bVar6 * auVar120._24_4_;
      bVar6 = SUB81(uVar81 >> 7,0);
      auVar127._28_4_ = (uint)bVar6 * auVar121._28_4_ | (uint)!bVar6 * auVar120._28_4_;
      in_ZMM31 = ZEXT3264(auVar127);
      auVar167._8_4_ = 0x7fffffff;
      auVar167._0_8_ = 0x7fffffff7fffffff;
      auVar167._12_4_ = 0x7fffffff;
      auVar167._16_4_ = 0x7fffffff;
      auVar167._20_4_ = 0x7fffffff;
      auVar167._24_4_ = 0x7fffffff;
      auVar167._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_8e0,auVar167);
      auVar120 = vmaxps_avx512vl(local_7c0,auVar127);
      auVar122._8_4_ = 0x36000000;
      auVar122._0_8_ = 0x3600000036000000;
      auVar122._12_4_ = 0x36000000;
      auVar122._16_4_ = 0x36000000;
      auVar122._20_4_ = 0x36000000;
      auVar122._24_4_ = 0x36000000;
      auVar122._28_4_ = 0x36000000;
      auVar121 = vmulps_avx512vl(auVar120,auVar122);
      auVar120 = vandps_avx(auVar99,auVar167);
      uVar77 = vcmpps_avx512vl(auVar120,auVar121,1);
      uVar81 = uVar81 & uVar77;
      bVar76 = (byte)uVar81;
      if (bVar76 != 0) {
        uVar77 = vcmpps_avx512vl(auVar115,_DAT_02020f00,2);
        auVar194._8_4_ = 0xff800000;
        auVar194._0_8_ = 0xff800000ff800000;
        auVar194._12_4_ = 0xff800000;
        auVar194._16_4_ = 0xff800000;
        auVar194._20_4_ = 0xff800000;
        auVar194._24_4_ = 0xff800000;
        auVar194._28_4_ = 0xff800000;
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar121 = vblendmps_avx512vl(auVar115,auVar194);
        bVar72 = (byte)uVar77;
        uVar82 = (uint)(bVar72 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar120._0_4_;
        bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
        uVar146 = (uint)bVar6 * auVar121._4_4_ | (uint)!bVar6 * auVar120._4_4_;
        bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
        uVar147 = (uint)bVar6 * auVar121._8_4_ | (uint)!bVar6 * auVar120._8_4_;
        bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
        uVar148 = (uint)bVar6 * auVar121._12_4_ | (uint)!bVar6 * auVar120._12_4_;
        bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
        uVar149 = (uint)bVar6 * auVar121._16_4_ | (uint)!bVar6 * auVar120._16_4_;
        bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
        uVar150 = (uint)bVar6 * auVar121._20_4_ | (uint)!bVar6 * auVar120._20_4_;
        bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
        uVar151 = (uint)bVar6 * auVar121._24_4_ | (uint)!bVar6 * auVar120._24_4_;
        bVar6 = SUB81(uVar77 >> 7,0);
        uVar152 = (uint)bVar6 * auVar121._28_4_ | (uint)!bVar6 * auVar120._28_4_;
        auVar123._0_4_ = (bVar76 & 1) * uVar82 | !(bool)(bVar76 & 1) * auVar123._0_4_;
        bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar123._4_4_ = bVar6 * uVar146 | !bVar6 * auVar123._4_4_;
        bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar123._8_4_ = bVar6 * uVar147 | !bVar6 * auVar123._8_4_;
        bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar123._12_4_ = bVar6 * uVar148 | !bVar6 * auVar123._12_4_;
        bVar6 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar123._16_4_ = bVar6 * uVar149 | !bVar6 * auVar123._16_4_;
        bVar6 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar123._20_4_ = bVar6 * uVar150 | !bVar6 * auVar123._20_4_;
        bVar6 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar123._24_4_ = bVar6 * uVar151 | !bVar6 * auVar123._24_4_;
        bVar6 = SUB81(uVar81 >> 7,0);
        auVar123._28_4_ = bVar6 * uVar152 | !bVar6 * auVar123._28_4_;
        auVar115 = vblendmps_avx512vl(auVar194,auVar115);
        bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar77 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar77 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar77 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar77 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar77 >> 6) & 1);
        bVar17 = SUB81(uVar77 >> 7,0);
        bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar81 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar81 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar81 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar81 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar81 >> 6) & 1);
        bVar18 = SUB81(uVar81 >> 7,0);
        in_ZMM31 = ZEXT3264(CONCAT428((uint)bVar18 *
                                      ((uint)bVar17 * auVar115._28_4_ | !bVar17 * uVar152) |
                                      !bVar18 * auVar127._28_4_,
                                      CONCAT424((uint)bVar16 *
                                                ((uint)bVar15 * auVar115._24_4_ | !bVar15 * uVar151)
                                                | !bVar16 * auVar127._24_4_,
                                                CONCAT420((uint)bVar14 *
                                                          ((uint)bVar13 * auVar115._20_4_ |
                                                          !bVar13 * uVar150) |
                                                          !bVar14 * auVar127._20_4_,
                                                          CONCAT416((uint)bVar12 *
                                                                    ((uint)bVar11 * auVar115._16_4_
                                                                    | !bVar11 * uVar149) |
                                                                    !bVar12 * auVar127._16_4_,
                                                                    CONCAT412((uint)bVar10 *
                                                                              ((uint)bVar9 *
                                                                               auVar115._12_4_ |
                                                                              !bVar9 * uVar148) |
                                                                              !bVar10 * auVar127.
                                                  _12_4_,CONCAT48((uint)bVar8 *
                                                                  ((uint)bVar7 * auVar115._8_4_ |
                                                                  !bVar7 * uVar147) |
                                                                  !bVar8 * auVar127._8_4_,
                                                                  CONCAT44((uint)bVar80 *
                                                                           ((uint)bVar6 *
                                                                            auVar115._4_4_ |
                                                                           !bVar6 * uVar146) |
                                                                           !bVar80 * auVar127._4_4_,
                                                                           (uint)(bVar76 & 1) *
                                                                           ((uint)(bVar72 & 1) *
                                                                            auVar115._0_4_ |
                                                                           !(bool)(bVar72 & 1) *
                                                                           uVar82) | !(bool)(bVar76 
                                                  & 1) * auVar127._0_4_))))))));
        bVar74 = (~bVar76 | bVar72) & bVar74;
      }
    }
    if ((bVar74 & 0x7f) == 0) {
      auVar176 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
      auVar262 = ZEXT3264(_DAT_02020f20);
      auVar265 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
      auVar145._0_32_ = local_aa0;
      auVar269 = ZEXT3264(local_aa0);
    }
    else {
      fVar240 = *(float *)(ray + k * 4 + 0x200) - (float)local_a00._0_4_;
      auVar168._4_4_ = fVar240;
      auVar168._0_4_ = fVar240;
      auVar168._8_4_ = fVar240;
      auVar168._12_4_ = fVar240;
      auVar168._16_4_ = fVar240;
      auVar168._20_4_ = fVar240;
      auVar168._24_4_ = fVar240;
      auVar168._28_4_ = fVar240;
      auVar115 = vminps_avx512vl(auVar168,in_ZMM31._0_32_);
      auVar69._4_4_ = fStack_73c;
      auVar69._0_4_ = local_740;
      auVar69._8_4_ = fStack_738;
      auVar69._12_4_ = fStack_734;
      auVar69._16_4_ = fStack_730;
      auVar69._20_4_ = fStack_72c;
      auVar69._24_4_ = fStack_728;
      auVar69._28_4_ = fStack_724;
      auVar120 = vmaxps_avx512vl(auVar69,auVar123);
      auVar102 = vmulps_avx512vl(auVar102,auVar126);
      auVar101 = vfmadd213ps_avx512vl(auVar101,auVar125,auVar102);
      auVar100 = vfmadd213ps_avx512vl(auVar100,auVar124,auVar101);
      auVar269 = ZEXT3264(local_aa0);
      auVar101 = vmulps_avx512vl(local_aa0,auVar126);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar138._0_32_,auVar125);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar95,auVar124);
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar101,auVar102);
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar22 = vcmpps_avx512vl(auVar102,auVar123,1);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      in_ZMM31 = ZEXT3264(auVar124);
      auVar100 = vxorps_avx512vl(auVar100,auVar124);
      auVar125 = vrcp14ps_avx512vl(auVar101);
      auVar126 = vxorps_avx512vl(auVar101,auVar124);
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar122 = vfnmadd213ps_avx512vl(auVar125,auVar101,auVar121);
      auVar122 = vfmadd132ps_avx512vl(auVar122,auVar125,auVar125);
      auVar122 = vmulps_avx512vl(auVar122,auVar100);
      uVar23 = vcmpps_avx512vl(auVar101,auVar126,1);
      bVar76 = (byte)uVar22 | (byte)uVar23;
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar100 = vblendmps_avx512vl(auVar122,auVar127);
      auVar128._0_4_ =
           (uint)(bVar76 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar125._0_4_;
      bVar6 = (bool)(bVar76 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar6 * auVar100._4_4_ | (uint)!bVar6 * auVar125._4_4_;
      bVar6 = (bool)(bVar76 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar6 * auVar100._8_4_ | (uint)!bVar6 * auVar125._8_4_;
      bVar6 = (bool)(bVar76 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar6 * auVar100._12_4_ | (uint)!bVar6 * auVar125._12_4_;
      bVar6 = (bool)(bVar76 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar6 * auVar100._16_4_ | (uint)!bVar6 * auVar125._16_4_;
      bVar6 = (bool)(bVar76 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar6 * auVar100._20_4_ | (uint)!bVar6 * auVar125._20_4_;
      bVar6 = (bool)(bVar76 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar6 * auVar100._24_4_ | (uint)!bVar6 * auVar125._24_4_;
      auVar128._28_4_ =
           (uint)(bVar76 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar125._28_4_;
      auVar100 = vmaxps_avx(auVar120,auVar128);
      uVar23 = vcmpps_avx512vl(auVar101,auVar126,6);
      bVar76 = (byte)uVar22 | (byte)uVar23;
      auVar129._0_4_ = (uint)(bVar76 & 1) * 0x7f800000 | (uint)!(bool)(bVar76 & 1) * auVar122._0_4_;
      bVar6 = (bool)(bVar76 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * auVar122._4_4_;
      bVar6 = (bool)(bVar76 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * auVar122._8_4_;
      bVar6 = (bool)(bVar76 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * auVar122._12_4_;
      bVar6 = (bool)(bVar76 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * auVar122._16_4_;
      bVar6 = (bool)(bVar76 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * auVar122._20_4_;
      bVar6 = (bool)(bVar76 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * auVar122._24_4_;
      auVar129._28_4_ =
           (uint)(bVar76 >> 7) * 0x7f800000 | (uint)!(bool)(bVar76 >> 7) * auVar122._28_4_;
      auVar101 = vminps_avx(auVar115,auVar129);
      auVar88 = vxorps_avx512vl(auVar126._0_16_,auVar126._0_16_);
      auVar108 = vsubps_avx512vl(ZEXT1632(auVar88),auVar108);
      auVar109 = vsubps_avx512vl(ZEXT1632(auVar88),auVar109);
      auVar120 = ZEXT1632(auVar88);
      auVar110 = vsubps_avx512vl(auVar120,auVar110);
      auVar42._4_4_ = auVar110._4_4_ * auVar113._4_4_;
      auVar42._0_4_ = auVar110._0_4_ * auVar113._0_4_;
      auVar42._8_4_ = auVar110._8_4_ * auVar113._8_4_;
      auVar42._12_4_ = auVar110._12_4_ * auVar113._12_4_;
      auVar42._16_4_ = auVar110._16_4_ * auVar113._16_4_;
      auVar42._20_4_ = auVar110._20_4_ * auVar113._20_4_;
      auVar42._24_4_ = auVar110._24_4_ * auVar113._24_4_;
      auVar42._28_4_ = auVar110._28_4_;
      auVar109 = vfnmsub231ps_avx512vl(auVar42,auVar112,auVar109);
      auVar108 = vfnmadd231ps_avx512vl(auVar109,auVar111,auVar108);
      auVar109 = vmulps_avx512vl(local_aa0,auVar113);
      auVar109 = vfnmsub231ps_avx512vl(auVar109,auVar138._0_32_,auVar112);
      auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar95,auVar111);
      vandps_avx512vl(auVar109,auVar102);
      uVar22 = vcmpps_avx512vl(auVar109,auVar123,1);
      auVar102 = vxorps_avx512vl(auVar108,auVar124);
      auVar108 = vrcp14ps_avx512vl(auVar109);
      auVar110 = vxorps_avx512vl(auVar109,auVar124);
      auVar115 = vfnmadd213ps_avx512vl(auVar108,auVar109,auVar121);
      auVar88 = vfmadd132ps_fma(auVar115,auVar108,auVar108);
      fVar240 = auVar88._0_4_ * auVar102._0_4_;
      fVar249 = auVar88._4_4_ * auVar102._4_4_;
      auVar43._4_4_ = fVar249;
      auVar43._0_4_ = fVar240;
      fVar250 = auVar88._8_4_ * auVar102._8_4_;
      auVar43._8_4_ = fVar250;
      fVar252 = auVar88._12_4_ * auVar102._12_4_;
      auVar43._12_4_ = fVar252;
      fVar261 = auVar102._16_4_ * 0.0;
      auVar43._16_4_ = fVar261;
      fVar254 = auVar102._20_4_ * 0.0;
      auVar43._20_4_ = fVar254;
      fVar255 = auVar102._24_4_ * 0.0;
      auVar43._24_4_ = fVar255;
      auVar43._28_4_ = auVar102._28_4_;
      uVar23 = vcmpps_avx512vl(auVar109,auVar110,1);
      bVar76 = (byte)uVar22 | (byte)uVar23;
      auVar115 = vblendmps_avx512vl(auVar43,auVar127);
      auVar130._0_4_ =
           (uint)(bVar76 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar76 & 1) * auVar108._0_4_;
      bVar6 = (bool)(bVar76 >> 1 & 1);
      auVar130._4_4_ = (uint)bVar6 * auVar115._4_4_ | (uint)!bVar6 * auVar108._4_4_;
      bVar6 = (bool)(bVar76 >> 2 & 1);
      auVar130._8_4_ = (uint)bVar6 * auVar115._8_4_ | (uint)!bVar6 * auVar108._8_4_;
      bVar6 = (bool)(bVar76 >> 3 & 1);
      auVar130._12_4_ = (uint)bVar6 * auVar115._12_4_ | (uint)!bVar6 * auVar108._12_4_;
      bVar6 = (bool)(bVar76 >> 4 & 1);
      auVar130._16_4_ = (uint)bVar6 * auVar115._16_4_ | (uint)!bVar6 * auVar108._16_4_;
      bVar6 = (bool)(bVar76 >> 5 & 1);
      auVar130._20_4_ = (uint)bVar6 * auVar115._20_4_ | (uint)!bVar6 * auVar108._20_4_;
      bVar6 = (bool)(bVar76 >> 6 & 1);
      auVar130._24_4_ = (uint)bVar6 * auVar115._24_4_ | (uint)!bVar6 * auVar108._24_4_;
      auVar130._28_4_ =
           (uint)(bVar76 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar76 >> 7) * auVar108._28_4_;
      _local_920 = vmaxps_avx(auVar100,auVar130);
      uVar23 = vcmpps_avx512vl(auVar109,auVar110,6);
      bVar76 = (byte)uVar22 | (byte)uVar23;
      auVar131._0_4_ = (uint)(bVar76 & 1) * 0x7f800000 | (uint)!(bool)(bVar76 & 1) * (int)fVar240;
      bVar6 = (bool)(bVar76 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar249;
      bVar6 = (bool)(bVar76 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar250;
      bVar6 = (bool)(bVar76 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar252;
      bVar6 = (bool)(bVar76 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar261;
      bVar6 = (bool)(bVar76 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar254;
      bVar6 = (bool)(bVar76 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar6 * 0x7f800000 | (uint)!bVar6 * (int)fVar255;
      auVar131._28_4_ =
           (uint)(bVar76 >> 7) * 0x7f800000 | (uint)!(bool)(bVar76 >> 7) * auVar102._28_4_;
      local_780 = vminps_avx(auVar101,auVar131);
      uVar22 = vcmpps_avx512vl(_local_920,local_780,2);
      bVar74 = bVar74 & 0x7f & (byte)uVar22;
      if (bVar74 == 0) {
        auVar176 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
        auVar262 = ZEXT3264(_DAT_02020f20);
        auVar265 = ZEXT3264(auVar121);
        auVar138._32_32_ = auVar145._32_32_;
        auVar145 = auVar138;
      }
      else {
        auVar102 = vmaxps_avx512vl(auVar120,local_a80);
        auVar100 = vminps_avx512vl(local_820,auVar121);
        auVar51 = ZEXT412(0);
        auVar101 = ZEXT1232(auVar51) << 0x20;
        auVar100 = vmaxps_avx(auVar100,ZEXT1232(auVar51) << 0x20);
        auVar108 = vminps_avx512vl(local_840,auVar121);
        auVar44._4_4_ = (auVar100._4_4_ + 1.0) * 0.125;
        auVar44._0_4_ = (auVar100._0_4_ + 0.0) * 0.125;
        auVar44._8_4_ = (auVar100._8_4_ + 2.0) * 0.125;
        auVar44._12_4_ = (auVar100._12_4_ + 3.0) * 0.125;
        auVar44._16_4_ = (auVar100._16_4_ + 4.0) * 0.125;
        auVar44._20_4_ = (auVar100._20_4_ + 5.0) * 0.125;
        auVar44._24_4_ = (auVar100._24_4_ + 6.0) * 0.125;
        auVar44._28_4_ = auVar100._28_4_ + 7.0;
        auVar88 = vfmadd213ps_fma(auVar44,local_a60,auVar239);
        local_820 = ZEXT1632(auVar88);
        auVar100 = vmaxps_avx(auVar108,ZEXT1232(auVar51) << 0x20);
        auVar45._4_4_ = (auVar100._4_4_ + 1.0) * 0.125;
        auVar45._0_4_ = (auVar100._0_4_ + 0.0) * 0.125;
        auVar45._8_4_ = (auVar100._8_4_ + 2.0) * 0.125;
        auVar45._12_4_ = (auVar100._12_4_ + 3.0) * 0.125;
        auVar45._16_4_ = (auVar100._16_4_ + 4.0) * 0.125;
        auVar45._20_4_ = (auVar100._20_4_ + 5.0) * 0.125;
        auVar45._24_4_ = (auVar100._24_4_ + 6.0) * 0.125;
        auVar45._28_4_ = auVar100._28_4_ + 7.0;
        auVar88 = vfmadd213ps_fma(auVar45,local_a60,auVar239);
        local_840 = ZEXT1632(auVar88);
        auVar169._0_4_ = auVar102._0_4_ * auVar102._0_4_;
        auVar169._4_4_ = auVar102._4_4_ * auVar102._4_4_;
        auVar169._8_4_ = auVar102._8_4_ * auVar102._8_4_;
        auVar169._12_4_ = auVar102._12_4_ * auVar102._12_4_;
        auVar169._16_4_ = auVar102._16_4_ * auVar102._16_4_;
        auVar169._20_4_ = auVar102._20_4_ * auVar102._20_4_;
        auVar169._24_4_ = auVar102._24_4_ * auVar102._24_4_;
        auVar169._28_4_ = 0;
        auVar100 = vsubps_avx(auVar116,auVar169);
        auVar102 = vmulps_avx512vl(auVar103,auVar100);
        auVar102 = vsubps_avx512vl(auVar119,auVar102);
        uVar22 = vcmpps_avx512vl(auVar102,ZEXT1232(auVar51) << 0x20,5);
        bVar76 = (byte)uVar22;
        if (bVar76 == 0) {
          auVar107 = ZEXT832(0) << 0x20;
          auVar96 = ZEXT832(0) << 0x20;
          auVar103 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar108 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar102 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar132._8_4_ = 0x7f800000;
          auVar132._0_8_ = 0x7f8000007f800000;
          auVar132._12_4_ = 0x7f800000;
          auVar132._16_4_ = 0x7f800000;
          auVar132._20_4_ = 0x7f800000;
          auVar132._24_4_ = 0x7f800000;
          auVar132._28_4_ = 0x7f800000;
          auVar133._8_4_ = 0xff800000;
          auVar133._0_8_ = 0xff800000ff800000;
          auVar133._12_4_ = 0xff800000;
          auVar133._16_4_ = 0xff800000;
          auVar133._20_4_ = 0xff800000;
          auVar133._24_4_ = 0xff800000;
          auVar133._28_4_ = 0xff800000;
        }
        else {
          auVar89 = vxorps_avx512vl(auVar112._0_16_,auVar112._0_16_);
          uVar81 = vcmpps_avx512vl(auVar102,auVar120,5);
          auVar101 = vsqrtps_avx(auVar102);
          auVar195._0_4_ = auVar99._0_4_ + auVar99._0_4_;
          auVar195._4_4_ = auVar99._4_4_ + auVar99._4_4_;
          auVar195._8_4_ = auVar99._8_4_ + auVar99._8_4_;
          auVar195._12_4_ = auVar99._12_4_ + auVar99._12_4_;
          auVar195._16_4_ = auVar99._16_4_ + auVar99._16_4_;
          auVar195._20_4_ = auVar99._20_4_ + auVar99._20_4_;
          auVar195._24_4_ = auVar99._24_4_ + auVar99._24_4_;
          auVar195._28_4_ = auVar99._28_4_ + auVar99._28_4_;
          auVar102 = vrcp14ps_avx512vl(auVar195);
          auVar103 = vfnmadd213ps_avx512vl(auVar195,auVar102,auVar121);
          auVar88 = vfmadd132ps_fma(auVar103,auVar102,auVar102);
          auVar34._8_4_ = 0x80000000;
          auVar34._0_8_ = 0x8000000080000000;
          auVar34._12_4_ = 0x80000000;
          auVar34._16_4_ = 0x80000000;
          auVar34._20_4_ = 0x80000000;
          auVar34._24_4_ = 0x80000000;
          auVar34._28_4_ = 0x80000000;
          auVar102 = vxorps_avx512vl(auVar117,auVar34);
          auVar102 = vsubps_avx(auVar102,auVar101);
          auVar46._4_4_ = auVar102._4_4_ * auVar88._4_4_;
          auVar46._0_4_ = auVar102._0_4_ * auVar88._0_4_;
          auVar46._8_4_ = auVar102._8_4_ * auVar88._8_4_;
          auVar46._12_4_ = auVar102._12_4_ * auVar88._12_4_;
          auVar46._16_4_ = auVar102._16_4_ * 0.0;
          auVar46._20_4_ = auVar102._20_4_ * 0.0;
          auVar46._24_4_ = auVar102._24_4_ * 0.0;
          auVar46._28_4_ = 0x3e000000;
          auVar101 = vsubps_avx512vl(auVar101,auVar117);
          auVar47._4_4_ = auVar101._4_4_ * auVar88._4_4_;
          auVar47._0_4_ = auVar101._0_4_ * auVar88._0_4_;
          auVar47._8_4_ = auVar101._8_4_ * auVar88._8_4_;
          auVar47._12_4_ = auVar101._12_4_ * auVar88._12_4_;
          auVar47._16_4_ = auVar101._16_4_ * 0.0;
          auVar47._20_4_ = auVar101._20_4_ * 0.0;
          auVar47._24_4_ = auVar101._24_4_ * 0.0;
          auVar47._28_4_ = fVar179;
          auVar101 = vfmadd213ps_avx512vl(auVar118,auVar46,auVar107);
          auVar48._4_4_ = auVar96._4_4_ * auVar101._4_4_;
          auVar48._0_4_ = auVar96._0_4_ * auVar101._0_4_;
          auVar48._8_4_ = auVar96._8_4_ * auVar101._8_4_;
          auVar48._12_4_ = auVar96._12_4_ * auVar101._12_4_;
          auVar48._16_4_ = auVar96._16_4_ * auVar101._16_4_;
          auVar48._20_4_ = auVar96._20_4_ * auVar101._20_4_;
          auVar48._24_4_ = auVar96._24_4_ * auVar101._24_4_;
          auVar48._28_4_ = auVar102._28_4_;
          auVar101 = vmulps_avx512vl(auVar95,auVar46);
          auVar102 = vmulps_avx512vl(auVar138._0_32_,auVar46);
          auVar109 = vmulps_avx512vl(local_aa0,auVar46);
          auVar103 = vfmadd213ps_avx512vl(auVar97,auVar48,auVar104);
          auVar103 = vsubps_avx512vl(auVar101,auVar103);
          auVar101 = vfmadd213ps_avx512vl(auVar98,auVar48,auVar105);
          auVar108 = vsubps_avx512vl(auVar102,auVar101);
          auVar88 = vfmadd213ps_fma(auVar48,auVar114,auVar106);
          auVar102 = vsubps_avx(auVar109,ZEXT1632(auVar88));
          auVar107 = vfmadd213ps_avx512vl(auVar118,auVar47,auVar107);
          auVar96 = vmulps_avx512vl(auVar96,auVar107);
          auVar107 = vmulps_avx512vl(auVar95,auVar47);
          auVar109 = vmulps_avx512vl(auVar138._0_32_,auVar47);
          auVar110 = vmulps_avx512vl(local_aa0,auVar47);
          auVar88 = vfmadd213ps_fma(auVar97,auVar96,auVar104);
          auVar101 = vsubps_avx(auVar107,ZEXT1632(auVar88));
          auVar88 = vfmadd213ps_fma(auVar98,auVar96,auVar105);
          auVar107 = vsubps_avx512vl(auVar109,ZEXT1632(auVar88));
          auVar88 = vfmadd213ps_fma(auVar114,auVar96,auVar106);
          auVar96 = vsubps_avx512vl(auVar110,ZEXT1632(auVar88));
          auVar214._8_4_ = 0x7f800000;
          auVar214._0_8_ = 0x7f8000007f800000;
          auVar214._12_4_ = 0x7f800000;
          auVar214._16_4_ = 0x7f800000;
          auVar214._20_4_ = 0x7f800000;
          auVar214._24_4_ = 0x7f800000;
          auVar214._28_4_ = 0x7f800000;
          auVar97 = vblendmps_avx512vl(auVar214,auVar46);
          bVar6 = (bool)((byte)uVar81 & 1);
          auVar132._0_4_ = (uint)bVar6 * auVar97._0_4_ | (uint)!bVar6 * auVar104._0_4_;
          bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar132._4_4_ = (uint)bVar6 * auVar97._4_4_ | (uint)!bVar6 * auVar104._4_4_;
          bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar132._8_4_ = (uint)bVar6 * auVar97._8_4_ | (uint)!bVar6 * auVar104._8_4_;
          bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar132._12_4_ = (uint)bVar6 * auVar97._12_4_ | (uint)!bVar6 * auVar104._12_4_;
          bVar6 = (bool)((byte)(uVar81 >> 4) & 1);
          auVar132._16_4_ = (uint)bVar6 * auVar97._16_4_ | (uint)!bVar6 * auVar104._16_4_;
          bVar6 = (bool)((byte)(uVar81 >> 5) & 1);
          auVar132._20_4_ = (uint)bVar6 * auVar97._20_4_ | (uint)!bVar6 * auVar104._20_4_;
          bVar6 = (bool)((byte)(uVar81 >> 6) & 1);
          auVar132._24_4_ = (uint)bVar6 * auVar97._24_4_ | (uint)!bVar6 * auVar104._24_4_;
          bVar6 = SUB81(uVar81 >> 7,0);
          auVar132._28_4_ = (uint)bVar6 * auVar97._28_4_ | (uint)!bVar6 * auVar104._28_4_;
          auVar215._8_4_ = 0xff800000;
          auVar215._0_8_ = 0xff800000ff800000;
          auVar215._12_4_ = 0xff800000;
          auVar215._16_4_ = 0xff800000;
          auVar215._20_4_ = 0xff800000;
          auVar215._24_4_ = 0xff800000;
          auVar215._28_4_ = 0xff800000;
          auVar97 = vblendmps_avx512vl(auVar215,auVar47);
          bVar6 = (bool)((byte)uVar81 & 1);
          auVar133._0_4_ = (uint)bVar6 * auVar97._0_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
          auVar133._4_4_ = (uint)bVar6 * auVar97._4_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
          auVar133._8_4_ = (uint)bVar6 * auVar97._8_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
          auVar133._12_4_ = (uint)bVar6 * auVar97._12_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar81 >> 4) & 1);
          auVar133._16_4_ = (uint)bVar6 * auVar97._16_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar81 >> 5) & 1);
          auVar133._20_4_ = (uint)bVar6 * auVar97._20_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = (bool)((byte)(uVar81 >> 6) & 1);
          auVar133._24_4_ = (uint)bVar6 * auVar97._24_4_ | (uint)!bVar6 * -0x800000;
          bVar6 = SUB81(uVar81 >> 7,0);
          auVar133._28_4_ = (uint)bVar6 * auVar97._28_4_ | (uint)!bVar6 * -0x800000;
          auVar258._8_4_ = 0x7fffffff;
          auVar258._0_8_ = 0x7fffffff7fffffff;
          auVar258._12_4_ = 0x7fffffff;
          auVar258._16_4_ = 0x7fffffff;
          auVar258._20_4_ = 0x7fffffff;
          auVar258._24_4_ = 0x7fffffff;
          auVar258._28_4_ = 0x7fffffff;
          auVar97 = vandps_avx(auVar258,local_8e0);
          auVar97 = vmaxps_avx(local_7c0,auVar97);
          auVar35._8_4_ = 0x36000000;
          auVar35._0_8_ = 0x3600000036000000;
          auVar35._12_4_ = 0x36000000;
          auVar35._16_4_ = 0x36000000;
          auVar35._20_4_ = 0x36000000;
          auVar35._24_4_ = 0x36000000;
          auVar35._28_4_ = 0x36000000;
          auVar98 = vmulps_avx512vl(auVar97,auVar35);
          auVar97 = vandps_avx(auVar99,auVar258);
          uVar77 = vcmpps_avx512vl(auVar97,auVar98,1);
          uVar81 = uVar81 & uVar77;
          bVar72 = (byte)uVar81;
          if (bVar72 != 0) {
            uVar77 = vcmpps_avx512vl(auVar100,ZEXT1632(auVar89),2);
            auVar259._8_4_ = 0xff800000;
            auVar259._0_8_ = 0xff800000ff800000;
            auVar259._12_4_ = 0xff800000;
            auVar259._16_4_ = 0xff800000;
            auVar259._20_4_ = 0xff800000;
            auVar259._24_4_ = 0xff800000;
            auVar259._28_4_ = 0xff800000;
            auVar264._8_4_ = 0x7f800000;
            auVar264._0_8_ = 0x7f8000007f800000;
            auVar264._12_4_ = 0x7f800000;
            auVar264._16_4_ = 0x7f800000;
            auVar264._20_4_ = 0x7f800000;
            auVar264._24_4_ = 0x7f800000;
            auVar264._28_4_ = 0x7f800000;
            auVar97 = vblendmps_avx512vl(auVar264,auVar259);
            bVar75 = (byte)uVar77;
            uVar82 = (uint)(bVar75 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar98._0_4_;
            bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
            uVar146 = (uint)bVar6 * auVar97._4_4_ | (uint)!bVar6 * auVar98._4_4_;
            bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
            uVar147 = (uint)bVar6 * auVar97._8_4_ | (uint)!bVar6 * auVar98._8_4_;
            bVar6 = (bool)((byte)(uVar77 >> 3) & 1);
            uVar148 = (uint)bVar6 * auVar97._12_4_ | (uint)!bVar6 * auVar98._12_4_;
            bVar6 = (bool)((byte)(uVar77 >> 4) & 1);
            uVar149 = (uint)bVar6 * auVar97._16_4_ | (uint)!bVar6 * auVar98._16_4_;
            bVar6 = (bool)((byte)(uVar77 >> 5) & 1);
            uVar150 = (uint)bVar6 * auVar97._20_4_ | (uint)!bVar6 * auVar98._20_4_;
            bVar6 = (bool)((byte)(uVar77 >> 6) & 1);
            uVar151 = (uint)bVar6 * auVar97._24_4_ | (uint)!bVar6 * auVar98._24_4_;
            bVar6 = SUB81(uVar77 >> 7,0);
            uVar152 = (uint)bVar6 * auVar97._28_4_ | (uint)!bVar6 * auVar98._28_4_;
            auVar132._0_4_ = (bVar72 & 1) * uVar82 | !(bool)(bVar72 & 1) * auVar132._0_4_;
            bVar6 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar132._4_4_ = bVar6 * uVar146 | !bVar6 * auVar132._4_4_;
            bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar132._8_4_ = bVar6 * uVar147 | !bVar6 * auVar132._8_4_;
            bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar132._12_4_ = bVar6 * uVar148 | !bVar6 * auVar132._12_4_;
            bVar6 = (bool)((byte)(uVar81 >> 4) & 1);
            auVar132._16_4_ = bVar6 * uVar149 | !bVar6 * auVar132._16_4_;
            bVar6 = (bool)((byte)(uVar81 >> 5) & 1);
            auVar132._20_4_ = bVar6 * uVar150 | !bVar6 * auVar132._20_4_;
            bVar6 = (bool)((byte)(uVar81 >> 6) & 1);
            auVar132._24_4_ = bVar6 * uVar151 | !bVar6 * auVar132._24_4_;
            bVar6 = SUB81(uVar81 >> 7,0);
            auVar132._28_4_ = bVar6 * uVar152 | !bVar6 * auVar132._28_4_;
            auVar97 = vblendmps_avx512vl(auVar259,auVar264);
            bVar6 = (bool)((byte)(uVar77 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar77 >> 2) & 1);
            bVar8 = (bool)((byte)(uVar77 >> 3) & 1);
            bVar9 = (bool)((byte)(uVar77 >> 4) & 1);
            bVar10 = (bool)((byte)(uVar77 >> 5) & 1);
            bVar11 = (bool)((byte)(uVar77 >> 6) & 1);
            bVar12 = SUB81(uVar77 >> 7,0);
            auVar133._0_4_ =
                 (uint)(bVar72 & 1) *
                 ((uint)(bVar75 & 1) * auVar97._0_4_ | !(bool)(bVar75 & 1) * uVar82) |
                 !(bool)(bVar72 & 1) * auVar133._0_4_;
            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar133._4_4_ =
                 (uint)bVar80 * ((uint)bVar6 * auVar97._4_4_ | !bVar6 * uVar146) |
                 !bVar80 * auVar133._4_4_;
            bVar6 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar133._8_4_ =
                 (uint)bVar6 * ((uint)bVar7 * auVar97._8_4_ | !bVar7 * uVar147) |
                 !bVar6 * auVar133._8_4_;
            bVar6 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar133._12_4_ =
                 (uint)bVar6 * ((uint)bVar8 * auVar97._12_4_ | !bVar8 * uVar148) |
                 !bVar6 * auVar133._12_4_;
            bVar6 = (bool)((byte)(uVar81 >> 4) & 1);
            auVar133._16_4_ =
                 (uint)bVar6 * ((uint)bVar9 * auVar97._16_4_ | !bVar9 * uVar149) |
                 !bVar6 * auVar133._16_4_;
            bVar6 = (bool)((byte)(uVar81 >> 5) & 1);
            auVar133._20_4_ =
                 (uint)bVar6 * ((uint)bVar10 * auVar97._20_4_ | !bVar10 * uVar150) |
                 !bVar6 * auVar133._20_4_;
            bVar6 = (bool)((byte)(uVar81 >> 6) & 1);
            auVar133._24_4_ =
                 (uint)bVar6 * ((uint)bVar11 * auVar97._24_4_ | !bVar11 * uVar151) |
                 !bVar6 * auVar133._24_4_;
            bVar6 = SUB81(uVar81 >> 7,0);
            auVar133._28_4_ =
                 (uint)bVar6 * ((uint)bVar12 * auVar97._28_4_ | !bVar12 * uVar152) |
                 !bVar6 * auVar133._28_4_;
            bVar76 = (~bVar72 | bVar75) & bVar76;
          }
        }
        auVar263._8_4_ = 0x7fffffff;
        auVar263._0_8_ = 0x7fffffff7fffffff;
        auVar263._12_4_ = 0x7fffffff;
        auVar96 = vmulps_avx512vl(local_aa0,auVar96);
        auVar107 = vfmadd231ps_avx512vl(auVar96,auVar138._0_32_,auVar107);
        auVar145._0_32_ = vfmadd231ps_avx512vl(auVar107,auVar95,auVar101);
        _local_500 = _local_920;
        local_4e0 = vminps_avx(local_780,auVar132);
        auVar225 = ZEXT3264(local_4e0);
        auVar248._8_4_ = 0x7fffffff;
        auVar248._0_8_ = 0x7fffffff7fffffff;
        auVar248._12_4_ = 0x7fffffff;
        auVar248._16_4_ = 0x7fffffff;
        auVar248._20_4_ = 0x7fffffff;
        auVar248._24_4_ = 0x7fffffff;
        auVar248._28_4_ = 0x7fffffff;
        auVar107 = vandps_avx(auVar145._0_32_,auVar248);
        auVar234 = ZEXT3264(auVar107);
        _local_880 = vmaxps_avx(_local_920,auVar133);
        _local_7a0 = _local_880;
        auVar216._8_4_ = 0x3e99999a;
        auVar216._0_8_ = 0x3e99999a3e99999a;
        auVar216._12_4_ = 0x3e99999a;
        auVar216._16_4_ = 0x3e99999a;
        auVar216._20_4_ = 0x3e99999a;
        auVar216._24_4_ = 0x3e99999a;
        auVar216._28_4_ = 0x3e99999a;
        uVar22 = vcmpps_avx512vl(auVar107,auVar216,1);
        uVar23 = vcmpps_avx512vl(_local_920,local_4e0,2);
        bVar72 = (byte)uVar23 & bVar74;
        uVar24 = vcmpps_avx512vl(_local_880,local_780,2);
        if ((bVar74 & ((byte)uVar24 | (byte)uVar23)) == 0) {
          auVar176 = ZEXT3264(auVar248);
          auVar262 = ZEXT3264(_DAT_02020f20);
          auVar265 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
        }
        else {
          auVar107 = vmulps_avx512vl(local_aa0,auVar102);
          auVar107 = vfmadd213ps_avx512vl(auVar108,auVar138._0_32_,auVar107);
          auVar107 = vfmadd213ps_avx512vl(auVar103,auVar95,auVar107);
          auVar107 = vandps_avx(auVar107,auVar248);
          uVar23 = vcmpps_avx512vl(auVar107,auVar216,1);
          bVar75 = (byte)uVar23 | ~bVar76;
          auVar170._8_4_ = 2;
          auVar170._0_8_ = 0x200000002;
          auVar170._12_4_ = 2;
          auVar170._16_4_ = 2;
          auVar170._20_4_ = 2;
          auVar170._24_4_ = 2;
          auVar170._28_4_ = 2;
          auVar36._8_4_ = 3;
          auVar36._0_8_ = 0x300000003;
          auVar36._12_4_ = 3;
          auVar36._16_4_ = 3;
          auVar36._20_4_ = 3;
          auVar36._24_4_ = 3;
          auVar36._28_4_ = 3;
          auVar107 = vpblendmd_avx512vl(auVar170,auVar36);
          local_760._0_4_ = (uint)(bVar75 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar75 & 1) * 2;
          bVar6 = (bool)(bVar75 >> 1 & 1);
          local_760._4_4_ = (uint)bVar6 * auVar107._4_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar75 >> 2 & 1);
          local_760._8_4_ = (uint)bVar6 * auVar107._8_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar75 >> 3 & 1);
          local_760._12_4_ = (uint)bVar6 * auVar107._12_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar75 >> 4 & 1);
          local_760._16_4_ = (uint)bVar6 * auVar107._16_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar75 >> 5 & 1);
          local_760._20_4_ = (uint)bVar6 * auVar107._20_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar75 >> 6 & 1);
          local_760._24_4_ = (uint)bVar6 * auVar107._24_4_ | (uint)!bVar6 * 2;
          local_760._28_4_ = (uint)(bVar75 >> 7) * auVar107._28_4_ | (uint)!(bool)(bVar75 >> 7) * 2;
          auVar218._0_32_ = vpbroadcastd_avx512vl();
          auVar218._32_32_ = auVar145._32_32_;
          local_7e0 = auVar218._0_32_;
          uVar23 = vpcmpd_avx512vl(auVar218._0_32_,local_760,5);
          bVar75 = (byte)uVar23 & bVar72;
          if (bVar75 != 0) {
            auVar89 = vminps_avx(local_940._0_16_,local_980._0_16_);
            auVar88 = vmaxps_avx(local_940._0_16_,local_980._0_16_);
            auVar86 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar90 = vminps_avx(auVar89,auVar86);
            auVar89 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar86 = vmaxps_avx(auVar88,auVar89);
            auVar88 = vandps_avx(auVar263,auVar90);
            auVar89 = vandps_avx(auVar263,auVar86);
            auVar88 = vmaxps_avx(auVar88,auVar89);
            auVar89 = vmovshdup_avx(auVar88);
            auVar89 = vmaxss_avx(auVar89,auVar88);
            auVar88 = vshufpd_avx(auVar88,auVar88,1);
            auVar88 = vmaxss_avx(auVar88,auVar89);
            fVar240 = auVar88._0_4_ * 1.9073486e-06;
            local_a10 = vshufps_avx(auVar86,auVar86,0xff);
            local_860 = (float)local_920._0_4_ + (float)local_900._0_4_;
            fStack_85c = (float)local_920._4_4_ + (float)local_900._4_4_;
            fStack_858 = fStack_918 + fStack_8f8;
            fStack_854 = fStack_914 + fStack_8f4;
            fStack_850 = fStack_910 + fStack_8f0;
            fStack_84c = fStack_90c + fStack_8ec;
            fStack_848 = fStack_908 + fStack_8e8;
            fStack_844 = fStack_904 + fStack_8e4;
            do {
              auVar171._8_4_ = 0x7f800000;
              auVar171._0_8_ = 0x7f8000007f800000;
              auVar171._12_4_ = 0x7f800000;
              auVar171._16_4_ = 0x7f800000;
              auVar171._20_4_ = 0x7f800000;
              auVar171._24_4_ = 0x7f800000;
              auVar171._28_4_ = 0x7f800000;
              auVar145._32_32_ = vblendmps_avx512vl(auVar171,_local_920);
              auVar134._0_4_ =
                   (uint)(bVar75 & 1) * auVar145._32_4_ | (uint)!(bool)(bVar75 & 1) * 0x7f800000;
              bVar6 = (bool)(bVar75 >> 1 & 1);
              auVar134._4_4_ = (uint)bVar6 * auVar145._36_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar75 >> 2 & 1);
              auVar134._8_4_ = (uint)bVar6 * auVar145._40_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar75 >> 3 & 1);
              auVar134._12_4_ = (uint)bVar6 * auVar145._44_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar75 >> 4 & 1);
              auVar134._16_4_ = (uint)bVar6 * auVar145._48_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar75 >> 5 & 1);
              auVar134._20_4_ = (uint)bVar6 * auVar145._52_4_ | (uint)!bVar6 * 0x7f800000;
              auVar134._24_4_ =
                   (uint)(bVar75 >> 6) * auVar145._56_4_ | (uint)!(bool)(bVar75 >> 6) * 0x7f800000;
              auVar134._28_4_ = 0x7f800000;
              auVar218._0_32_ = auVar134;
              auVar145._32_32_ = vshufps_avx(auVar134,auVar134,0xb1);
              auVar145._32_32_ = vminps_avx(auVar134,auVar145._32_32_);
              auVar107 = vshufpd_avx(auVar145._32_32_,auVar145._32_32_,5);
              auVar145._32_32_ = vminps_avx(auVar145._32_32_,auVar107);
              auVar107 = vpermpd_avx2(auVar145._32_32_,0x4e);
              auVar145._32_32_ = vminps_avx(auVar145._32_32_,auVar107);
              uVar23 = vcmpps_avx512vl(auVar134,auVar145._32_32_,0);
              bVar70 = (byte)uVar23 & bVar75;
              bVar71 = bVar75;
              if (bVar70 != 0) {
                bVar71 = bVar70;
              }
              iVar25 = 0;
              for (uVar82 = (uint)bVar71; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
                iVar25 = iVar25 + 1;
              }
              fVar249 = *(float *)(local_820 + (uint)(iVar25 << 2));
              fVar250 = *(float *)(local_500 + (uint)(iVar25 << 2));
              fVar252 = auVar83._0_4_;
              if ((float)local_a30._0_4_ < 0.0) {
                fVar252 = sqrtf((float)local_a30._0_4_);
              }
              lVar79 = 4;
              do {
                auVar157._4_4_ = fVar250;
                auVar157._0_4_ = fVar250;
                auVar157._8_4_ = fVar250;
                auVar157._12_4_ = fVar250;
                auVar89 = vfmadd132ps_fma(auVar157,ZEXT816(0) << 0x40,local_a20);
                fVar261 = 1.0 - fVar249;
                auVar202._0_4_ = local_980._0_4_ * fVar249;
                auVar202._4_4_ = local_980._4_4_ * fVar249;
                auVar202._8_4_ = local_980._8_4_ * fVar249;
                auVar202._12_4_ = local_980._12_4_ * fVar249;
                local_9b0 = ZEXT416((uint)fVar261);
                auVar222._4_4_ = fVar261;
                auVar222._0_4_ = fVar261;
                auVar222._8_4_ = fVar261;
                auVar222._12_4_ = fVar261;
                auVar88 = vfmadd231ps_fma(auVar202,auVar222,local_940._0_16_);
                auVar228._0_4_ = local_960._0_4_ * fVar249;
                auVar228._4_4_ = local_960._4_4_ * fVar249;
                auVar228._8_4_ = local_960._8_4_ * fVar249;
                auVar228._12_4_ = local_960._12_4_ * fVar249;
                auVar86 = vfmadd231ps_fma(auVar228,auVar222,local_980._0_16_);
                auVar237._0_4_ = fVar249 * (float)local_9a0._0_4_;
                auVar237._4_4_ = fVar249 * (float)local_9a0._4_4_;
                auVar237._8_4_ = fVar249 * fStack_998;
                auVar237._12_4_ = fVar249 * fStack_994;
                auVar90 = vfmadd231ps_fma(auVar237,auVar222,local_960._0_16_);
                auVar246._0_4_ = fVar249 * auVar86._0_4_;
                auVar246._4_4_ = fVar249 * auVar86._4_4_;
                auVar246._8_4_ = fVar249 * auVar86._8_4_;
                auVar246._12_4_ = fVar249 * auVar86._12_4_;
                auVar88 = vfmadd231ps_fma(auVar246,auVar222,auVar88);
                auVar203._0_4_ = fVar249 * auVar90._0_4_;
                auVar203._4_4_ = fVar249 * auVar90._4_4_;
                auVar203._8_4_ = fVar249 * auVar90._8_4_;
                auVar203._12_4_ = fVar249 * auVar90._12_4_;
                auVar86 = vfmadd231ps_fma(auVar203,auVar222,auVar86);
                auVar229._0_4_ = fVar249 * auVar86._0_4_;
                auVar229._4_4_ = fVar249 * auVar86._4_4_;
                auVar229._8_4_ = fVar249 * auVar86._8_4_;
                auVar229._12_4_ = fVar249 * auVar86._12_4_;
                auVar90 = vfmadd231ps_fma(auVar229,auVar88,auVar222);
                auVar88 = vsubps_avx(auVar86,auVar88);
                auVar27._8_4_ = 0x40400000;
                auVar27._0_8_ = 0x4040000040400000;
                auVar27._12_4_ = 0x40400000;
                auVar145._32_32_ = auVar218._32_32_;
                auVar86 = vmulps_avx512vl(auVar88,auVar27);
                local_8e0._0_16_ = auVar90;
                auVar88 = vsubps_avx(auVar89,auVar90);
                local_a60._0_16_ = auVar88;
                auVar88 = vdpps_avx(auVar88,auVar88,0x7f);
                local_a80._0_16_ = auVar88;
                local_bc0 = ZEXT416((uint)fVar249);
                if (auVar88._0_4_ < 0.0) {
                  auVar225._0_4_ = sqrtf(auVar88._0_4_);
                  auVar225._4_60_ = extraout_var;
                  auVar88 = auVar225._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                }
                local_9c0 = vdpps_avx(auVar86,auVar86,0x7f);
                fVar261 = local_9c0._0_4_;
                auVar204._4_12_ = ZEXT812(0) << 0x20;
                auVar204._0_4_ = fVar261;
                auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar204);
                fVar179 = auVar89._0_4_;
                local_9d0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar204);
                auVar28._8_4_ = 0x80000000;
                auVar28._0_8_ = 0x8000000080000000;
                auVar28._12_4_ = 0x80000000;
                auVar90 = vxorps_avx512vl(local_9c0,auVar28);
                auVar89 = vfnmadd213ss_fma(local_9d0,local_9c0,ZEXT416(0x40000000));
                uVar82 = auVar88._0_4_;
                if (fVar261 < auVar90._0_4_) {
                  auVar234._0_4_ = sqrtf(fVar261);
                  auVar234._4_60_ = extraout_var_00;
                  auVar88 = ZEXT416(uVar82);
                  auVar90 = auVar234._0_16_;
                }
                else {
                  auVar90 = vsqrtss_avx512f(local_9c0,local_9c0);
                }
                fVar261 = fVar179 * 1.5 + fVar261 * -0.5 * fVar179 * fVar179 * fVar179;
                auVar158._0_4_ = auVar86._0_4_ * fVar261;
                auVar158._4_4_ = auVar86._4_4_ * fVar261;
                auVar158._8_4_ = auVar86._8_4_ * fVar261;
                auVar158._12_4_ = auVar86._12_4_ * fVar261;
                auVar21 = vdpps_avx(local_a60._0_16_,auVar158,0x7f);
                fVar255 = auVar88._0_4_;
                fVar179 = auVar21._0_4_;
                auVar159._0_4_ = fVar179 * fVar179;
                auVar159._4_4_ = auVar21._4_4_ * auVar21._4_4_;
                auVar159._8_4_ = auVar21._8_4_ * auVar21._8_4_;
                auVar159._12_4_ = auVar21._12_4_ * auVar21._12_4_;
                auVar91 = vsubps_avx512vl(local_a80._0_16_,auVar159);
                fVar254 = auVar91._0_4_;
                auVar182._4_12_ = ZEXT812(0) << 0x20;
                auVar182._0_4_ = fVar254;
                auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar182);
                auVar92 = vmulss_avx512f(auVar87,ZEXT416(0x3fc00000));
                auVar84 = vmulss_avx512f(auVar91,ZEXT416(0xbf000000));
                if (fVar254 < 0.0) {
                  local_9f0 = fVar261;
                  fStack_9ec = fVar261;
                  fStack_9e8 = fVar261;
                  fStack_9e4 = fVar261;
                  local_9e0 = auVar87;
                  fVar254 = sqrtf(fVar254);
                  auVar84 = ZEXT416(auVar84._0_4_);
                  auVar92 = ZEXT416(auVar92._0_4_);
                  auVar90 = ZEXT416(auVar90._0_4_);
                  auVar88 = ZEXT416(uVar82);
                  auVar87 = local_9e0;
                  fVar261 = local_9f0;
                  fVar256 = fStack_9ec;
                  fVar251 = fStack_9e8;
                  fVar253 = fStack_9e4;
                }
                else {
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                  fVar254 = auVar91._0_4_;
                  fVar256 = fVar261;
                  fVar251 = fVar261;
                  fVar253 = fVar261;
                }
                auVar263._8_4_ = 0x7fffffff;
                auVar263._0_8_ = 0x7fffffff7fffffff;
                auVar263._12_4_ = 0x7fffffff;
                auVar139._32_32_ = auVar145._32_32_;
                auVar139._0_32_ = local_aa0;
                auVar269 = ZEXT3264(local_aa0);
                auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_bc0,local_9b0);
                fVar178 = auVar91._0_4_ * 6.0;
                fVar20 = fVar249 * 6.0;
                auVar205._0_4_ = fVar20 * (float)local_9a0._0_4_;
                auVar205._4_4_ = fVar20 * (float)local_9a0._4_4_;
                auVar205._8_4_ = fVar20 * fStack_998;
                auVar205._12_4_ = fVar20 * fStack_994;
                auVar183._4_4_ = fVar178;
                auVar183._0_4_ = fVar178;
                auVar183._8_4_ = fVar178;
                auVar183._12_4_ = fVar178;
                auVar91 = vfmadd132ps_fma(auVar183,auVar205,local_960._0_16_);
                auVar94 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9b0,local_bc0);
                fVar178 = auVar94._0_4_ * 6.0;
                auVar206._4_4_ = fVar178;
                auVar206._0_4_ = fVar178;
                auVar206._8_4_ = fVar178;
                auVar206._12_4_ = fVar178;
                auVar91 = vfmadd132ps_fma(auVar206,auVar91,local_980._0_16_);
                fVar178 = local_9b0._0_4_ * 6.0;
                auVar184._4_4_ = fVar178;
                auVar184._0_4_ = fVar178;
                auVar184._8_4_ = fVar178;
                auVar184._12_4_ = fVar178;
                auVar91 = vfmadd132ps_fma(auVar184,auVar91,local_940._0_16_);
                auVar207._0_4_ = auVar91._0_4_ * (float)local_9c0._0_4_;
                auVar207._4_4_ = auVar91._4_4_ * (float)local_9c0._0_4_;
                auVar207._8_4_ = auVar91._8_4_ * (float)local_9c0._0_4_;
                auVar207._12_4_ = auVar91._12_4_ * (float)local_9c0._0_4_;
                auVar91 = vdpps_avx(auVar86,auVar91,0x7f);
                fVar178 = auVar91._0_4_;
                auVar185._0_4_ = auVar86._0_4_ * fVar178;
                auVar185._4_4_ = auVar86._4_4_ * fVar178;
                auVar185._8_4_ = auVar86._8_4_ * fVar178;
                auVar185._12_4_ = auVar86._12_4_ * fVar178;
                auVar91 = vsubps_avx(auVar207,auVar185);
                fVar178 = auVar89._0_4_ * (float)local_9d0._0_4_;
                auVar29._8_4_ = 0x80000000;
                auVar29._0_8_ = 0x8000000080000000;
                auVar29._12_4_ = 0x80000000;
                auVar218._16_48_ = auVar139._16_48_;
                auVar93 = vxorps_avx512vl(auVar86,auVar29);
                auVar230._0_4_ = fVar261 * auVar91._0_4_ * fVar178;
                auVar230._4_4_ = fVar256 * auVar91._4_4_ * fVar178;
                auVar230._8_4_ = fVar251 * auVar91._8_4_ * fVar178;
                auVar230._12_4_ = fVar253 * auVar91._12_4_ * fVar178;
                auVar89 = vdpps_avx(auVar93,auVar158,0x7f);
                auVar91 = vmaxss_avx(ZEXT416((uint)fVar240),
                                     ZEXT416((uint)(fVar250 * fVar252 * 1.9073486e-06)));
                auVar94 = vdivss_avx512f(ZEXT416((uint)fVar240),auVar90);
                auVar90 = vdpps_avx(local_a60._0_16_,auVar230,0x7f);
                auVar88 = vfmadd213ss_fma(auVar88,ZEXT416((uint)fVar240),auVar91);
                auVar94 = vfmadd213ss_fma(ZEXT416((uint)(fVar255 + 1.0)),auVar94,auVar88);
                auVar88 = vdpps_avx(local_a20,auVar158,0x7f);
                fVar261 = auVar89._0_4_ + auVar90._0_4_;
                auVar89 = vdpps_avx(local_a60._0_16_,auVar93,0x7f);
                auVar84 = vmulss_avx512f(auVar84,auVar87);
                auVar87 = vmulss_avx512f(auVar87,auVar87);
                auVar90 = vdpps_avx(local_a60._0_16_,local_a20,0x7f);
                auVar218._0_16_ =
                     vaddss_avx512f(auVar92,ZEXT416((uint)(auVar84._0_4_ * auVar87._0_4_)));
                auVar87 = vfnmadd231ss_fma(auVar89,auVar21,ZEXT416((uint)fVar261));
                auVar92 = vfnmadd231ss_fma(auVar90,auVar21,auVar88);
                auVar89 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar254 = fVar254 - auVar89._0_4_;
                auVar89 = vshufps_avx(auVar86,auVar86,0xff);
                auVar90 = vfmsub213ss_fma(auVar87,auVar218._0_16_,auVar89);
                fVar255 = auVar92._0_4_ * auVar218._0_4_;
                auVar87 = vfmsub231ss_fma(ZEXT416((uint)(auVar88._0_4_ * auVar90._0_4_)),
                                          ZEXT416((uint)fVar261),ZEXT416((uint)fVar255));
                fVar256 = auVar87._0_4_;
                fVar261 = fVar254 * (fVar261 / fVar256) - fVar179 * (auVar90._0_4_ / fVar256);
                auVar234 = ZEXT464((uint)fVar261);
                fVar249 = fVar249 - (fVar179 * (fVar255 / fVar256) -
                                    fVar254 * (auVar88._0_4_ / fVar256));
                fVar250 = fVar250 - fVar261;
                auVar88 = vandps_avx(auVar21,auVar263);
                if (auVar94._0_4_ <= auVar88._0_4_) {
LAB_01b90e9d:
                  bVar6 = false;
                }
                else {
                  auVar90 = vfmadd231ss_fma(ZEXT416((uint)(auVar94._0_4_ + auVar91._0_4_)),local_a10
                                            ,ZEXT416(0x36000000));
                  auVar88 = vandps_avx(auVar263,ZEXT416((uint)fVar254));
                  if (auVar90._0_4_ <= auVar88._0_4_) goto LAB_01b90e9d;
                  fVar250 = fVar250 + (float)local_a00._0_4_;
                  bVar6 = true;
                  if (fVar153 <= fVar250) {
                    fVar261 = *(float *)(ray + k * 4 + 0x200);
                    auVar234 = ZEXT464((uint)fVar261);
                    if (((fVar250 <= fVar261) && (0.0 <= fVar249)) && (fVar249 <= 1.0)) {
                      auVar141._16_48_ = auVar218._16_48_;
                      auVar141._0_16_ = ZEXT816(0) << 0x20;
                      auVar140._4_60_ = auVar141._4_60_;
                      auVar140._0_4_ = local_a80._0_4_;
                      auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar140._0_16_);
                      fVar179 = auVar88._0_4_;
                      auVar218._0_16_ = vmulss_avx512f(local_a80._0_16_,ZEXT416(0xbf000000));
                      pGVar3 = (context->scene->geometries).items[uVar78].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                        fVar179 = fVar179 * 1.5 + auVar218._0_4_ * fVar179 * fVar179 * fVar179;
                        auVar186._0_4_ = local_a60._0_4_ * fVar179;
                        auVar186._4_4_ = local_a60._4_4_ * fVar179;
                        auVar186._8_4_ = local_a60._8_4_ * fVar179;
                        auVar186._12_4_ = local_a60._12_4_ * fVar179;
                        auVar90 = vfmadd213ps_fma(auVar89,auVar186,auVar86);
                        auVar88 = vshufps_avx(auVar186,auVar186,0xc9);
                        auVar89 = vshufps_avx(auVar86,auVar86,0xc9);
                        auVar187._0_4_ = auVar186._0_4_ * auVar89._0_4_;
                        auVar187._4_4_ = auVar186._4_4_ * auVar89._4_4_;
                        auVar187._8_4_ = auVar186._8_4_ * auVar89._8_4_;
                        auVar187._12_4_ = auVar186._12_4_ * auVar89._12_4_;
                        auVar86 = vfmsub231ps_fma(auVar187,auVar86,auVar88);
                        auVar88 = vshufps_avx(auVar86,auVar86,0xc9);
                        auVar89 = vshufps_avx(auVar90,auVar90,0xc9);
                        auVar86 = vshufps_avx(auVar86,auVar86,0xd2);
                        auVar160._0_4_ = auVar90._0_4_ * auVar86._0_4_;
                        auVar160._4_4_ = auVar90._4_4_ * auVar86._4_4_;
                        auVar160._8_4_ = auVar90._8_4_ * auVar86._8_4_;
                        auVar160._12_4_ = auVar90._12_4_ * auVar86._12_4_;
                        auVar88 = vfmsub231ps_fma(auVar160,auVar88,auVar89);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x200) = fVar250;
                          uVar219 = vextractps_avx(auVar88,1);
                          *(undefined4 *)(ray + k * 4 + 0x300) = uVar219;
                          uVar219 = vextractps_avx(auVar88,2);
                          *(undefined4 *)(ray + k * 4 + 0x340) = uVar219;
                          *(int *)(ray + k * 4 + 0x380) = auVar88._0_4_;
                          *(float *)(ray + k * 4 + 0x3c0) = fVar249;
                          *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                          *(uint *)(ray + k * 4 + 0x440) = uVar2;
                          *(uint *)(ray + k * 4 + 0x480) = uVar78;
                          *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                        }
                        else {
                          pRVar5 = context->user;
                          local_340 = vbroadcastss_avx512f(ZEXT416((uint)fVar249));
                          auVar176 = vbroadcastss_avx512f(ZEXT416(1));
                          auVar176 = vpermps_avx512f(auVar176,ZEXT1664(auVar88));
                          auVar262 = vbroadcastss_avx512f(ZEXT416(2));
                          local_3c0 = vpermps_avx512f(auVar262,ZEXT1664(auVar88));
                          local_380 = vbroadcastss_avx512f(auVar88);
                          local_400[0] = (RTCHitN)auVar176[0];
                          local_400[1] = (RTCHitN)auVar176[1];
                          local_400[2] = (RTCHitN)auVar176[2];
                          local_400[3] = (RTCHitN)auVar176[3];
                          local_400[4] = (RTCHitN)auVar176[4];
                          local_400[5] = (RTCHitN)auVar176[5];
                          local_400[6] = (RTCHitN)auVar176[6];
                          local_400[7] = (RTCHitN)auVar176[7];
                          local_400[8] = (RTCHitN)auVar176[8];
                          local_400[9] = (RTCHitN)auVar176[9];
                          local_400[10] = (RTCHitN)auVar176[10];
                          local_400[0xb] = (RTCHitN)auVar176[0xb];
                          local_400[0xc] = (RTCHitN)auVar176[0xc];
                          local_400[0xd] = (RTCHitN)auVar176[0xd];
                          local_400[0xe] = (RTCHitN)auVar176[0xe];
                          local_400[0xf] = (RTCHitN)auVar176[0xf];
                          local_400[0x10] = (RTCHitN)auVar176[0x10];
                          local_400[0x11] = (RTCHitN)auVar176[0x11];
                          local_400[0x12] = (RTCHitN)auVar176[0x12];
                          local_400[0x13] = (RTCHitN)auVar176[0x13];
                          local_400[0x14] = (RTCHitN)auVar176[0x14];
                          local_400[0x15] = (RTCHitN)auVar176[0x15];
                          local_400[0x16] = (RTCHitN)auVar176[0x16];
                          local_400[0x17] = (RTCHitN)auVar176[0x17];
                          local_400[0x18] = (RTCHitN)auVar176[0x18];
                          local_400[0x19] = (RTCHitN)auVar176[0x19];
                          local_400[0x1a] = (RTCHitN)auVar176[0x1a];
                          local_400[0x1b] = (RTCHitN)auVar176[0x1b];
                          local_400[0x1c] = (RTCHitN)auVar176[0x1c];
                          local_400[0x1d] = (RTCHitN)auVar176[0x1d];
                          local_400[0x1e] = (RTCHitN)auVar176[0x1e];
                          local_400[0x1f] = (RTCHitN)auVar176[0x1f];
                          local_400[0x20] = (RTCHitN)auVar176[0x20];
                          local_400[0x21] = (RTCHitN)auVar176[0x21];
                          local_400[0x22] = (RTCHitN)auVar176[0x22];
                          local_400[0x23] = (RTCHitN)auVar176[0x23];
                          local_400[0x24] = (RTCHitN)auVar176[0x24];
                          local_400[0x25] = (RTCHitN)auVar176[0x25];
                          local_400[0x26] = (RTCHitN)auVar176[0x26];
                          local_400[0x27] = (RTCHitN)auVar176[0x27];
                          local_400[0x28] = (RTCHitN)auVar176[0x28];
                          local_400[0x29] = (RTCHitN)auVar176[0x29];
                          local_400[0x2a] = (RTCHitN)auVar176[0x2a];
                          local_400[0x2b] = (RTCHitN)auVar176[0x2b];
                          local_400[0x2c] = (RTCHitN)auVar176[0x2c];
                          local_400[0x2d] = (RTCHitN)auVar176[0x2d];
                          local_400[0x2e] = (RTCHitN)auVar176[0x2e];
                          local_400[0x2f] = (RTCHitN)auVar176[0x2f];
                          local_400[0x30] = (RTCHitN)auVar176[0x30];
                          local_400[0x31] = (RTCHitN)auVar176[0x31];
                          local_400[0x32] = (RTCHitN)auVar176[0x32];
                          local_400[0x33] = (RTCHitN)auVar176[0x33];
                          local_400[0x34] = (RTCHitN)auVar176[0x34];
                          local_400[0x35] = (RTCHitN)auVar176[0x35];
                          local_400[0x36] = (RTCHitN)auVar176[0x36];
                          local_400[0x37] = (RTCHitN)auVar176[0x37];
                          local_400[0x38] = (RTCHitN)auVar176[0x38];
                          local_400[0x39] = (RTCHitN)auVar176[0x39];
                          local_400[0x3a] = (RTCHitN)auVar176[0x3a];
                          local_400[0x3b] = (RTCHitN)auVar176[0x3b];
                          local_400[0x3c] = (RTCHitN)auVar176[0x3c];
                          local_400[0x3d] = (RTCHitN)auVar176[0x3d];
                          local_400[0x3e] = (RTCHitN)auVar176[0x3e];
                          local_400[0x3f] = (RTCHitN)auVar176[0x3f];
                          local_300 = 0;
                          uStack_2f8 = 0;
                          uStack_2f0 = 0;
                          uStack_2e8 = 0;
                          uStack_2e0 = 0;
                          uStack_2d8 = 0;
                          uStack_2d0 = 0;
                          uStack_2c8 = 0;
                          local_2c0 = local_480._0_8_;
                          uStack_2b8 = local_480._8_8_;
                          uStack_2b0 = local_480._16_8_;
                          uStack_2a8 = local_480._24_8_;
                          uStack_2a0 = local_480._32_8_;
                          uStack_298 = local_480._40_8_;
                          uStack_290 = local_480._48_8_;
                          uStack_288 = local_480._56_8_;
                          auVar176 = vmovdqa64_avx512f(local_440);
                          local_280 = vmovdqa64_avx512f(auVar176);
                          auVar145._32_32_ = vpcmpeqd_avx2(auVar176._0_32_,auVar176._0_32_);
                          local_ac8[3] = auVar145._32_32_;
                          local_ac8[2] = auVar145._32_32_;
                          local_ac8[1] = auVar145._32_32_;
                          *local_ac8 = auVar145._32_32_;
                          local_240 = vbroadcastss_avx512f(ZEXT416(pRVar5->instID[0]));
                          local_200 = vbroadcastss_avx512f(ZEXT416(pRVar5->instPrimID[0]));
                          *(float *)(ray + k * 4 + 0x200) = fVar250;
                          local_8c0 = local_4c0;
                          local_b10.valid = (int *)local_8c0;
                          local_b10.geometryUserPtr = pGVar3->userPtr;
                          local_b10.context = context->user;
                          local_b10.hit = local_400;
                          local_b10.N = 0x10;
                          local_b10.ray = (RTCRayN *)ray;
                          if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar3->intersectionFilterN)(&local_b10);
                            auVar269 = ZEXT3264(local_aa0);
                            auVar263._8_4_ = 0x7fffffff;
                            auVar263._0_8_ = 0x7fffffff7fffffff;
                            auVar263._12_4_ = 0x7fffffff;
                          }
                          auVar218 = vmovdqa64_avx512f(local_8c0);
                          uVar23 = vptestmd_avx512f(auVar218,auVar218);
                          if ((short)uVar23 == 0) {
LAB_01b9117c:
                            *(float *)(ray + k * 4 + 0x200) = fVar261;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var4)(&local_b10);
                              auVar269 = ZEXT3264(local_aa0);
                              auVar263._8_4_ = 0x7fffffff;
                              auVar263._0_8_ = 0x7fffffff7fffffff;
                              auVar263._12_4_ = 0x7fffffff;
                            }
                            auVar218 = vmovdqa64_avx512f(local_8c0);
                            uVar81 = vptestmd_avx512f(auVar218,auVar218);
                            if ((short)uVar81 == 0) goto LAB_01b9117c;
                            iVar52 = *(int *)(local_b10.hit + 4);
                            iVar53 = *(int *)(local_b10.hit + 8);
                            iVar54 = *(int *)(local_b10.hit + 0xc);
                            iVar55 = *(int *)(local_b10.hit + 0x10);
                            iVar56 = *(int *)(local_b10.hit + 0x14);
                            iVar57 = *(int *)(local_b10.hit + 0x18);
                            iVar58 = *(int *)(local_b10.hit + 0x1c);
                            iVar59 = *(int *)(local_b10.hit + 0x20);
                            iVar60 = *(int *)(local_b10.hit + 0x24);
                            iVar61 = *(int *)(local_b10.hit + 0x28);
                            iVar62 = *(int *)(local_b10.hit + 0x2c);
                            iVar63 = *(int *)(local_b10.hit + 0x30);
                            iVar64 = *(int *)(local_b10.hit + 0x34);
                            iVar65 = *(int *)(local_b10.hit + 0x38);
                            iVar66 = *(int *)(local_b10.hit + 0x3c);
                            bVar71 = (byte)uVar81;
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar81 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar81 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar81 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar81 >> 6) & 1);
                            bVar12 = (bool)((byte)(uVar81 >> 7) & 1);
                            bVar70 = (byte)(uVar81 >> 8);
                            bVar13 = (bool)((byte)(uVar81 >> 9) & 1);
                            bVar14 = (bool)((byte)(uVar81 >> 10) & 1);
                            bVar15 = (bool)((byte)(uVar81 >> 0xb) & 1);
                            bVar16 = (bool)((byte)(uVar81 >> 0xc) & 1);
                            bVar17 = (bool)((byte)(uVar81 >> 0xd) & 1);
                            bVar18 = (bool)((byte)(uVar81 >> 0xe) & 1);
                            bVar19 = SUB81(uVar81 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x300) =
                                 (uint)(bVar71 & 1) * *(int *)local_b10.hit |
                                 (uint)!(bool)(bVar71 & 1) * *(int *)(local_b10.ray + 0x300);
                            *(uint *)(local_b10.ray + 0x304) =
                                 (uint)bVar80 * iVar52 |
                                 (uint)!bVar80 * *(int *)(local_b10.ray + 0x304);
                            *(uint *)(local_b10.ray + 0x308) =
                                 (uint)bVar7 * iVar53 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x308);
                            *(uint *)(local_b10.ray + 0x30c) =
                                 (uint)bVar8 * iVar54 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x30c);
                            *(uint *)(local_b10.ray + 0x310) =
                                 (uint)bVar9 * iVar55 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x310);
                            *(uint *)(local_b10.ray + 0x314) =
                                 (uint)bVar10 * iVar56 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x314);
                            *(uint *)(local_b10.ray + 0x318) =
                                 (uint)bVar11 * iVar57 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x318);
                            *(uint *)(local_b10.ray + 0x31c) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x31c);
                            *(uint *)(local_b10.ray + 800) =
                                 (uint)(bVar70 & 1) * iVar59 |
                                 (uint)!(bool)(bVar70 & 1) * *(int *)(local_b10.ray + 800);
                            *(uint *)(local_b10.ray + 0x324) =
                                 (uint)bVar13 * iVar60 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x324);
                            *(uint *)(local_b10.ray + 0x328) =
                                 (uint)bVar14 * iVar61 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x328);
                            *(uint *)(local_b10.ray + 0x32c) =
                                 (uint)bVar15 * iVar62 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x32c);
                            *(uint *)(local_b10.ray + 0x330) =
                                 (uint)bVar16 * iVar63 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x330);
                            *(uint *)(local_b10.ray + 0x334) =
                                 (uint)bVar17 * iVar64 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x334);
                            *(uint *)(local_b10.ray + 0x338) =
                                 (uint)bVar18 * iVar65 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x338);
                            *(uint *)(local_b10.ray + 0x33c) =
                                 (uint)bVar19 * iVar66 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x33c);
                            iVar52 = *(int *)(local_b10.hit + 0x44);
                            iVar53 = *(int *)(local_b10.hit + 0x48);
                            iVar54 = *(int *)(local_b10.hit + 0x4c);
                            iVar55 = *(int *)(local_b10.hit + 0x50);
                            iVar56 = *(int *)(local_b10.hit + 0x54);
                            iVar57 = *(int *)(local_b10.hit + 0x58);
                            iVar58 = *(int *)(local_b10.hit + 0x5c);
                            iVar59 = *(int *)(local_b10.hit + 0x60);
                            iVar60 = *(int *)(local_b10.hit + 100);
                            iVar61 = *(int *)(local_b10.hit + 0x68);
                            iVar62 = *(int *)(local_b10.hit + 0x6c);
                            iVar63 = *(int *)(local_b10.hit + 0x70);
                            iVar64 = *(int *)(local_b10.hit + 0x74);
                            iVar65 = *(int *)(local_b10.hit + 0x78);
                            iVar66 = *(int *)(local_b10.hit + 0x7c);
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar81 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar81 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar81 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar81 >> 6) & 1);
                            bVar12 = (bool)((byte)(uVar81 >> 7) & 1);
                            bVar13 = (bool)((byte)(uVar81 >> 9) & 1);
                            bVar14 = (bool)((byte)(uVar81 >> 10) & 1);
                            bVar15 = (bool)((byte)(uVar81 >> 0xb) & 1);
                            bVar16 = (bool)((byte)(uVar81 >> 0xc) & 1);
                            bVar17 = (bool)((byte)(uVar81 >> 0xd) & 1);
                            bVar18 = (bool)((byte)(uVar81 >> 0xe) & 1);
                            bVar19 = SUB81(uVar81 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x340) =
                                 (uint)(bVar71 & 1) * *(int *)(local_b10.hit + 0x40) |
                                 (uint)!(bool)(bVar71 & 1) * *(int *)(local_b10.ray + 0x340);
                            *(uint *)(local_b10.ray + 0x344) =
                                 (uint)bVar80 * iVar52 |
                                 (uint)!bVar80 * *(int *)(local_b10.ray + 0x344);
                            *(uint *)(local_b10.ray + 0x348) =
                                 (uint)bVar7 * iVar53 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x348);
                            *(uint *)(local_b10.ray + 0x34c) =
                                 (uint)bVar8 * iVar54 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x34c);
                            *(uint *)(local_b10.ray + 0x350) =
                                 (uint)bVar9 * iVar55 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x350);
                            *(uint *)(local_b10.ray + 0x354) =
                                 (uint)bVar10 * iVar56 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x354);
                            *(uint *)(local_b10.ray + 0x358) =
                                 (uint)bVar11 * iVar57 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x358);
                            *(uint *)(local_b10.ray + 0x35c) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x35c);
                            *(uint *)(local_b10.ray + 0x360) =
                                 (uint)(bVar70 & 1) * iVar59 |
                                 (uint)!(bool)(bVar70 & 1) * *(int *)(local_b10.ray + 0x360);
                            *(uint *)(local_b10.ray + 0x364) =
                                 (uint)bVar13 * iVar60 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x364);
                            *(uint *)(local_b10.ray + 0x368) =
                                 (uint)bVar14 * iVar61 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x368);
                            *(uint *)(local_b10.ray + 0x36c) =
                                 (uint)bVar15 * iVar62 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x36c);
                            *(uint *)(local_b10.ray + 0x370) =
                                 (uint)bVar16 * iVar63 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x370);
                            *(uint *)(local_b10.ray + 0x374) =
                                 (uint)bVar17 * iVar64 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x374);
                            *(uint *)(local_b10.ray + 0x378) =
                                 (uint)bVar18 * iVar65 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x378);
                            *(uint *)(local_b10.ray + 0x37c) =
                                 (uint)bVar19 * iVar66 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x37c);
                            iVar52 = *(int *)(local_b10.hit + 0x84);
                            iVar53 = *(int *)(local_b10.hit + 0x88);
                            iVar54 = *(int *)(local_b10.hit + 0x8c);
                            iVar55 = *(int *)(local_b10.hit + 0x90);
                            iVar56 = *(int *)(local_b10.hit + 0x94);
                            iVar57 = *(int *)(local_b10.hit + 0x98);
                            iVar58 = *(int *)(local_b10.hit + 0x9c);
                            iVar59 = *(int *)(local_b10.hit + 0xa0);
                            iVar60 = *(int *)(local_b10.hit + 0xa4);
                            iVar61 = *(int *)(local_b10.hit + 0xa8);
                            iVar62 = *(int *)(local_b10.hit + 0xac);
                            iVar63 = *(int *)(local_b10.hit + 0xb0);
                            iVar64 = *(int *)(local_b10.hit + 0xb4);
                            iVar65 = *(int *)(local_b10.hit + 0xb8);
                            iVar66 = *(int *)(local_b10.hit + 0xbc);
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar81 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar81 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar81 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar81 >> 6) & 1);
                            bVar12 = (bool)((byte)(uVar81 >> 7) & 1);
                            bVar13 = (bool)((byte)(uVar81 >> 9) & 1);
                            bVar14 = (bool)((byte)(uVar81 >> 10) & 1);
                            bVar15 = (bool)((byte)(uVar81 >> 0xb) & 1);
                            bVar16 = (bool)((byte)(uVar81 >> 0xc) & 1);
                            bVar17 = (bool)((byte)(uVar81 >> 0xd) & 1);
                            bVar18 = (bool)((byte)(uVar81 >> 0xe) & 1);
                            bVar19 = SUB81(uVar81 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x380) =
                                 (uint)(bVar71 & 1) * *(int *)(local_b10.hit + 0x80) |
                                 (uint)!(bool)(bVar71 & 1) * *(int *)(local_b10.ray + 0x380);
                            *(uint *)(local_b10.ray + 900) =
                                 (uint)bVar80 * iVar52 |
                                 (uint)!bVar80 * *(int *)(local_b10.ray + 900);
                            *(uint *)(local_b10.ray + 0x388) =
                                 (uint)bVar7 * iVar53 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x388);
                            *(uint *)(local_b10.ray + 0x38c) =
                                 (uint)bVar8 * iVar54 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x38c);
                            *(uint *)(local_b10.ray + 0x390) =
                                 (uint)bVar9 * iVar55 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x390);
                            *(uint *)(local_b10.ray + 0x394) =
                                 (uint)bVar10 * iVar56 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x394);
                            *(uint *)(local_b10.ray + 0x398) =
                                 (uint)bVar11 * iVar57 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x398);
                            *(uint *)(local_b10.ray + 0x39c) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x39c);
                            *(uint *)(local_b10.ray + 0x3a0) =
                                 (uint)(bVar70 & 1) * iVar59 |
                                 (uint)!(bool)(bVar70 & 1) * *(int *)(local_b10.ray + 0x3a0);
                            *(uint *)(local_b10.ray + 0x3a4) =
                                 (uint)bVar13 * iVar60 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x3a4);
                            *(uint *)(local_b10.ray + 0x3a8) =
                                 (uint)bVar14 * iVar61 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x3a8);
                            *(uint *)(local_b10.ray + 0x3ac) =
                                 (uint)bVar15 * iVar62 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x3ac);
                            *(uint *)(local_b10.ray + 0x3b0) =
                                 (uint)bVar16 * iVar63 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x3b0);
                            *(uint *)(local_b10.ray + 0x3b4) =
                                 (uint)bVar17 * iVar64 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x3b4);
                            *(uint *)(local_b10.ray + 0x3b8) =
                                 (uint)bVar18 * iVar65 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x3b8);
                            *(uint *)(local_b10.ray + 0x3bc) =
                                 (uint)bVar19 * iVar66 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x3bc);
                            iVar52 = *(int *)(local_b10.hit + 0xc4);
                            iVar53 = *(int *)(local_b10.hit + 200);
                            iVar54 = *(int *)(local_b10.hit + 0xcc);
                            iVar55 = *(int *)(local_b10.hit + 0xd0);
                            iVar56 = *(int *)(local_b10.hit + 0xd4);
                            iVar57 = *(int *)(local_b10.hit + 0xd8);
                            iVar58 = *(int *)(local_b10.hit + 0xdc);
                            iVar59 = *(int *)(local_b10.hit + 0xe0);
                            iVar60 = *(int *)(local_b10.hit + 0xe4);
                            iVar61 = *(int *)(local_b10.hit + 0xe8);
                            iVar62 = *(int *)(local_b10.hit + 0xec);
                            iVar63 = *(int *)(local_b10.hit + 0xf0);
                            iVar64 = *(int *)(local_b10.hit + 0xf4);
                            iVar65 = *(int *)(local_b10.hit + 0xf8);
                            iVar66 = *(int *)(local_b10.hit + 0xfc);
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar81 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar81 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar81 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar81 >> 6) & 1);
                            bVar12 = (bool)((byte)(uVar81 >> 7) & 1);
                            bVar13 = (bool)((byte)(uVar81 >> 9) & 1);
                            bVar14 = (bool)((byte)(uVar81 >> 10) & 1);
                            bVar15 = (bool)((byte)(uVar81 >> 0xb) & 1);
                            bVar16 = (bool)((byte)(uVar81 >> 0xc) & 1);
                            bVar17 = (bool)((byte)(uVar81 >> 0xd) & 1);
                            bVar18 = (bool)((byte)(uVar81 >> 0xe) & 1);
                            bVar19 = SUB81(uVar81 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x3c0) =
                                 (uint)(bVar71 & 1) * *(int *)(local_b10.hit + 0xc0) |
                                 (uint)!(bool)(bVar71 & 1) * *(int *)(local_b10.ray + 0x3c0);
                            *(uint *)(local_b10.ray + 0x3c4) =
                                 (uint)bVar80 * iVar52 |
                                 (uint)!bVar80 * *(int *)(local_b10.ray + 0x3c4);
                            *(uint *)(local_b10.ray + 0x3c8) =
                                 (uint)bVar7 * iVar53 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x3c8);
                            *(uint *)(local_b10.ray + 0x3cc) =
                                 (uint)bVar8 * iVar54 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x3cc);
                            *(uint *)(local_b10.ray + 0x3d0) =
                                 (uint)bVar9 * iVar55 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x3d0);
                            *(uint *)(local_b10.ray + 0x3d4) =
                                 (uint)bVar10 * iVar56 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x3d4);
                            *(uint *)(local_b10.ray + 0x3d8) =
                                 (uint)bVar11 * iVar57 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x3d8);
                            *(uint *)(local_b10.ray + 0x3dc) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x3dc);
                            *(uint *)(local_b10.ray + 0x3e0) =
                                 (uint)(bVar70 & 1) * iVar59 |
                                 (uint)!(bool)(bVar70 & 1) * *(int *)(local_b10.ray + 0x3e0);
                            *(uint *)(local_b10.ray + 0x3e4) =
                                 (uint)bVar13 * iVar60 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x3e4);
                            *(uint *)(local_b10.ray + 1000) =
                                 (uint)bVar14 * iVar61 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 1000);
                            *(uint *)(local_b10.ray + 0x3ec) =
                                 (uint)bVar15 * iVar62 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x3ec);
                            *(uint *)(local_b10.ray + 0x3f0) =
                                 (uint)bVar16 * iVar63 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x3f0);
                            *(uint *)(local_b10.ray + 0x3f4) =
                                 (uint)bVar17 * iVar64 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x3f4);
                            *(uint *)(local_b10.ray + 0x3f8) =
                                 (uint)bVar18 * iVar65 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x3f8);
                            *(uint *)(local_b10.ray + 0x3fc) =
                                 (uint)bVar19 * iVar66 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x3fc);
                            iVar52 = *(int *)(local_b10.hit + 0x104);
                            iVar53 = *(int *)(local_b10.hit + 0x108);
                            iVar54 = *(int *)(local_b10.hit + 0x10c);
                            iVar55 = *(int *)(local_b10.hit + 0x110);
                            iVar56 = *(int *)(local_b10.hit + 0x114);
                            iVar57 = *(int *)(local_b10.hit + 0x118);
                            iVar58 = *(int *)(local_b10.hit + 0x11c);
                            iVar59 = *(int *)(local_b10.hit + 0x120);
                            iVar60 = *(int *)(local_b10.hit + 0x124);
                            iVar61 = *(int *)(local_b10.hit + 0x128);
                            iVar62 = *(int *)(local_b10.hit + 300);
                            iVar63 = *(int *)(local_b10.hit + 0x130);
                            iVar64 = *(int *)(local_b10.hit + 0x134);
                            iVar65 = *(int *)(local_b10.hit + 0x138);
                            iVar66 = *(int *)(local_b10.hit + 0x13c);
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar81 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar81 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar81 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar81 >> 6) & 1);
                            bVar12 = (bool)((byte)(uVar81 >> 7) & 1);
                            bVar13 = (bool)((byte)(uVar81 >> 9) & 1);
                            bVar14 = (bool)((byte)(uVar81 >> 10) & 1);
                            bVar15 = (bool)((byte)(uVar81 >> 0xb) & 1);
                            bVar16 = (bool)((byte)(uVar81 >> 0xc) & 1);
                            bVar17 = (bool)((byte)(uVar81 >> 0xd) & 1);
                            bVar18 = (bool)((byte)(uVar81 >> 0xe) & 1);
                            bVar19 = SUB81(uVar81 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x400) =
                                 (uint)(bVar71 & 1) * *(int *)(local_b10.hit + 0x100) |
                                 (uint)!(bool)(bVar71 & 1) * *(int *)(local_b10.ray + 0x400);
                            *(uint *)(local_b10.ray + 0x404) =
                                 (uint)bVar80 * iVar52 |
                                 (uint)!bVar80 * *(int *)(local_b10.ray + 0x404);
                            *(uint *)(local_b10.ray + 0x408) =
                                 (uint)bVar7 * iVar53 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x408);
                            *(uint *)(local_b10.ray + 0x40c) =
                                 (uint)bVar8 * iVar54 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x40c);
                            *(uint *)(local_b10.ray + 0x410) =
                                 (uint)bVar9 * iVar55 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x410);
                            *(uint *)(local_b10.ray + 0x414) =
                                 (uint)bVar10 * iVar56 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x414);
                            *(uint *)(local_b10.ray + 0x418) =
                                 (uint)bVar11 * iVar57 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x418);
                            *(uint *)(local_b10.ray + 0x41c) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x41c);
                            *(uint *)(local_b10.ray + 0x420) =
                                 (uint)(bVar70 & 1) * iVar59 |
                                 (uint)!(bool)(bVar70 & 1) * *(int *)(local_b10.ray + 0x420);
                            *(uint *)(local_b10.ray + 0x424) =
                                 (uint)bVar13 * iVar60 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x424);
                            *(uint *)(local_b10.ray + 0x428) =
                                 (uint)bVar14 * iVar61 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x428);
                            *(uint *)(local_b10.ray + 0x42c) =
                                 (uint)bVar15 * iVar62 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x42c);
                            *(uint *)(local_b10.ray + 0x430) =
                                 (uint)bVar16 * iVar63 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x430);
                            *(uint *)(local_b10.ray + 0x434) =
                                 (uint)bVar17 * iVar64 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x434);
                            *(uint *)(local_b10.ray + 0x438) =
                                 (uint)bVar18 * iVar65 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x438);
                            *(uint *)(local_b10.ray + 0x43c) =
                                 (uint)bVar19 * iVar66 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x43c);
                            auVar176 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x140));
                            auVar176 = vmovdqu32_avx512f(auVar176);
                            *(undefined1 (*) [64])(local_b10.ray + 0x440) = auVar176;
                            auVar176 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x180));
                            auVar176 = vmovdqu32_avx512f(auVar176);
                            *(undefined1 (*) [64])(local_b10.ray + 0x480) = auVar176;
                            auVar262 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x1c0));
                            auVar176 = vmovdqa32_avx512f(auVar262);
                            *(undefined1 (*) [64])(local_b10.ray + 0x4c0) = auVar176;
                            auVar176 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x200));
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            auVar49._4_56_ = auVar176._8_56_;
                            auVar49._0_4_ =
                                 (uint)bVar80 * auVar176._4_4_ | (uint)!bVar80 * auVar262._4_4_;
                            auVar218._0_8_ = auVar49._0_8_ << 0x20;
                            bVar80 = (bool)((byte)(uVar81 >> 2) & 1);
                            auVar218._8_4_ =
                                 (uint)bVar80 * auVar176._8_4_ | (uint)!bVar80 * auVar262._8_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 3) & 1);
                            auVar218._12_4_ =
                                 (uint)bVar80 * auVar176._12_4_ | (uint)!bVar80 * auVar262._12_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 4) & 1);
                            auVar218._16_4_ =
                                 (uint)bVar80 * auVar176._16_4_ | (uint)!bVar80 * auVar262._16_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 5) & 1);
                            auVar218._20_4_ =
                                 (uint)bVar80 * auVar176._20_4_ | (uint)!bVar80 * auVar262._20_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 6) & 1);
                            auVar218._24_4_ =
                                 (uint)bVar80 * auVar176._24_4_ | (uint)!bVar80 * auVar262._24_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 7) & 1);
                            auVar218._28_4_ =
                                 (uint)bVar80 * auVar176._28_4_ | (uint)!bVar80 * auVar262._28_4_;
                            auVar218._32_4_ =
                                 (uint)(bVar70 & 1) * auVar176._32_4_ |
                                 (uint)!(bool)(bVar70 & 1) * auVar262._32_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 9) & 1);
                            auVar218._36_4_ =
                                 (uint)bVar80 * auVar176._36_4_ | (uint)!bVar80 * auVar262._36_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 10) & 1);
                            auVar218._40_4_ =
                                 (uint)bVar80 * auVar176._40_4_ | (uint)!bVar80 * auVar262._40_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 0xb) & 1);
                            auVar218._44_4_ =
                                 (uint)bVar80 * auVar176._44_4_ | (uint)!bVar80 * auVar262._44_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 0xc) & 1);
                            auVar218._48_4_ =
                                 (uint)bVar80 * auVar176._48_4_ | (uint)!bVar80 * auVar262._48_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 0xd) & 1);
                            auVar218._52_4_ =
                                 (uint)bVar80 * auVar176._52_4_ | (uint)!bVar80 * auVar262._52_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 0xe) & 1);
                            auVar218._56_4_ =
                                 (uint)bVar80 * auVar176._56_4_ | (uint)!bVar80 * auVar262._56_4_;
                            bVar80 = SUB81(uVar81 >> 0xf,0);
                            auVar218._60_4_ =
                                 (uint)bVar80 * auVar176._60_4_ | (uint)!bVar80 * auVar262._60_4_;
                            auVar176 = vmovdqa32_avx512f(auVar176);
                            *(undefined1 (*) [64])(local_b10.ray + 0x500) = auVar176;
                          }
                          auVar234 = ZEXT464((uint)fVar261);
                        }
                      }
                    }
                  }
                }
                auVar145._32_32_ = auVar218._32_32_;
                bVar80 = lVar79 != 0;
                lVar79 = lVar79 + -1;
              } while ((!bVar6) && (bVar80));
              auVar67._4_4_ = fStack_85c;
              auVar67._0_4_ = local_860;
              auVar67._8_4_ = fStack_858;
              auVar67._12_4_ = fStack_854;
              auVar67._16_4_ = fStack_850;
              auVar67._20_4_ = fStack_84c;
              auVar67._24_4_ = fStack_848;
              auVar67._28_4_ = fStack_844;
              uVar219 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar37._4_4_ = uVar219;
              auVar37._0_4_ = uVar219;
              auVar37._8_4_ = uVar219;
              auVar37._12_4_ = uVar219;
              auVar37._16_4_ = uVar219;
              auVar37._20_4_ = uVar219;
              auVar37._24_4_ = uVar219;
              auVar37._28_4_ = uVar219;
              uVar23 = vcmpps_avx512vl(auVar67,auVar37,2);
              bVar75 = ~('\x01' << ((byte)iVar25 & 0x1f)) & bVar75 & (byte)uVar23;
            } while (bVar75 != 0);
          }
          auVar172._0_4_ = (float)local_880._0_4_ + (float)local_900._0_4_;
          auVar172._4_4_ = (float)local_880._4_4_ + (float)local_900._4_4_;
          auVar172._8_4_ = fStack_878 + fStack_8f8;
          auVar172._12_4_ = fStack_874 + fStack_8f4;
          auVar172._16_4_ = fStack_870 + fStack_8f0;
          auVar172._20_4_ = fStack_86c + fStack_8ec;
          auVar172._24_4_ = fStack_868 + fStack_8e8;
          auVar172._28_4_ = fStack_864 + fStack_8e4;
          uVar219 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar38._4_4_ = uVar219;
          auVar38._0_4_ = uVar219;
          auVar38._8_4_ = uVar219;
          auVar38._12_4_ = uVar219;
          auVar38._16_4_ = uVar219;
          auVar38._20_4_ = uVar219;
          auVar38._24_4_ = uVar219;
          auVar38._28_4_ = uVar219;
          uVar23 = vcmpps_avx512vl(auVar172,auVar38,2);
          bVar76 = (byte)uVar22 | ~bVar76;
          bVar74 = (byte)uVar24 & bVar74 & (byte)uVar23;
          auVar173._8_4_ = 2;
          auVar173._0_8_ = 0x200000002;
          auVar173._12_4_ = 2;
          auVar173._16_4_ = 2;
          auVar173._20_4_ = 2;
          auVar173._24_4_ = 2;
          auVar173._28_4_ = 2;
          auVar39._8_4_ = 3;
          auVar39._0_8_ = 0x300000003;
          auVar39._12_4_ = 3;
          auVar39._16_4_ = 3;
          auVar39._20_4_ = 3;
          auVar39._24_4_ = 3;
          auVar39._28_4_ = 3;
          auVar107 = vpblendmd_avx512vl(auVar173,auVar39);
          local_880._0_4_ = (uint)(bVar76 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar76 & 1) * 2;
          bVar6 = (bool)(bVar76 >> 1 & 1);
          local_880._4_4_ = (uint)bVar6 * auVar107._4_4_ | (uint)!bVar6 * 2;
          bVar6 = (bool)(bVar76 >> 2 & 1);
          fStack_878 = (float)((uint)bVar6 * auVar107._8_4_ | (uint)!bVar6 * 2);
          bVar6 = (bool)(bVar76 >> 3 & 1);
          fStack_874 = (float)((uint)bVar6 * auVar107._12_4_ | (uint)!bVar6 * 2);
          bVar6 = (bool)(bVar76 >> 4 & 1);
          fStack_870 = (float)((uint)bVar6 * auVar107._16_4_ | (uint)!bVar6 * 2);
          bVar6 = (bool)(bVar76 >> 5 & 1);
          fStack_86c = (float)((uint)bVar6 * auVar107._20_4_ | (uint)!bVar6 * 2);
          bVar6 = (bool)(bVar76 >> 6 & 1);
          fStack_868 = (float)((uint)bVar6 * auVar107._24_4_ | (uint)!bVar6 * 2);
          fStack_864 = (float)((uint)(bVar76 >> 7) * auVar107._28_4_ |
                              (uint)!(bool)(bVar76 >> 7) * 2);
          auVar145._0_32_ = _local_880;
          uVar22 = vpcmpd_avx512vl(_local_880,local_7e0,2);
          bVar76 = (byte)uVar22 & bVar74;
          if (bVar76 != 0) {
            auVar89 = vminps_avx(local_940._0_16_,local_980._0_16_);
            auVar88 = vmaxps_avx(local_940._0_16_,local_980._0_16_);
            auVar86 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar90 = vminps_avx(auVar89,auVar86);
            auVar89 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar86 = vmaxps_avx(auVar88,auVar89);
            auVar88 = vandps_avx(auVar263,auVar90);
            auVar89 = vandps_avx(auVar263,auVar86);
            auVar88 = vmaxps_avx(auVar88,auVar89);
            auVar89 = vmovshdup_avx(auVar88);
            auVar89 = vmaxss_avx(auVar89,auVar88);
            auVar88 = vshufpd_avx(auVar88,auVar88,1);
            auVar88 = vmaxss_avx(auVar88,auVar89);
            fVar240 = auVar88._0_4_ * 1.9073486e-06;
            local_a10 = vshufps_avx(auVar86,auVar86,0xff);
            _local_920 = _local_7a0;
            local_860 = (float)local_7a0._0_4_ + (float)local_900._0_4_;
            fStack_85c = (float)local_7a0._4_4_ + (float)local_900._4_4_;
            fStack_858 = fStack_798 + fStack_8f8;
            fStack_854 = fStack_794 + fStack_8f4;
            fStack_850 = fStack_790 + fStack_8f0;
            fStack_84c = fStack_78c + fStack_8ec;
            fStack_848 = fStack_788 + fStack_8e8;
            fStack_844 = fStack_784 + fStack_8e4;
            do {
              auVar174._8_4_ = 0x7f800000;
              auVar174._0_8_ = 0x7f8000007f800000;
              auVar174._12_4_ = 0x7f800000;
              auVar174._16_4_ = 0x7f800000;
              auVar174._20_4_ = 0x7f800000;
              auVar174._24_4_ = 0x7f800000;
              auVar174._28_4_ = 0x7f800000;
              auVar107 = vblendmps_avx512vl(auVar174,_local_920);
              auVar135._0_4_ =
                   (uint)(bVar76 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar76 & 1) * 0x7f800000;
              bVar6 = (bool)(bVar76 >> 1 & 1);
              auVar135._4_4_ = (uint)bVar6 * auVar107._4_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar76 >> 2 & 1);
              auVar135._8_4_ = (uint)bVar6 * auVar107._8_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar76 >> 3 & 1);
              auVar135._12_4_ = (uint)bVar6 * auVar107._12_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar76 >> 4 & 1);
              auVar135._16_4_ = (uint)bVar6 * auVar107._16_4_ | (uint)!bVar6 * 0x7f800000;
              bVar6 = (bool)(bVar76 >> 5 & 1);
              auVar135._20_4_ = (uint)bVar6 * auVar107._20_4_ | (uint)!bVar6 * 0x7f800000;
              auVar135._24_4_ =
                   (uint)(bVar76 >> 6) * auVar107._24_4_ | (uint)!(bool)(bVar76 >> 6) * 0x7f800000;
              auVar135._28_4_ = 0x7f800000;
              auVar145._0_32_ = auVar135;
              auVar107 = vshufps_avx(auVar135,auVar135,0xb1);
              auVar107 = vminps_avx(auVar135,auVar107);
              auVar96 = vshufpd_avx(auVar107,auVar107,5);
              auVar107 = vminps_avx(auVar107,auVar96);
              auVar96 = vpermpd_avx2(auVar107,0x4e);
              auVar107 = vminps_avx(auVar107,auVar96);
              uVar22 = vcmpps_avx512vl(auVar135,auVar107,0);
              bVar71 = (byte)uVar22 & bVar76;
              bVar75 = bVar76;
              if (bVar71 != 0) {
                bVar75 = bVar71;
              }
              iVar25 = 0;
              for (uVar82 = (uint)bVar75; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
                iVar25 = iVar25 + 1;
              }
              fVar249 = *(float *)(local_840 + (uint)(iVar25 << 2));
              fVar250 = *(float *)(local_780 + (uint)(iVar25 << 2));
              fVar252 = auVar85._0_4_;
              if ((float)local_a30._0_4_ < 0.0) {
                fVar252 = sqrtf((float)local_a30._0_4_);
              }
              lVar79 = 4;
              do {
                auVar161._4_4_ = fVar250;
                auVar161._0_4_ = fVar250;
                auVar161._8_4_ = fVar250;
                auVar161._12_4_ = fVar250;
                auVar89 = vfmadd132ps_fma(auVar161,ZEXT816(0) << 0x40,local_a20);
                fVar261 = 1.0 - fVar249;
                auVar208._0_4_ = local_980._0_4_ * fVar249;
                auVar208._4_4_ = local_980._4_4_ * fVar249;
                auVar208._8_4_ = local_980._8_4_ * fVar249;
                auVar208._12_4_ = local_980._12_4_ * fVar249;
                local_9b0 = ZEXT416((uint)fVar261);
                auVar223._4_4_ = fVar261;
                auVar223._0_4_ = fVar261;
                auVar223._8_4_ = fVar261;
                auVar223._12_4_ = fVar261;
                auVar88 = vfmadd231ps_fma(auVar208,auVar223,local_940._0_16_);
                auVar231._0_4_ = local_960._0_4_ * fVar249;
                auVar231._4_4_ = local_960._4_4_ * fVar249;
                auVar231._8_4_ = local_960._8_4_ * fVar249;
                auVar231._12_4_ = local_960._12_4_ * fVar249;
                auVar86 = vfmadd231ps_fma(auVar231,auVar223,local_980._0_16_);
                auVar238._0_4_ = fVar249 * (float)local_9a0._0_4_;
                auVar238._4_4_ = fVar249 * (float)local_9a0._4_4_;
                auVar238._8_4_ = fVar249 * fStack_998;
                auVar238._12_4_ = fVar249 * fStack_994;
                auVar90 = vfmadd231ps_fma(auVar238,auVar223,local_960._0_16_);
                auVar247._0_4_ = fVar249 * auVar86._0_4_;
                auVar247._4_4_ = fVar249 * auVar86._4_4_;
                auVar247._8_4_ = fVar249 * auVar86._8_4_;
                auVar247._12_4_ = fVar249 * auVar86._12_4_;
                auVar88 = vfmadd231ps_fma(auVar247,auVar223,auVar88);
                auVar209._0_4_ = fVar249 * auVar90._0_4_;
                auVar209._4_4_ = fVar249 * auVar90._4_4_;
                auVar209._8_4_ = fVar249 * auVar90._8_4_;
                auVar209._12_4_ = fVar249 * auVar90._12_4_;
                auVar86 = vfmadd231ps_fma(auVar209,auVar223,auVar86);
                auVar232._0_4_ = fVar249 * auVar86._0_4_;
                auVar232._4_4_ = fVar249 * auVar86._4_4_;
                auVar232._8_4_ = fVar249 * auVar86._8_4_;
                auVar232._12_4_ = fVar249 * auVar86._12_4_;
                auVar90 = vfmadd231ps_fma(auVar232,auVar88,auVar223);
                auVar88 = vsubps_avx(auVar86,auVar88);
                auVar30._8_4_ = 0x40400000;
                auVar30._0_8_ = 0x4040000040400000;
                auVar30._12_4_ = 0x40400000;
                auVar86 = vmulps_avx512vl(auVar88,auVar30);
                local_8e0._0_16_ = auVar90;
                auVar88 = vsubps_avx(auVar89,auVar90);
                local_a60._0_16_ = auVar88;
                auVar88 = vdpps_avx(auVar88,auVar88,0x7f);
                local_a80._0_16_ = auVar88;
                local_bc0 = ZEXT416((uint)fVar249);
                if (auVar88._0_4_ < 0.0) {
                  auVar269._0_4_ = sqrtf(auVar88._0_4_);
                  auVar269._4_60_ = extraout_var_01;
                  auVar88 = auVar269._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                }
                local_9c0 = vdpps_avx(auVar86,auVar86,0x7f);
                fVar261 = local_9c0._0_4_;
                auVar210._4_12_ = ZEXT812(0) << 0x20;
                auVar210._0_4_ = fVar261;
                auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar210);
                fVar179 = auVar89._0_4_;
                local_9d0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar210);
                auVar31._8_4_ = 0x80000000;
                auVar31._0_8_ = 0x8000000080000000;
                auVar31._12_4_ = 0x80000000;
                auVar90 = vxorps_avx512vl(local_9c0,auVar31);
                auVar89 = vfnmadd213ss_fma(local_9d0,local_9c0,ZEXT416(0x40000000));
                uVar82 = auVar88._0_4_;
                if (fVar261 < auVar90._0_4_) {
                  auVar177._0_4_ = sqrtf(fVar261);
                  auVar177._4_60_ = extraout_var_02;
                  auVar88 = ZEXT416(uVar82);
                  auVar90 = auVar177._0_16_;
                }
                else {
                  auVar90 = vsqrtss_avx512f(local_9c0,local_9c0);
                }
                fVar261 = fVar179 * 1.5 + fVar261 * -0.5 * fVar179 * fVar179 * fVar179;
                auVar162._0_4_ = auVar86._0_4_ * fVar261;
                auVar162._4_4_ = auVar86._4_4_ * fVar261;
                auVar162._8_4_ = auVar86._8_4_ * fVar261;
                auVar162._12_4_ = auVar86._12_4_ * fVar261;
                auVar21 = vdpps_avx(local_a60._0_16_,auVar162,0x7f);
                fVar255 = auVar88._0_4_;
                fVar179 = auVar21._0_4_;
                auVar163._0_4_ = fVar179 * fVar179;
                auVar163._4_4_ = auVar21._4_4_ * auVar21._4_4_;
                auVar163._8_4_ = auVar21._8_4_ * auVar21._8_4_;
                auVar163._12_4_ = auVar21._12_4_ * auVar21._12_4_;
                auVar91 = vsubps_avx512vl(local_a80._0_16_,auVar163);
                fVar254 = auVar91._0_4_;
                auVar188._4_12_ = ZEXT812(0) << 0x20;
                auVar188._0_4_ = fVar254;
                auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar188);
                auVar92 = vmulss_avx512f(auVar87,ZEXT416(0x3fc00000));
                auVar84 = vmulss_avx512f(auVar91,ZEXT416(0xbf000000));
                if (fVar254 < 0.0) {
                  local_9f0 = fVar261;
                  fStack_9ec = fVar261;
                  fStack_9e8 = fVar261;
                  fStack_9e4 = fVar261;
                  local_9e0 = auVar87;
                  fVar254 = sqrtf(fVar254);
                  auVar84 = ZEXT416(auVar84._0_4_);
                  auVar92 = ZEXT416(auVar92._0_4_);
                  auVar90 = ZEXT416(auVar90._0_4_);
                  auVar88 = ZEXT416(uVar82);
                  auVar87 = local_9e0;
                  fVar261 = local_9f0;
                  fVar256 = fStack_9ec;
                  fVar251 = fStack_9e8;
                  fVar253 = fStack_9e4;
                }
                else {
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                  fVar254 = auVar91._0_4_;
                  fVar256 = fVar261;
                  fVar251 = fVar261;
                  fVar253 = fVar261;
                }
                auVar260._8_4_ = 0x7fffffff;
                auVar260._0_8_ = 0x7fffffff7fffffff;
                auVar260._12_4_ = 0x7fffffff;
                auVar142._32_32_ = auVar145._32_32_;
                auVar142._0_32_ = local_aa0;
                auVar269 = ZEXT3264(local_aa0);
                auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_bc0,local_9b0);
                fVar178 = auVar91._0_4_ * 6.0;
                fVar20 = fVar249 * 6.0;
                auVar211._0_4_ = fVar20 * (float)local_9a0._0_4_;
                auVar211._4_4_ = fVar20 * (float)local_9a0._4_4_;
                auVar211._8_4_ = fVar20 * fStack_998;
                auVar211._12_4_ = fVar20 * fStack_994;
                auVar189._4_4_ = fVar178;
                auVar189._0_4_ = fVar178;
                auVar189._8_4_ = fVar178;
                auVar189._12_4_ = fVar178;
                auVar91 = vfmadd132ps_fma(auVar189,auVar211,local_960._0_16_);
                auVar94 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9b0,local_bc0);
                fVar178 = auVar94._0_4_ * 6.0;
                auVar212._4_4_ = fVar178;
                auVar212._0_4_ = fVar178;
                auVar212._8_4_ = fVar178;
                auVar212._12_4_ = fVar178;
                auVar91 = vfmadd132ps_fma(auVar212,auVar91,local_980._0_16_);
                fVar178 = local_9b0._0_4_ * 6.0;
                auVar190._4_4_ = fVar178;
                auVar190._0_4_ = fVar178;
                auVar190._8_4_ = fVar178;
                auVar190._12_4_ = fVar178;
                auVar91 = vfmadd132ps_fma(auVar190,auVar91,local_940._0_16_);
                auVar213._0_4_ = auVar91._0_4_ * (float)local_9c0._0_4_;
                auVar213._4_4_ = auVar91._4_4_ * (float)local_9c0._0_4_;
                auVar213._8_4_ = auVar91._8_4_ * (float)local_9c0._0_4_;
                auVar213._12_4_ = auVar91._12_4_ * (float)local_9c0._0_4_;
                auVar91 = vdpps_avx(auVar86,auVar91,0x7f);
                fVar178 = auVar91._0_4_;
                auVar191._0_4_ = auVar86._0_4_ * fVar178;
                auVar191._4_4_ = auVar86._4_4_ * fVar178;
                auVar191._8_4_ = auVar86._8_4_ * fVar178;
                auVar191._12_4_ = auVar86._12_4_ * fVar178;
                auVar91 = vsubps_avx(auVar213,auVar191);
                fVar178 = auVar89._0_4_ * (float)local_9d0._0_4_;
                auVar32._8_4_ = 0x80000000;
                auVar32._0_8_ = 0x8000000080000000;
                auVar32._12_4_ = 0x80000000;
                auVar145._16_48_ = auVar142._16_48_;
                auVar93 = vxorps_avx512vl(auVar86,auVar32);
                auVar233._0_4_ = fVar261 * auVar91._0_4_ * fVar178;
                auVar233._4_4_ = fVar256 * auVar91._4_4_ * fVar178;
                auVar233._8_4_ = fVar251 * auVar91._8_4_ * fVar178;
                auVar233._12_4_ = fVar253 * auVar91._12_4_ * fVar178;
                auVar89 = vdpps_avx(auVar93,auVar162,0x7f);
                auVar91 = vmaxss_avx(ZEXT416((uint)fVar240),
                                     ZEXT416((uint)(fVar250 * fVar252 * 1.9073486e-06)));
                auVar94 = vdivss_avx512f(ZEXT416((uint)fVar240),auVar90);
                auVar90 = vdpps_avx(local_a60._0_16_,auVar233,0x7f);
                auVar88 = vfmadd213ss_fma(auVar88,ZEXT416((uint)fVar240),auVar91);
                auVar94 = vfmadd213ss_fma(ZEXT416((uint)(fVar255 + 1.0)),auVar94,auVar88);
                auVar88 = vdpps_avx(local_a20,auVar162,0x7f);
                fVar261 = auVar89._0_4_ + auVar90._0_4_;
                auVar89 = vdpps_avx(local_a60._0_16_,auVar93,0x7f);
                auVar84 = vmulss_avx512f(auVar84,auVar87);
                auVar87 = vmulss_avx512f(auVar87,auVar87);
                auVar90 = vdpps_avx(local_a60._0_16_,local_a20,0x7f);
                auVar145._0_16_ =
                     vaddss_avx512f(auVar92,ZEXT416((uint)(auVar84._0_4_ * auVar87._0_4_)));
                auVar87 = vfnmadd231ss_fma(auVar89,auVar21,ZEXT416((uint)fVar261));
                auVar92 = vfnmadd231ss_fma(auVar90,auVar21,auVar88);
                auVar89 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar254 = fVar254 - auVar89._0_4_;
                auVar89 = vshufps_avx(auVar86,auVar86,0xff);
                auVar90 = vfmsub213ss_fma(auVar87,auVar145._0_16_,auVar89);
                fVar255 = auVar92._0_4_ * auVar145._0_4_;
                auVar87 = vfmsub231ss_fma(ZEXT416((uint)(auVar88._0_4_ * auVar90._0_4_)),
                                          ZEXT416((uint)fVar261),ZEXT416((uint)fVar255));
                fVar256 = auVar87._0_4_;
                fVar261 = fVar254 * (fVar261 / fVar256) - fVar179 * (auVar90._0_4_ / fVar256);
                auVar234 = ZEXT464((uint)fVar261);
                fVar249 = fVar249 - (fVar179 * (fVar255 / fVar256) -
                                    fVar254 * (auVar88._0_4_ / fVar256));
                fVar250 = fVar250 - fVar261;
                auVar88 = vandps_avx(auVar21,auVar260);
                if (auVar94._0_4_ <= auVar88._0_4_) {
LAB_01b919f9:
                  bVar6 = false;
                }
                else {
                  auVar90 = vfmadd231ss_fma(ZEXT416((uint)(auVar94._0_4_ + auVar91._0_4_)),local_a10
                                            ,ZEXT416(0x36000000));
                  auVar88 = vandps_avx(auVar260,ZEXT416((uint)fVar254));
                  if (auVar90._0_4_ <= auVar88._0_4_) goto LAB_01b919f9;
                  fVar250 = fVar250 + (float)local_a00._0_4_;
                  bVar6 = true;
                  if (fVar153 <= fVar250) {
                    fVar261 = *(float *)(ray + k * 4 + 0x200);
                    auVar234 = ZEXT464((uint)fVar261);
                    if (((fVar250 <= fVar261) && (0.0 <= fVar249)) && (fVar249 <= 1.0)) {
                      auVar144._16_48_ = auVar145._16_48_;
                      auVar144._0_16_ = ZEXT816(0) << 0x20;
                      auVar143._4_60_ = auVar144._4_60_;
                      auVar143._0_4_ = local_a80._0_4_;
                      auVar88 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar143._0_16_);
                      fVar179 = auVar88._0_4_;
                      auVar145._0_16_ = vmulss_avx512f(local_a80._0_16_,ZEXT416(0xbf000000));
                      pGVar3 = (context->scene->geometries).items[uVar78].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                        fVar179 = fVar179 * 1.5 + auVar145._0_4_ * fVar179 * fVar179 * fVar179;
                        auVar192._0_4_ = local_a60._0_4_ * fVar179;
                        auVar192._4_4_ = local_a60._4_4_ * fVar179;
                        auVar192._8_4_ = local_a60._8_4_ * fVar179;
                        auVar192._12_4_ = local_a60._12_4_ * fVar179;
                        auVar90 = vfmadd213ps_fma(auVar89,auVar192,auVar86);
                        auVar88 = vshufps_avx(auVar192,auVar192,0xc9);
                        auVar89 = vshufps_avx(auVar86,auVar86,0xc9);
                        auVar193._0_4_ = auVar192._0_4_ * auVar89._0_4_;
                        auVar193._4_4_ = auVar192._4_4_ * auVar89._4_4_;
                        auVar193._8_4_ = auVar192._8_4_ * auVar89._8_4_;
                        auVar193._12_4_ = auVar192._12_4_ * auVar89._12_4_;
                        auVar86 = vfmsub231ps_fma(auVar193,auVar86,auVar88);
                        auVar88 = vshufps_avx(auVar86,auVar86,0xc9);
                        auVar89 = vshufps_avx(auVar90,auVar90,0xc9);
                        auVar86 = vshufps_avx(auVar86,auVar86,0xd2);
                        auVar164._0_4_ = auVar90._0_4_ * auVar86._0_4_;
                        auVar164._4_4_ = auVar90._4_4_ * auVar86._4_4_;
                        auVar164._8_4_ = auVar90._8_4_ * auVar86._8_4_;
                        auVar164._12_4_ = auVar90._12_4_ * auVar86._12_4_;
                        auVar88 = vfmsub231ps_fma(auVar164,auVar88,auVar89);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x200) = fVar250;
                          uVar219 = vextractps_avx(auVar88,1);
                          *(undefined4 *)(ray + k * 4 + 0x300) = uVar219;
                          uVar219 = vextractps_avx(auVar88,2);
                          *(undefined4 *)(ray + k * 4 + 0x340) = uVar219;
                          *(int *)(ray + k * 4 + 0x380) = auVar88._0_4_;
                          *(float *)(ray + k * 4 + 0x3c0) = fVar249;
                          *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                          *(uint *)(ray + k * 4 + 0x440) = uVar2;
                          *(uint *)(ray + k * 4 + 0x480) = uVar78;
                          *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                        }
                        else {
                          pRVar5 = context->user;
                          local_340 = vbroadcastss_avx512f(ZEXT416((uint)fVar249));
                          auVar176 = vbroadcastss_avx512f(ZEXT416(1));
                          auVar176 = vpermps_avx512f(auVar176,ZEXT1664(auVar88));
                          auVar262 = vbroadcastss_avx512f(ZEXT416(2));
                          local_3c0 = vpermps_avx512f(auVar262,ZEXT1664(auVar88));
                          local_380 = vbroadcastss_avx512f(auVar88);
                          local_400[0] = (RTCHitN)auVar176[0];
                          local_400[1] = (RTCHitN)auVar176[1];
                          local_400[2] = (RTCHitN)auVar176[2];
                          local_400[3] = (RTCHitN)auVar176[3];
                          local_400[4] = (RTCHitN)auVar176[4];
                          local_400[5] = (RTCHitN)auVar176[5];
                          local_400[6] = (RTCHitN)auVar176[6];
                          local_400[7] = (RTCHitN)auVar176[7];
                          local_400[8] = (RTCHitN)auVar176[8];
                          local_400[9] = (RTCHitN)auVar176[9];
                          local_400[10] = (RTCHitN)auVar176[10];
                          local_400[0xb] = (RTCHitN)auVar176[0xb];
                          local_400[0xc] = (RTCHitN)auVar176[0xc];
                          local_400[0xd] = (RTCHitN)auVar176[0xd];
                          local_400[0xe] = (RTCHitN)auVar176[0xe];
                          local_400[0xf] = (RTCHitN)auVar176[0xf];
                          local_400[0x10] = (RTCHitN)auVar176[0x10];
                          local_400[0x11] = (RTCHitN)auVar176[0x11];
                          local_400[0x12] = (RTCHitN)auVar176[0x12];
                          local_400[0x13] = (RTCHitN)auVar176[0x13];
                          local_400[0x14] = (RTCHitN)auVar176[0x14];
                          local_400[0x15] = (RTCHitN)auVar176[0x15];
                          local_400[0x16] = (RTCHitN)auVar176[0x16];
                          local_400[0x17] = (RTCHitN)auVar176[0x17];
                          local_400[0x18] = (RTCHitN)auVar176[0x18];
                          local_400[0x19] = (RTCHitN)auVar176[0x19];
                          local_400[0x1a] = (RTCHitN)auVar176[0x1a];
                          local_400[0x1b] = (RTCHitN)auVar176[0x1b];
                          local_400[0x1c] = (RTCHitN)auVar176[0x1c];
                          local_400[0x1d] = (RTCHitN)auVar176[0x1d];
                          local_400[0x1e] = (RTCHitN)auVar176[0x1e];
                          local_400[0x1f] = (RTCHitN)auVar176[0x1f];
                          local_400[0x20] = (RTCHitN)auVar176[0x20];
                          local_400[0x21] = (RTCHitN)auVar176[0x21];
                          local_400[0x22] = (RTCHitN)auVar176[0x22];
                          local_400[0x23] = (RTCHitN)auVar176[0x23];
                          local_400[0x24] = (RTCHitN)auVar176[0x24];
                          local_400[0x25] = (RTCHitN)auVar176[0x25];
                          local_400[0x26] = (RTCHitN)auVar176[0x26];
                          local_400[0x27] = (RTCHitN)auVar176[0x27];
                          local_400[0x28] = (RTCHitN)auVar176[0x28];
                          local_400[0x29] = (RTCHitN)auVar176[0x29];
                          local_400[0x2a] = (RTCHitN)auVar176[0x2a];
                          local_400[0x2b] = (RTCHitN)auVar176[0x2b];
                          local_400[0x2c] = (RTCHitN)auVar176[0x2c];
                          local_400[0x2d] = (RTCHitN)auVar176[0x2d];
                          local_400[0x2e] = (RTCHitN)auVar176[0x2e];
                          local_400[0x2f] = (RTCHitN)auVar176[0x2f];
                          local_400[0x30] = (RTCHitN)auVar176[0x30];
                          local_400[0x31] = (RTCHitN)auVar176[0x31];
                          local_400[0x32] = (RTCHitN)auVar176[0x32];
                          local_400[0x33] = (RTCHitN)auVar176[0x33];
                          local_400[0x34] = (RTCHitN)auVar176[0x34];
                          local_400[0x35] = (RTCHitN)auVar176[0x35];
                          local_400[0x36] = (RTCHitN)auVar176[0x36];
                          local_400[0x37] = (RTCHitN)auVar176[0x37];
                          local_400[0x38] = (RTCHitN)auVar176[0x38];
                          local_400[0x39] = (RTCHitN)auVar176[0x39];
                          local_400[0x3a] = (RTCHitN)auVar176[0x3a];
                          local_400[0x3b] = (RTCHitN)auVar176[0x3b];
                          local_400[0x3c] = (RTCHitN)auVar176[0x3c];
                          local_400[0x3d] = (RTCHitN)auVar176[0x3d];
                          local_400[0x3e] = (RTCHitN)auVar176[0x3e];
                          local_400[0x3f] = (RTCHitN)auVar176[0x3f];
                          local_300 = 0;
                          uStack_2f8 = 0;
                          uStack_2f0 = 0;
                          uStack_2e8 = 0;
                          uStack_2e0 = 0;
                          uStack_2d8 = 0;
                          uStack_2d0 = 0;
                          uStack_2c8 = 0;
                          local_2c0 = local_480._0_8_;
                          uStack_2b8 = local_480._8_8_;
                          uStack_2b0 = local_480._16_8_;
                          uStack_2a8 = local_480._24_8_;
                          uStack_2a0 = local_480._32_8_;
                          uStack_298 = local_480._40_8_;
                          uStack_290 = local_480._48_8_;
                          uStack_288 = local_480._56_8_;
                          auVar176 = vmovdqa64_avx512f(local_440);
                          local_280 = vmovdqa64_avx512f(auVar176);
                          auVar145._32_32_ = vpcmpeqd_avx2(auVar176._0_32_,auVar176._0_32_);
                          local_ac8[3] = auVar145._32_32_;
                          local_ac8[2] = auVar145._32_32_;
                          local_ac8[1] = auVar145._32_32_;
                          *local_ac8 = auVar145._32_32_;
                          local_240 = vbroadcastss_avx512f(ZEXT416(pRVar5->instID[0]));
                          local_200 = vbroadcastss_avx512f(ZEXT416(pRVar5->instPrimID[0]));
                          *(float *)(ray + k * 4 + 0x200) = fVar250;
                          local_8c0 = local_4c0;
                          local_b10.valid = (int *)local_8c0;
                          local_b10.geometryUserPtr = pGVar3->userPtr;
                          local_b10.context = context->user;
                          local_b10.hit = local_400;
                          local_b10.N = 0x10;
                          local_b10.ray = (RTCRayN *)ray;
                          if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar3->intersectionFilterN)(&local_b10);
                            auVar269 = ZEXT3264(local_aa0);
                          }
                          auVar145 = vmovdqa64_avx512f(local_8c0);
                          uVar22 = vptestmd_avx512f(auVar145,auVar145);
                          if ((short)uVar22 == 0) {
LAB_01b91cc6:
                            *(float *)(ray + k * 4 + 0x200) = fVar261;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var4)(&local_b10);
                              auVar269 = ZEXT3264(local_aa0);
                            }
                            auVar145 = vmovdqa64_avx512f(local_8c0);
                            uVar81 = vptestmd_avx512f(auVar145,auVar145);
                            if ((short)uVar81 == 0) goto LAB_01b91cc6;
                            iVar52 = *(int *)(local_b10.hit + 4);
                            iVar53 = *(int *)(local_b10.hit + 8);
                            iVar54 = *(int *)(local_b10.hit + 0xc);
                            iVar55 = *(int *)(local_b10.hit + 0x10);
                            iVar56 = *(int *)(local_b10.hit + 0x14);
                            iVar57 = *(int *)(local_b10.hit + 0x18);
                            iVar58 = *(int *)(local_b10.hit + 0x1c);
                            iVar59 = *(int *)(local_b10.hit + 0x20);
                            iVar60 = *(int *)(local_b10.hit + 0x24);
                            iVar61 = *(int *)(local_b10.hit + 0x28);
                            iVar62 = *(int *)(local_b10.hit + 0x2c);
                            iVar63 = *(int *)(local_b10.hit + 0x30);
                            iVar64 = *(int *)(local_b10.hit + 0x34);
                            iVar65 = *(int *)(local_b10.hit + 0x38);
                            iVar66 = *(int *)(local_b10.hit + 0x3c);
                            bVar75 = (byte)uVar81;
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar81 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar81 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar81 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar81 >> 6) & 1);
                            bVar12 = (bool)((byte)(uVar81 >> 7) & 1);
                            bVar71 = (byte)(uVar81 >> 8);
                            bVar13 = (bool)((byte)(uVar81 >> 9) & 1);
                            bVar14 = (bool)((byte)(uVar81 >> 10) & 1);
                            bVar15 = (bool)((byte)(uVar81 >> 0xb) & 1);
                            bVar16 = (bool)((byte)(uVar81 >> 0xc) & 1);
                            bVar17 = (bool)((byte)(uVar81 >> 0xd) & 1);
                            bVar18 = (bool)((byte)(uVar81 >> 0xe) & 1);
                            bVar19 = SUB81(uVar81 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x300) =
                                 (uint)(bVar75 & 1) * *(int *)local_b10.hit |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_b10.ray + 0x300);
                            *(uint *)(local_b10.ray + 0x304) =
                                 (uint)bVar80 * iVar52 |
                                 (uint)!bVar80 * *(int *)(local_b10.ray + 0x304);
                            *(uint *)(local_b10.ray + 0x308) =
                                 (uint)bVar7 * iVar53 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x308);
                            *(uint *)(local_b10.ray + 0x30c) =
                                 (uint)bVar8 * iVar54 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x30c);
                            *(uint *)(local_b10.ray + 0x310) =
                                 (uint)bVar9 * iVar55 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x310);
                            *(uint *)(local_b10.ray + 0x314) =
                                 (uint)bVar10 * iVar56 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x314);
                            *(uint *)(local_b10.ray + 0x318) =
                                 (uint)bVar11 * iVar57 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x318);
                            *(uint *)(local_b10.ray + 0x31c) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x31c);
                            *(uint *)(local_b10.ray + 800) =
                                 (uint)(bVar71 & 1) * iVar59 |
                                 (uint)!(bool)(bVar71 & 1) * *(int *)(local_b10.ray + 800);
                            *(uint *)(local_b10.ray + 0x324) =
                                 (uint)bVar13 * iVar60 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x324);
                            *(uint *)(local_b10.ray + 0x328) =
                                 (uint)bVar14 * iVar61 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x328);
                            *(uint *)(local_b10.ray + 0x32c) =
                                 (uint)bVar15 * iVar62 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x32c);
                            *(uint *)(local_b10.ray + 0x330) =
                                 (uint)bVar16 * iVar63 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x330);
                            *(uint *)(local_b10.ray + 0x334) =
                                 (uint)bVar17 * iVar64 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x334);
                            *(uint *)(local_b10.ray + 0x338) =
                                 (uint)bVar18 * iVar65 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x338);
                            *(uint *)(local_b10.ray + 0x33c) =
                                 (uint)bVar19 * iVar66 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x33c);
                            iVar52 = *(int *)(local_b10.hit + 0x44);
                            iVar53 = *(int *)(local_b10.hit + 0x48);
                            iVar54 = *(int *)(local_b10.hit + 0x4c);
                            iVar55 = *(int *)(local_b10.hit + 0x50);
                            iVar56 = *(int *)(local_b10.hit + 0x54);
                            iVar57 = *(int *)(local_b10.hit + 0x58);
                            iVar58 = *(int *)(local_b10.hit + 0x5c);
                            iVar59 = *(int *)(local_b10.hit + 0x60);
                            iVar60 = *(int *)(local_b10.hit + 100);
                            iVar61 = *(int *)(local_b10.hit + 0x68);
                            iVar62 = *(int *)(local_b10.hit + 0x6c);
                            iVar63 = *(int *)(local_b10.hit + 0x70);
                            iVar64 = *(int *)(local_b10.hit + 0x74);
                            iVar65 = *(int *)(local_b10.hit + 0x78);
                            iVar66 = *(int *)(local_b10.hit + 0x7c);
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar81 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar81 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar81 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar81 >> 6) & 1);
                            bVar12 = (bool)((byte)(uVar81 >> 7) & 1);
                            bVar13 = (bool)((byte)(uVar81 >> 9) & 1);
                            bVar14 = (bool)((byte)(uVar81 >> 10) & 1);
                            bVar15 = (bool)((byte)(uVar81 >> 0xb) & 1);
                            bVar16 = (bool)((byte)(uVar81 >> 0xc) & 1);
                            bVar17 = (bool)((byte)(uVar81 >> 0xd) & 1);
                            bVar18 = (bool)((byte)(uVar81 >> 0xe) & 1);
                            bVar19 = SUB81(uVar81 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x340) =
                                 (uint)(bVar75 & 1) * *(int *)(local_b10.hit + 0x40) |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_b10.ray + 0x340);
                            *(uint *)(local_b10.ray + 0x344) =
                                 (uint)bVar80 * iVar52 |
                                 (uint)!bVar80 * *(int *)(local_b10.ray + 0x344);
                            *(uint *)(local_b10.ray + 0x348) =
                                 (uint)bVar7 * iVar53 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x348);
                            *(uint *)(local_b10.ray + 0x34c) =
                                 (uint)bVar8 * iVar54 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x34c);
                            *(uint *)(local_b10.ray + 0x350) =
                                 (uint)bVar9 * iVar55 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x350);
                            *(uint *)(local_b10.ray + 0x354) =
                                 (uint)bVar10 * iVar56 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x354);
                            *(uint *)(local_b10.ray + 0x358) =
                                 (uint)bVar11 * iVar57 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x358);
                            *(uint *)(local_b10.ray + 0x35c) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x35c);
                            *(uint *)(local_b10.ray + 0x360) =
                                 (uint)(bVar71 & 1) * iVar59 |
                                 (uint)!(bool)(bVar71 & 1) * *(int *)(local_b10.ray + 0x360);
                            *(uint *)(local_b10.ray + 0x364) =
                                 (uint)bVar13 * iVar60 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x364);
                            *(uint *)(local_b10.ray + 0x368) =
                                 (uint)bVar14 * iVar61 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x368);
                            *(uint *)(local_b10.ray + 0x36c) =
                                 (uint)bVar15 * iVar62 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x36c);
                            *(uint *)(local_b10.ray + 0x370) =
                                 (uint)bVar16 * iVar63 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x370);
                            *(uint *)(local_b10.ray + 0x374) =
                                 (uint)bVar17 * iVar64 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x374);
                            *(uint *)(local_b10.ray + 0x378) =
                                 (uint)bVar18 * iVar65 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x378);
                            *(uint *)(local_b10.ray + 0x37c) =
                                 (uint)bVar19 * iVar66 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x37c);
                            iVar52 = *(int *)(local_b10.hit + 0x84);
                            iVar53 = *(int *)(local_b10.hit + 0x88);
                            iVar54 = *(int *)(local_b10.hit + 0x8c);
                            iVar55 = *(int *)(local_b10.hit + 0x90);
                            iVar56 = *(int *)(local_b10.hit + 0x94);
                            iVar57 = *(int *)(local_b10.hit + 0x98);
                            iVar58 = *(int *)(local_b10.hit + 0x9c);
                            iVar59 = *(int *)(local_b10.hit + 0xa0);
                            iVar60 = *(int *)(local_b10.hit + 0xa4);
                            iVar61 = *(int *)(local_b10.hit + 0xa8);
                            iVar62 = *(int *)(local_b10.hit + 0xac);
                            iVar63 = *(int *)(local_b10.hit + 0xb0);
                            iVar64 = *(int *)(local_b10.hit + 0xb4);
                            iVar65 = *(int *)(local_b10.hit + 0xb8);
                            iVar66 = *(int *)(local_b10.hit + 0xbc);
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar81 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar81 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar81 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar81 >> 6) & 1);
                            bVar12 = (bool)((byte)(uVar81 >> 7) & 1);
                            bVar13 = (bool)((byte)(uVar81 >> 9) & 1);
                            bVar14 = (bool)((byte)(uVar81 >> 10) & 1);
                            bVar15 = (bool)((byte)(uVar81 >> 0xb) & 1);
                            bVar16 = (bool)((byte)(uVar81 >> 0xc) & 1);
                            bVar17 = (bool)((byte)(uVar81 >> 0xd) & 1);
                            bVar18 = (bool)((byte)(uVar81 >> 0xe) & 1);
                            bVar19 = SUB81(uVar81 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x380) =
                                 (uint)(bVar75 & 1) * *(int *)(local_b10.hit + 0x80) |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_b10.ray + 0x380);
                            *(uint *)(local_b10.ray + 900) =
                                 (uint)bVar80 * iVar52 |
                                 (uint)!bVar80 * *(int *)(local_b10.ray + 900);
                            *(uint *)(local_b10.ray + 0x388) =
                                 (uint)bVar7 * iVar53 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x388);
                            *(uint *)(local_b10.ray + 0x38c) =
                                 (uint)bVar8 * iVar54 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x38c);
                            *(uint *)(local_b10.ray + 0x390) =
                                 (uint)bVar9 * iVar55 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x390);
                            *(uint *)(local_b10.ray + 0x394) =
                                 (uint)bVar10 * iVar56 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x394);
                            *(uint *)(local_b10.ray + 0x398) =
                                 (uint)bVar11 * iVar57 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x398);
                            *(uint *)(local_b10.ray + 0x39c) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x39c);
                            *(uint *)(local_b10.ray + 0x3a0) =
                                 (uint)(bVar71 & 1) * iVar59 |
                                 (uint)!(bool)(bVar71 & 1) * *(int *)(local_b10.ray + 0x3a0);
                            *(uint *)(local_b10.ray + 0x3a4) =
                                 (uint)bVar13 * iVar60 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x3a4);
                            *(uint *)(local_b10.ray + 0x3a8) =
                                 (uint)bVar14 * iVar61 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x3a8);
                            *(uint *)(local_b10.ray + 0x3ac) =
                                 (uint)bVar15 * iVar62 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x3ac);
                            *(uint *)(local_b10.ray + 0x3b0) =
                                 (uint)bVar16 * iVar63 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x3b0);
                            *(uint *)(local_b10.ray + 0x3b4) =
                                 (uint)bVar17 * iVar64 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x3b4);
                            *(uint *)(local_b10.ray + 0x3b8) =
                                 (uint)bVar18 * iVar65 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x3b8);
                            *(uint *)(local_b10.ray + 0x3bc) =
                                 (uint)bVar19 * iVar66 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x3bc);
                            iVar52 = *(int *)(local_b10.hit + 0xc4);
                            iVar53 = *(int *)(local_b10.hit + 200);
                            iVar54 = *(int *)(local_b10.hit + 0xcc);
                            iVar55 = *(int *)(local_b10.hit + 0xd0);
                            iVar56 = *(int *)(local_b10.hit + 0xd4);
                            iVar57 = *(int *)(local_b10.hit + 0xd8);
                            iVar58 = *(int *)(local_b10.hit + 0xdc);
                            iVar59 = *(int *)(local_b10.hit + 0xe0);
                            iVar60 = *(int *)(local_b10.hit + 0xe4);
                            iVar61 = *(int *)(local_b10.hit + 0xe8);
                            iVar62 = *(int *)(local_b10.hit + 0xec);
                            iVar63 = *(int *)(local_b10.hit + 0xf0);
                            iVar64 = *(int *)(local_b10.hit + 0xf4);
                            iVar65 = *(int *)(local_b10.hit + 0xf8);
                            iVar66 = *(int *)(local_b10.hit + 0xfc);
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar81 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar81 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar81 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar81 >> 6) & 1);
                            bVar12 = (bool)((byte)(uVar81 >> 7) & 1);
                            bVar13 = (bool)((byte)(uVar81 >> 9) & 1);
                            bVar14 = (bool)((byte)(uVar81 >> 10) & 1);
                            bVar15 = (bool)((byte)(uVar81 >> 0xb) & 1);
                            bVar16 = (bool)((byte)(uVar81 >> 0xc) & 1);
                            bVar17 = (bool)((byte)(uVar81 >> 0xd) & 1);
                            bVar18 = (bool)((byte)(uVar81 >> 0xe) & 1);
                            bVar19 = SUB81(uVar81 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x3c0) =
                                 (uint)(bVar75 & 1) * *(int *)(local_b10.hit + 0xc0) |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_b10.ray + 0x3c0);
                            *(uint *)(local_b10.ray + 0x3c4) =
                                 (uint)bVar80 * iVar52 |
                                 (uint)!bVar80 * *(int *)(local_b10.ray + 0x3c4);
                            *(uint *)(local_b10.ray + 0x3c8) =
                                 (uint)bVar7 * iVar53 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x3c8);
                            *(uint *)(local_b10.ray + 0x3cc) =
                                 (uint)bVar8 * iVar54 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x3cc);
                            *(uint *)(local_b10.ray + 0x3d0) =
                                 (uint)bVar9 * iVar55 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x3d0);
                            *(uint *)(local_b10.ray + 0x3d4) =
                                 (uint)bVar10 * iVar56 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x3d4);
                            *(uint *)(local_b10.ray + 0x3d8) =
                                 (uint)bVar11 * iVar57 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x3d8);
                            *(uint *)(local_b10.ray + 0x3dc) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x3dc);
                            *(uint *)(local_b10.ray + 0x3e0) =
                                 (uint)(bVar71 & 1) * iVar59 |
                                 (uint)!(bool)(bVar71 & 1) * *(int *)(local_b10.ray + 0x3e0);
                            *(uint *)(local_b10.ray + 0x3e4) =
                                 (uint)bVar13 * iVar60 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x3e4);
                            *(uint *)(local_b10.ray + 1000) =
                                 (uint)bVar14 * iVar61 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 1000);
                            *(uint *)(local_b10.ray + 0x3ec) =
                                 (uint)bVar15 * iVar62 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x3ec);
                            *(uint *)(local_b10.ray + 0x3f0) =
                                 (uint)bVar16 * iVar63 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x3f0);
                            *(uint *)(local_b10.ray + 0x3f4) =
                                 (uint)bVar17 * iVar64 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x3f4);
                            *(uint *)(local_b10.ray + 0x3f8) =
                                 (uint)bVar18 * iVar65 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x3f8);
                            *(uint *)(local_b10.ray + 0x3fc) =
                                 (uint)bVar19 * iVar66 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x3fc);
                            iVar52 = *(int *)(local_b10.hit + 0x104);
                            iVar53 = *(int *)(local_b10.hit + 0x108);
                            iVar54 = *(int *)(local_b10.hit + 0x10c);
                            iVar55 = *(int *)(local_b10.hit + 0x110);
                            iVar56 = *(int *)(local_b10.hit + 0x114);
                            iVar57 = *(int *)(local_b10.hit + 0x118);
                            iVar58 = *(int *)(local_b10.hit + 0x11c);
                            iVar59 = *(int *)(local_b10.hit + 0x120);
                            iVar60 = *(int *)(local_b10.hit + 0x124);
                            iVar61 = *(int *)(local_b10.hit + 0x128);
                            iVar62 = *(int *)(local_b10.hit + 300);
                            iVar63 = *(int *)(local_b10.hit + 0x130);
                            iVar64 = *(int *)(local_b10.hit + 0x134);
                            iVar65 = *(int *)(local_b10.hit + 0x138);
                            iVar66 = *(int *)(local_b10.hit + 0x13c);
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            bVar7 = (bool)((byte)(uVar81 >> 2) & 1);
                            bVar8 = (bool)((byte)(uVar81 >> 3) & 1);
                            bVar9 = (bool)((byte)(uVar81 >> 4) & 1);
                            bVar10 = (bool)((byte)(uVar81 >> 5) & 1);
                            bVar11 = (bool)((byte)(uVar81 >> 6) & 1);
                            bVar12 = (bool)((byte)(uVar81 >> 7) & 1);
                            bVar13 = (bool)((byte)(uVar81 >> 9) & 1);
                            bVar14 = (bool)((byte)(uVar81 >> 10) & 1);
                            bVar15 = (bool)((byte)(uVar81 >> 0xb) & 1);
                            bVar16 = (bool)((byte)(uVar81 >> 0xc) & 1);
                            bVar17 = (bool)((byte)(uVar81 >> 0xd) & 1);
                            bVar18 = (bool)((byte)(uVar81 >> 0xe) & 1);
                            bVar19 = SUB81(uVar81 >> 0xf,0);
                            *(uint *)(local_b10.ray + 0x400) =
                                 (uint)(bVar75 & 1) * *(int *)(local_b10.hit + 0x100) |
                                 (uint)!(bool)(bVar75 & 1) * *(int *)(local_b10.ray + 0x400);
                            *(uint *)(local_b10.ray + 0x404) =
                                 (uint)bVar80 * iVar52 |
                                 (uint)!bVar80 * *(int *)(local_b10.ray + 0x404);
                            *(uint *)(local_b10.ray + 0x408) =
                                 (uint)bVar7 * iVar53 |
                                 (uint)!bVar7 * *(int *)(local_b10.ray + 0x408);
                            *(uint *)(local_b10.ray + 0x40c) =
                                 (uint)bVar8 * iVar54 |
                                 (uint)!bVar8 * *(int *)(local_b10.ray + 0x40c);
                            *(uint *)(local_b10.ray + 0x410) =
                                 (uint)bVar9 * iVar55 |
                                 (uint)!bVar9 * *(int *)(local_b10.ray + 0x410);
                            *(uint *)(local_b10.ray + 0x414) =
                                 (uint)bVar10 * iVar56 |
                                 (uint)!bVar10 * *(int *)(local_b10.ray + 0x414);
                            *(uint *)(local_b10.ray + 0x418) =
                                 (uint)bVar11 * iVar57 |
                                 (uint)!bVar11 * *(int *)(local_b10.ray + 0x418);
                            *(uint *)(local_b10.ray + 0x41c) =
                                 (uint)bVar12 * iVar58 |
                                 (uint)!bVar12 * *(int *)(local_b10.ray + 0x41c);
                            *(uint *)(local_b10.ray + 0x420) =
                                 (uint)(bVar71 & 1) * iVar59 |
                                 (uint)!(bool)(bVar71 & 1) * *(int *)(local_b10.ray + 0x420);
                            *(uint *)(local_b10.ray + 0x424) =
                                 (uint)bVar13 * iVar60 |
                                 (uint)!bVar13 * *(int *)(local_b10.ray + 0x424);
                            *(uint *)(local_b10.ray + 0x428) =
                                 (uint)bVar14 * iVar61 |
                                 (uint)!bVar14 * *(int *)(local_b10.ray + 0x428);
                            *(uint *)(local_b10.ray + 0x42c) =
                                 (uint)bVar15 * iVar62 |
                                 (uint)!bVar15 * *(int *)(local_b10.ray + 0x42c);
                            *(uint *)(local_b10.ray + 0x430) =
                                 (uint)bVar16 * iVar63 |
                                 (uint)!bVar16 * *(int *)(local_b10.ray + 0x430);
                            *(uint *)(local_b10.ray + 0x434) =
                                 (uint)bVar17 * iVar64 |
                                 (uint)!bVar17 * *(int *)(local_b10.ray + 0x434);
                            *(uint *)(local_b10.ray + 0x438) =
                                 (uint)bVar18 * iVar65 |
                                 (uint)!bVar18 * *(int *)(local_b10.ray + 0x438);
                            *(uint *)(local_b10.ray + 0x43c) =
                                 (uint)bVar19 * iVar66 |
                                 (uint)!bVar19 * *(int *)(local_b10.ray + 0x43c);
                            auVar176 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x140));
                            auVar176 = vmovdqu32_avx512f(auVar176);
                            *(undefined1 (*) [64])(local_b10.ray + 0x440) = auVar176;
                            auVar176 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x180));
                            auVar176 = vmovdqu32_avx512f(auVar176);
                            *(undefined1 (*) [64])(local_b10.ray + 0x480) = auVar176;
                            auVar262 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x1c0));
                            auVar176 = vmovdqa32_avx512f(auVar262);
                            *(undefined1 (*) [64])(local_b10.ray + 0x4c0) = auVar176;
                            auVar176 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b10.hit + 0x200));
                            bVar80 = (bool)((byte)(uVar81 >> 1) & 1);
                            auVar50._4_56_ = auVar176._8_56_;
                            auVar50._0_4_ =
                                 (uint)bVar80 * auVar176._4_4_ | (uint)!bVar80 * auVar262._4_4_;
                            auVar145._0_8_ = auVar50._0_8_ << 0x20;
                            bVar80 = (bool)((byte)(uVar81 >> 2) & 1);
                            auVar145._8_4_ =
                                 (uint)bVar80 * auVar176._8_4_ | (uint)!bVar80 * auVar262._8_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 3) & 1);
                            auVar145._12_4_ =
                                 (uint)bVar80 * auVar176._12_4_ | (uint)!bVar80 * auVar262._12_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 4) & 1);
                            auVar145._16_4_ =
                                 (uint)bVar80 * auVar176._16_4_ | (uint)!bVar80 * auVar262._16_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 5) & 1);
                            auVar145._20_4_ =
                                 (uint)bVar80 * auVar176._20_4_ | (uint)!bVar80 * auVar262._20_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 6) & 1);
                            auVar145._24_4_ =
                                 (uint)bVar80 * auVar176._24_4_ | (uint)!bVar80 * auVar262._24_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 7) & 1);
                            auVar145._28_4_ =
                                 (uint)bVar80 * auVar176._28_4_ | (uint)!bVar80 * auVar262._28_4_;
                            auVar145._32_4_ =
                                 (uint)(bVar71 & 1) * auVar176._32_4_ |
                                 (uint)!(bool)(bVar71 & 1) * auVar262._32_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 9) & 1);
                            auVar145._36_4_ =
                                 (uint)bVar80 * auVar176._36_4_ | (uint)!bVar80 * auVar262._36_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 10) & 1);
                            auVar145._40_4_ =
                                 (uint)bVar80 * auVar176._40_4_ | (uint)!bVar80 * auVar262._40_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 0xb) & 1);
                            auVar145._44_4_ =
                                 (uint)bVar80 * auVar176._44_4_ | (uint)!bVar80 * auVar262._44_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 0xc) & 1);
                            auVar145._48_4_ =
                                 (uint)bVar80 * auVar176._48_4_ | (uint)!bVar80 * auVar262._48_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 0xd) & 1);
                            auVar145._52_4_ =
                                 (uint)bVar80 * auVar176._52_4_ | (uint)!bVar80 * auVar262._52_4_;
                            bVar80 = (bool)((byte)(uVar81 >> 0xe) & 1);
                            auVar145._56_4_ =
                                 (uint)bVar80 * auVar176._56_4_ | (uint)!bVar80 * auVar262._56_4_;
                            bVar80 = SUB81(uVar81 >> 0xf,0);
                            auVar145._60_4_ =
                                 (uint)bVar80 * auVar176._60_4_ | (uint)!bVar80 * auVar262._60_4_;
                            auVar176 = vmovdqa32_avx512f(auVar176);
                            *(undefined1 (*) [64])(local_b10.ray + 0x500) = auVar176;
                          }
                          auVar234 = ZEXT464((uint)fVar261);
                        }
                      }
                    }
                  }
                }
                bVar80 = lVar79 != 0;
                lVar79 = lVar79 + -1;
              } while ((!bVar6) && (bVar80));
              auVar68._4_4_ = fStack_85c;
              auVar68._0_4_ = local_860;
              auVar68._8_4_ = fStack_858;
              auVar68._12_4_ = fStack_854;
              auVar68._16_4_ = fStack_850;
              auVar68._20_4_ = fStack_84c;
              auVar68._24_4_ = fStack_848;
              auVar68._28_4_ = fStack_844;
              uVar219 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar40._4_4_ = uVar219;
              auVar40._0_4_ = uVar219;
              auVar40._8_4_ = uVar219;
              auVar40._12_4_ = uVar219;
              auVar40._16_4_ = uVar219;
              auVar40._20_4_ = uVar219;
              auVar40._24_4_ = uVar219;
              auVar40._28_4_ = uVar219;
              uVar22 = vcmpps_avx512vl(auVar68,auVar40,2);
              bVar76 = ~('\x01' << ((byte)iVar25 & 0x1f)) & bVar76 & (byte)uVar22;
            } while (bVar76 != 0);
          }
          uVar23 = vpcmpd_avx512vl(local_7e0,_local_880,1);
          uVar24 = vpcmpd_avx512vl(local_7e0,local_760,1);
          auVar196._0_4_ = (float)local_900._0_4_ + (float)local_500._0_4_;
          auVar196._4_4_ = (float)local_900._4_4_ + (float)local_500._4_4_;
          auVar196._8_4_ = fStack_8f8 + fStack_4f8;
          auVar196._12_4_ = fStack_8f4 + fStack_4f4;
          auVar196._16_4_ = fStack_8f0 + fStack_4f0;
          auVar196._20_4_ = fStack_8ec + fStack_4ec;
          auVar196._24_4_ = fStack_8e8 + fStack_4e8;
          auVar196._28_4_ = fStack_8e4 + fStack_4e4;
          uVar219 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar217._4_4_ = uVar219;
          auVar217._0_4_ = uVar219;
          auVar217._8_4_ = uVar219;
          auVar217._12_4_ = uVar219;
          auVar217._16_4_ = uVar219;
          auVar217._20_4_ = uVar219;
          auVar217._24_4_ = uVar219;
          auVar217._28_4_ = uVar219;
          uVar22 = vcmpps_avx512vl(auVar196,auVar217,2);
          bVar72 = bVar72 & (byte)uVar24 & (byte)uVar22;
          auVar224._0_4_ = (float)local_900._0_4_ + local_7a0._0_4_;
          auVar224._4_4_ = (float)local_900._4_4_ + local_7a0._4_4_;
          auVar224._8_4_ = fStack_8f8 + local_7a0._8_4_;
          auVar224._12_4_ = fStack_8f4 + local_7a0._12_4_;
          auVar224._16_4_ = fStack_8f0 + local_7a0._16_4_;
          auVar224._20_4_ = fStack_8ec + local_7a0._20_4_;
          auVar224._24_4_ = fStack_8e8 + local_7a0._24_4_;
          auVar224._28_4_ = fStack_8e4 + local_7a0._28_4_;
          auVar225 = ZEXT3264(auVar224);
          uVar22 = vcmpps_avx512vl(auVar224,auVar217,2);
          bVar74 = bVar74 & (byte)uVar23 & (byte)uVar22 | bVar72;
          prim = local_ac0;
          if (bVar74 == 0) {
            auVar176 = ZEXT3264(CONCAT428(0x7fffffff,
                                          CONCAT424(0x7fffffff,
                                                    CONCAT420(0x7fffffff,
                                                              CONCAT416(0x7fffffff,
                                                                        CONCAT412(0x7fffffff,
                                                                                  CONCAT48(
                                                  0x7fffffff,0x7fffffff7fffffff)))))));
            auVar262 = ZEXT3264(_DAT_02020f20);
            auVar265 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,&DAT_3f8000003f800000)))))));
          }
          else {
            uVar81 = local_ab0 & 0xffffffff;
            abStack_1a0[uVar81 * 0x60] = bVar74;
            auVar136._0_4_ =
                 (uint)(bVar72 & 1) * local_500._0_4_ |
                 (uint)!(bool)(bVar72 & 1) * (int)local_7a0._0_4_;
            bVar6 = (bool)(bVar72 >> 1 & 1);
            auVar136._4_4_ = (uint)bVar6 * local_500._4_4_ | (uint)!bVar6 * (int)local_7a0._4_4_;
            bVar6 = (bool)(bVar72 >> 2 & 1);
            auVar136._8_4_ = (uint)bVar6 * (int)fStack_4f8 | (uint)!bVar6 * (int)local_7a0._8_4_;
            bVar6 = (bool)(bVar72 >> 3 & 1);
            auVar136._12_4_ = (uint)bVar6 * (int)fStack_4f4 | (uint)!bVar6 * (int)local_7a0._12_4_;
            bVar6 = (bool)(bVar72 >> 4 & 1);
            auVar136._16_4_ = (uint)bVar6 * (int)fStack_4f0 | (uint)!bVar6 * (int)local_7a0._16_4_;
            bVar6 = (bool)(bVar72 >> 5 & 1);
            auVar136._20_4_ = (uint)bVar6 * (int)fStack_4ec | (uint)!bVar6 * (int)local_7a0._20_4_;
            auVar136._24_4_ =
                 (uint)(bVar72 >> 6) * (int)fStack_4e8 |
                 (uint)!(bool)(bVar72 >> 6) * (int)local_7a0._24_4_;
            auVar136._28_4_ = local_7a0._28_4_;
            auVar145._0_32_ = auVar136;
            *(undefined1 (*) [32])(auStack_180 + uVar81 * 0x60) = auVar136;
            uVar22 = vmovlps_avx(local_ae0);
            *(undefined8 *)(afStack_160 + uVar81 * 0x18) = uVar22;
            auStack_158[uVar81 * 0x18] = (int)local_ab8 + 1;
            local_ab0 = (ulong)((int)local_ab0 + 1);
            auVar176 = ZEXT3264(CONCAT428(0x7fffffff,
                                          CONCAT424(0x7fffffff,
                                                    CONCAT420(0x7fffffff,
                                                              CONCAT416(0x7fffffff,
                                                                        CONCAT412(0x7fffffff,
                                                                                  CONCAT48(
                                                  0x7fffffff,0x7fffffff7fffffff)))))));
            auVar262 = ZEXT3264(_DAT_02020f20);
            auVar265 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,&DAT_3f8000003f800000)))))));
          }
        }
      }
    }
    auVar218 = ZEXT1664(local_ae0);
    local_ab0 = local_ab0 & 0xffffffff;
    do {
      if ((int)local_ab0 == 0) {
        uVar219 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar33._4_4_ = uVar219;
        auVar33._0_4_ = uVar219;
        auVar33._8_4_ = uVar219;
        auVar33._12_4_ = uVar219;
        uVar22 = vcmpps_avx512vl(local_7f0,auVar33,2);
        uVar78 = (uint)local_aa8 & (uint)uVar22;
        local_aa8 = (ulong)uVar78;
        if (uVar78 == 0) {
          return;
        }
        goto LAB_01b8f822;
      }
      uVar81 = (ulong)((int)local_ab0 - 1);
      lVar79 = uVar81 * 0x60;
      auVar107 = *(undefined1 (*) [32])(auStack_180 + lVar79);
      auVar197._0_4_ = auVar107._0_4_ + (float)local_900._0_4_;
      auVar197._4_4_ = auVar107._4_4_ + (float)local_900._4_4_;
      auVar197._8_4_ = auVar107._8_4_ + fStack_8f8;
      auVar197._12_4_ = auVar107._12_4_ + fStack_8f4;
      auVar197._16_4_ = auVar107._16_4_ + fStack_8f0;
      auVar197._20_4_ = auVar107._20_4_ + fStack_8ec;
      auVar197._24_4_ = auVar107._24_4_ + fStack_8e8;
      auVar197._28_4_ = auVar107._28_4_ + fStack_8e4;
      uVar219 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar41._4_4_ = uVar219;
      auVar41._0_4_ = uVar219;
      auVar41._8_4_ = uVar219;
      auVar41._12_4_ = uVar219;
      auVar41._16_4_ = uVar219;
      auVar41._20_4_ = uVar219;
      auVar41._24_4_ = uVar219;
      auVar41._28_4_ = uVar219;
      uVar22 = vcmpps_avx512vl(auVar197,auVar41,2);
      uVar82 = (uint)uVar22 & (uint)abStack_1a0[lVar79];
      bVar74 = (byte)uVar82;
      if (uVar82 != 0) {
        auVar198._8_4_ = 0x7f800000;
        auVar198._0_8_ = 0x7f8000007f800000;
        auVar198._12_4_ = 0x7f800000;
        auVar198._16_4_ = 0x7f800000;
        auVar198._20_4_ = 0x7f800000;
        auVar198._24_4_ = 0x7f800000;
        auVar198._28_4_ = 0x7f800000;
        auVar96 = vblendmps_avx512vl(auVar198,auVar107);
        auVar137._0_4_ =
             (uint)(bVar74 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar74 & 1) * (int)auVar107._0_4_;
        bVar6 = (bool)((byte)(uVar82 >> 1) & 1);
        auVar137._4_4_ = (uint)bVar6 * auVar96._4_4_ | (uint)!bVar6 * (int)auVar107._4_4_;
        bVar6 = (bool)((byte)(uVar82 >> 2) & 1);
        auVar137._8_4_ = (uint)bVar6 * auVar96._8_4_ | (uint)!bVar6 * (int)auVar107._8_4_;
        bVar6 = (bool)((byte)(uVar82 >> 3) & 1);
        auVar137._12_4_ = (uint)bVar6 * auVar96._12_4_ | (uint)!bVar6 * (int)auVar107._12_4_;
        bVar6 = (bool)((byte)(uVar82 >> 4) & 1);
        auVar137._16_4_ = (uint)bVar6 * auVar96._16_4_ | (uint)!bVar6 * (int)auVar107._16_4_;
        bVar6 = (bool)((byte)(uVar82 >> 5) & 1);
        auVar137._20_4_ = (uint)bVar6 * auVar96._20_4_ | (uint)!bVar6 * (int)auVar107._20_4_;
        bVar6 = (bool)((byte)(uVar82 >> 6) & 1);
        auVar137._24_4_ = (uint)bVar6 * auVar96._24_4_ | (uint)!bVar6 * (int)auVar107._24_4_;
        auVar137._28_4_ =
             (uVar82 >> 7) * auVar96._28_4_ | (uint)!SUB41(uVar82 >> 7,0) * (int)auVar107._28_4_;
        auVar145._0_32_ = auVar137;
        auVar107 = vshufps_avx(auVar137,auVar137,0xb1);
        auVar107 = vminps_avx(auVar137,auVar107);
        auVar96 = vshufpd_avx(auVar107,auVar107,5);
        auVar107 = vminps_avx(auVar107,auVar96);
        auVar96 = vpermpd_avx2(auVar107,0x4e);
        auVar107 = vminps_avx(auVar107,auVar96);
        uVar22 = vcmpps_avx512vl(auVar137,auVar107,0);
        bVar76 = (byte)uVar22 & bVar74;
        if (bVar76 != 0) {
          uVar82 = (uint)bVar76;
        }
        fVar240 = afStack_160[uVar81 * 0x18 + 1];
        uVar146 = 0;
        for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
          uVar146 = uVar146 + 1;
        }
        local_ab8 = (ulong)auStack_158[uVar81 * 0x18];
        bVar76 = ~('\x01' << ((byte)uVar146 & 0x1f)) & bVar74;
        abStack_1a0[lVar79] = bVar76;
        uVar77 = uVar81;
        if (bVar76 != 0) {
          uVar77 = local_ab0;
        }
        fVar249 = afStack_160[uVar81 * 0x18];
        auVar199._4_4_ = fVar249;
        auVar199._0_4_ = fVar249;
        auVar199._8_4_ = fVar249;
        auVar199._12_4_ = fVar249;
        auVar199._16_4_ = fVar249;
        auVar199._20_4_ = fVar249;
        auVar199._24_4_ = fVar249;
        auVar199._28_4_ = fVar249;
        fVar240 = fVar240 - fVar249;
        auVar175._4_4_ = fVar240;
        auVar175._0_4_ = fVar240;
        auVar175._8_4_ = fVar240;
        auVar175._12_4_ = fVar240;
        auVar175._16_4_ = fVar240;
        auVar175._20_4_ = fVar240;
        auVar175._24_4_ = fVar240;
        auVar175._28_4_ = fVar240;
        auVar88 = vfmadd132ps_fma(auVar175,auVar199,auVar262._0_32_);
        auVar107 = ZEXT1632(auVar88);
        local_400[0] = (RTCHitN)auVar107[0];
        local_400[1] = (RTCHitN)auVar107[1];
        local_400[2] = (RTCHitN)auVar107[2];
        local_400[3] = (RTCHitN)auVar107[3];
        local_400[4] = (RTCHitN)auVar107[4];
        local_400[5] = (RTCHitN)auVar107[5];
        local_400[6] = (RTCHitN)auVar107[6];
        local_400[7] = (RTCHitN)auVar107[7];
        local_400[8] = (RTCHitN)auVar107[8];
        local_400[9] = (RTCHitN)auVar107[9];
        local_400[10] = (RTCHitN)auVar107[10];
        local_400[0xb] = (RTCHitN)auVar107[0xb];
        local_400[0xc] = (RTCHitN)auVar107[0xc];
        local_400[0xd] = (RTCHitN)auVar107[0xd];
        local_400[0xe] = (RTCHitN)auVar107[0xe];
        local_400[0xf] = (RTCHitN)auVar107[0xf];
        local_400[0x10] = (RTCHitN)auVar107[0x10];
        local_400[0x11] = (RTCHitN)auVar107[0x11];
        local_400[0x12] = (RTCHitN)auVar107[0x12];
        local_400[0x13] = (RTCHitN)auVar107[0x13];
        local_400[0x14] = (RTCHitN)auVar107[0x14];
        local_400[0x15] = (RTCHitN)auVar107[0x15];
        local_400[0x16] = (RTCHitN)auVar107[0x16];
        local_400[0x17] = (RTCHitN)auVar107[0x17];
        local_400[0x18] = (RTCHitN)auVar107[0x18];
        local_400[0x19] = (RTCHitN)auVar107[0x19];
        local_400[0x1a] = (RTCHitN)auVar107[0x1a];
        local_400[0x1b] = (RTCHitN)auVar107[0x1b];
        local_400[0x1c] = (RTCHitN)auVar107[0x1c];
        local_400[0x1d] = (RTCHitN)auVar107[0x1d];
        local_400[0x1e] = (RTCHitN)auVar107[0x1e];
        local_400[0x1f] = (RTCHitN)auVar107[0x1f];
        auVar218 = ZEXT864(*(ulong *)(local_400 + (ulong)uVar146 * 4));
        uVar81 = uVar77;
      }
      local_ab0 = uVar81;
    } while (bVar74 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }